

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [28];
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [28];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Primitive PVar20;
  undefined4 uVar21;
  Geometry *pGVar22;
  __int_type_conflict _Var23;
  long lVar24;
  RTCFilterFunctionN p_Var25;
  uint uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [28];
  undefined1 auVar139 [28];
  undefined1 auVar140 [28];
  undefined1 auVar141 [24];
  uint uVar142;
  uint uVar143;
  ulong uVar144;
  uint uVar145;
  long lVar146;
  ulong uVar147;
  long lVar148;
  long lVar149;
  uint uVar150;
  undefined4 uVar151;
  undefined8 unaff_R13;
  undefined1 auVar152 [8];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar153;
  float fVar171;
  float fVar173;
  float fVar177;
  float fVar178;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  float fVar175;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  float fVar172;
  float fVar174;
  float fVar176;
  float fVar179;
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  float fVar180;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar195;
  float fVar196;
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar197;
  float fVar198;
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  float fVar213;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar214;
  undefined1 auVar212 [32];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar232;
  float fVar234;
  float fVar237;
  undefined1 auVar220 [32];
  float fVar238;
  undefined1 auVar221 [32];
  undefined1 auVar216 [16];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  float fVar229;
  float fVar230;
  float fVar233;
  float fVar235;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar231;
  float fVar236;
  undefined1 auVar227 [32];
  undefined1 auVar228 [64];
  float fVar239;
  float fVar240;
  float fVar255;
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  float fVar251;
  float fVar253;
  float fVar257;
  float fVar258;
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar252;
  float fVar254;
  float fVar256;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  float fVar259;
  float fVar269;
  undefined1 auVar261 [16];
  float fVar260;
  undefined1 auVar263 [16];
  undefined1 auVar262 [16];
  float fVar267;
  float fVar268;
  float fVar271;
  float fVar272;
  float fVar273;
  undefined1 auVar264 [32];
  float fVar270;
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  float fVar274;
  float fVar275;
  float fVar283;
  float fVar285;
  float fVar287;
  float fVar289;
  float fVar290;
  float fVar291;
  undefined1 auVar276 [32];
  float fVar284;
  float fVar286;
  float fVar288;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar292;
  undefined1 auVar282 [32];
  float fVar293;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  float fVar307;
  undefined1 auVar298 [32];
  float fVar308;
  undefined1 auVar299 [32];
  undefined1 auVar300 [64];
  undefined1 auVar312 [16];
  float fVar309;
  float fVar320;
  float fVar322;
  float fVar324;
  float fVar325;
  float fVar326;
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  float fVar310;
  undefined1 auVar317 [32];
  float fVar321;
  float fVar323;
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  float fVar327;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar341 [16];
  float fVar351;
  float fVar352;
  float fVar353;
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [64];
  float fVar362;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar363;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar361 [32];
  float fVar372;
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [64];
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  float fVar382;
  float fVar383;
  float fVar388;
  float fVar390;
  float fVar391;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  float fVar389;
  undefined1 auVar387 [32];
  float fVar392;
  float fVar393;
  float fVar399;
  float fVar401;
  float fVar402;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  float fVar400;
  undefined1 auVar397 [32];
  undefined1 auVar398 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined8 uStack_848;
  undefined8 uStack_838;
  undefined1 local_830 [16];
  uint local_820;
  undefined4 uStack_81c;
  undefined4 uStack_818;
  undefined4 uStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined1 local_770 [8];
  undefined8 uStack_768;
  undefined1 local_760 [8];
  undefined8 uStack_758;
  RTCFilterFunctionNArguments local_750;
  undefined1 local_720 [8];
  undefined1 auStack_718 [8];
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined1 local_6c0 [16];
  undefined1 auStack_6b0 [16];
  ulong local_6a0;
  undefined8 uStack_698;
  undefined1 (*local_690) [16];
  Precalculations *local_688;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  undefined1 auStack_670 [8];
  float fStack_668;
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  undefined8 uStack_638;
  undefined1 auStack_630 [8];
  float fStack_628;
  float fStack_624;
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [8];
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  LinearSpace3fa *local_530;
  Primitive *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [32];
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  RTCHitN local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 local_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined1 local_350 [16];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  undefined1 local_320 [8];
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2b0 [16];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar294 [16];
  undefined1 auVar311 [16];
  undefined1 auVar360 [32];
  undefined1 auVar384 [16];
  undefined1 auVar394 [16];
  
  PVar20 = prim[1];
  uVar144 = (ulong)(byte)PVar20;
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 4 + 6)));
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 4 + 10)));
  auVar219 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 5 + 6)));
  auVar312 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 5 + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 6 + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 6 + 10)));
  lVar146 = uVar144 * 0x25;
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0xf + 6)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0xf + 10)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar20 * 0x10 + 6)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar20 * 0x10 + 10)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x11 + 6)));
  auVar44 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x11 + 10)));
  fVar239 = *(float *)(prim + lVar146 + 0x12);
  auVar263 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar263 = vinsertps_avx(auVar263,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar204 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar204 = vinsertps_avx(auVar204,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar263 = vsubps_avx(auVar263,*(undefined1 (*) [16])(prim + lVar146 + 6));
  auVar341._0_4_ = fVar239 * auVar263._0_4_;
  auVar341._4_4_ = fVar239 * auVar263._4_4_;
  auVar341._8_4_ = fVar239 * auVar263._8_4_;
  auVar341._12_4_ = fVar239 * auVar263._12_4_;
  auVar354._0_4_ = fVar239 * auVar204._0_4_;
  auVar354._4_4_ = fVar239 * auVar204._4_4_;
  auVar354._8_4_ = fVar239 * auVar204._8_4_;
  auVar354._12_4_ = fVar239 * auVar204._12_4_;
  auVar264._16_16_ = auVar218;
  auVar264._0_16_ = auVar206;
  auVar244._16_16_ = auVar312;
  auVar244._0_16_ = auVar219;
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1a + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1a + 10)));
  auVar206 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1b + 6)));
  auVar218 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1b + 10)));
  auVar164 = vcvtdq2ps_avx(auVar244);
  auVar185._16_16_ = auVar38;
  auVar185._0_16_ = auVar37;
  auVar29 = vcvtdq2ps_avx(auVar185);
  auVar276._16_16_ = auVar40;
  auVar276._0_16_ = auVar39;
  auVar209._16_16_ = auVar42;
  auVar209._0_16_ = auVar41;
  auVar30 = vcvtdq2ps_avx(auVar209);
  auVar220._16_16_ = auVar44;
  auVar220._0_16_ = auVar43;
  auVar31 = vcvtdq2ps_avx(auVar220);
  auVar295._16_16_ = auVar204;
  auVar295._0_16_ = auVar263;
  auVar313._16_16_ = auVar218;
  auVar313._0_16_ = auVar206;
  auVar263 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1c + 6)));
  auVar204 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar144 * 0x1c + 10)));
  auVar373._16_16_ = auVar204;
  auVar373._0_16_ = auVar263;
  auVar263 = vshufps_avx(auVar354,auVar354,0x55);
  auVar204 = vshufps_avx(auVar354,auVar354,0xaa);
  fVar239 = auVar204._0_4_;
  fVar274 = auVar204._4_4_;
  fVar251 = auVar204._8_4_;
  fVar283 = auVar204._12_4_;
  fVar253 = auVar263._0_4_;
  fVar285 = auVar263._4_4_;
  fVar255 = auVar263._8_4_;
  fVar287 = auVar263._12_4_;
  auVar32 = vcvtdq2ps_avx(auVar264);
  auVar33 = vcvtdq2ps_avx(auVar276);
  auVar34 = vcvtdq2ps_avx(auVar295);
  auVar35 = vcvtdq2ps_avx(auVar313);
  auVar36 = vcvtdq2ps_avx(auVar373);
  auVar263 = vshufps_avx(auVar354,auVar354,0);
  fVar238 = auVar263._0_4_;
  fVar289 = auVar263._4_4_;
  fVar257 = auVar263._8_4_;
  fVar290 = auVar263._12_4_;
  auVar395._0_4_ = fVar238 * auVar32._0_4_ + fVar253 * auVar164._0_4_ + fVar239 * auVar29._0_4_;
  auVar395._4_4_ = fVar289 * auVar32._4_4_ + fVar285 * auVar164._4_4_ + fVar274 * auVar29._4_4_;
  auVar395._8_4_ = fVar257 * auVar32._8_4_ + fVar255 * auVar164._8_4_ + fVar251 * auVar29._8_4_;
  auVar395._12_4_ = fVar290 * auVar32._12_4_ + fVar287 * auVar164._12_4_ + fVar283 * auVar29._12_4_;
  auVar395._16_4_ = fVar238 * auVar32._16_4_ + fVar253 * auVar164._16_4_ + fVar239 * auVar29._16_4_;
  auVar395._20_4_ = fVar289 * auVar32._20_4_ + fVar285 * auVar164._20_4_ + fVar274 * auVar29._20_4_;
  auVar395._24_4_ = fVar257 * auVar32._24_4_ + fVar255 * auVar164._24_4_ + fVar251 * auVar29._24_4_;
  auVar395._28_4_ = fVar287 + 0.0;
  auVar385._0_4_ = fVar238 * auVar33._0_4_ + fVar253 * auVar30._0_4_ + fVar239 * auVar31._0_4_;
  auVar385._4_4_ = fVar289 * auVar33._4_4_ + fVar285 * auVar30._4_4_ + fVar274 * auVar31._4_4_;
  auVar385._8_4_ = fVar257 * auVar33._8_4_ + fVar255 * auVar30._8_4_ + fVar251 * auVar31._8_4_;
  auVar385._12_4_ = fVar290 * auVar33._12_4_ + fVar287 * auVar30._12_4_ + fVar283 * auVar31._12_4_;
  auVar385._16_4_ = fVar238 * auVar33._16_4_ + fVar253 * auVar30._16_4_ + fVar239 * auVar31._16_4_;
  auVar385._20_4_ = fVar289 * auVar33._20_4_ + fVar285 * auVar30._20_4_ + fVar274 * auVar31._20_4_;
  auVar385._24_4_ = fVar257 * auVar33._24_4_ + fVar255 * auVar30._24_4_ + fVar251 * auVar31._24_4_;
  auVar385._28_4_ = fVar287 + 0.0;
  auVar374._0_4_ = fVar238 * auVar34._0_4_ + fVar253 * auVar35._0_4_ + fVar239 * auVar36._0_4_;
  auVar374._4_4_ = fVar289 * auVar34._4_4_ + fVar285 * auVar35._4_4_ + fVar274 * auVar36._4_4_;
  auVar374._8_4_ = fVar257 * auVar34._8_4_ + fVar255 * auVar35._8_4_ + fVar251 * auVar36._8_4_;
  auVar374._12_4_ = fVar290 * auVar34._12_4_ + fVar287 * auVar35._12_4_ + fVar283 * auVar36._12_4_;
  auVar374._16_4_ = fVar238 * auVar34._16_4_ + fVar253 * auVar35._16_4_ + fVar239 * auVar36._16_4_;
  auVar374._20_4_ = fVar289 * auVar34._20_4_ + fVar285 * auVar35._20_4_ + fVar274 * auVar36._20_4_;
  auVar374._24_4_ = fVar257 * auVar34._24_4_ + fVar255 * auVar35._24_4_ + fVar251 * auVar36._24_4_;
  auVar374._28_4_ = fVar287 + fVar287 + fVar283;
  auVar263 = vshufps_avx(auVar341,auVar341,0x55);
  auVar204 = vshufps_avx(auVar341,auVar341,0xaa);
  fVar289 = auVar204._0_4_;
  fVar257 = auVar204._4_4_;
  fVar290 = auVar204._8_4_;
  fVar258 = auVar204._12_4_;
  fVar253 = auVar263._0_4_;
  fVar285 = auVar263._4_4_;
  fVar255 = auVar263._8_4_;
  fVar287 = auVar263._12_4_;
  auVar263._8_8_ = 0;
  auVar263._0_8_ = *(ulong *)(prim + uVar144 * 7 + 6);
  auVar263 = vpmovsxwd_avx(auVar263);
  auVar204._8_8_ = 0;
  auVar204._0_8_ = *(ulong *)(prim + uVar144 * 7 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar204);
  fVar238 = auVar164._28_4_ + auVar31._28_4_;
  auVar206._8_8_ = 0;
  auVar206._0_8_ = *(ulong *)(prim + uVar144 * 0xb + 6);
  auVar206 = vpmovsxwd_avx(auVar206);
  auVar218._8_8_ = 0;
  auVar218._0_8_ = *(ulong *)(prim + uVar144 * 0xb + 0xe);
  auVar218 = vpmovsxwd_avx(auVar218);
  auVar219 = vshufps_avx(auVar341,auVar341,0);
  fVar239 = auVar219._0_4_;
  fVar274 = auVar219._4_4_;
  fVar251 = auVar219._8_4_;
  fVar283 = auVar219._12_4_;
  auVar186._0_4_ = auVar32._0_4_ * fVar239 + fVar253 * auVar164._0_4_ + fVar289 * auVar29._0_4_;
  auVar186._4_4_ = auVar32._4_4_ * fVar274 + fVar285 * auVar164._4_4_ + fVar257 * auVar29._4_4_;
  auVar186._8_4_ = auVar32._8_4_ * fVar251 + fVar255 * auVar164._8_4_ + fVar290 * auVar29._8_4_;
  auVar186._12_4_ = auVar32._12_4_ * fVar283 + fVar287 * auVar164._12_4_ + fVar258 * auVar29._12_4_;
  auVar186._16_4_ = auVar32._16_4_ * fVar239 + fVar253 * auVar164._16_4_ + fVar289 * auVar29._16_4_;
  auVar186._20_4_ = auVar32._20_4_ * fVar274 + fVar285 * auVar164._20_4_ + fVar257 * auVar29._20_4_;
  auVar186._24_4_ = auVar32._24_4_ * fVar251 + fVar255 * auVar164._24_4_ + fVar290 * auVar29._24_4_;
  auVar186._28_4_ = fVar287 + auVar164._28_4_ + auVar29._28_4_;
  auVar157._0_4_ = fVar239 * auVar33._0_4_ + fVar253 * auVar30._0_4_ + fVar289 * auVar31._0_4_;
  auVar157._4_4_ = fVar274 * auVar33._4_4_ + fVar285 * auVar30._4_4_ + fVar257 * auVar31._4_4_;
  auVar157._8_4_ = fVar251 * auVar33._8_4_ + fVar255 * auVar30._8_4_ + fVar290 * auVar31._8_4_;
  auVar157._12_4_ = fVar283 * auVar33._12_4_ + fVar287 * auVar30._12_4_ + fVar258 * auVar31._12_4_;
  auVar157._16_4_ = fVar239 * auVar33._16_4_ + fVar253 * auVar30._16_4_ + fVar289 * auVar31._16_4_;
  auVar157._20_4_ = fVar274 * auVar33._20_4_ + fVar285 * auVar30._20_4_ + fVar257 * auVar31._20_4_;
  auVar157._24_4_ = fVar251 * auVar33._24_4_ + fVar255 * auVar30._24_4_ + fVar290 * auVar31._24_4_;
  auVar157._28_4_ = fVar287 + fVar238;
  auVar342._8_4_ = 0x7fffffff;
  auVar342._0_8_ = 0x7fffffff7fffffff;
  auVar342._12_4_ = 0x7fffffff;
  auVar342._16_4_ = 0x7fffffff;
  auVar342._20_4_ = 0x7fffffff;
  auVar342._24_4_ = 0x7fffffff;
  auVar342._28_4_ = 0x7fffffff;
  auVar245._8_4_ = 0x219392ef;
  auVar245._0_8_ = 0x219392ef219392ef;
  auVar245._12_4_ = 0x219392ef;
  auVar245._16_4_ = 0x219392ef;
  auVar245._20_4_ = 0x219392ef;
  auVar245._24_4_ = 0x219392ef;
  auVar245._28_4_ = 0x219392ef;
  auVar164 = vandps_avx(auVar395,auVar342);
  auVar164 = vcmpps_avx(auVar164,auVar245,1);
  auVar29 = vblendvps_avx(auVar395,auVar245,auVar164);
  auVar164 = vandps_avx(auVar385,auVar342);
  auVar164 = vcmpps_avx(auVar164,auVar245,1);
  auVar30 = vblendvps_avx(auVar385,auVar245,auVar164);
  auVar164 = vandps_avx(auVar374,auVar342);
  auVar164 = vcmpps_avx(auVar164,auVar245,1);
  auVar164 = vblendvps_avx(auVar374,auVar245,auVar164);
  auVar221._0_4_ = fVar239 * auVar34._0_4_ + auVar35._0_4_ * fVar253 + fVar289 * auVar36._0_4_;
  auVar221._4_4_ = fVar274 * auVar34._4_4_ + auVar35._4_4_ * fVar285 + fVar257 * auVar36._4_4_;
  auVar221._8_4_ = fVar251 * auVar34._8_4_ + auVar35._8_4_ * fVar255 + fVar290 * auVar36._8_4_;
  auVar221._12_4_ = fVar283 * auVar34._12_4_ + auVar35._12_4_ * fVar287 + fVar258 * auVar36._12_4_;
  auVar221._16_4_ = fVar239 * auVar34._16_4_ + auVar35._16_4_ * fVar253 + fVar289 * auVar36._16_4_;
  auVar221._20_4_ = fVar274 * auVar34._20_4_ + auVar35._20_4_ * fVar285 + fVar257 * auVar36._20_4_;
  auVar221._24_4_ = fVar251 * auVar34._24_4_ + auVar35._24_4_ * fVar255 + fVar290 * auVar36._24_4_;
  auVar221._28_4_ = fVar238 + fVar287 + 0.0;
  auVar31 = vrcpps_avx(auVar29);
  fVar239 = auVar31._0_4_;
  fVar251 = auVar31._4_4_;
  auVar32._4_4_ = auVar29._4_4_ * fVar251;
  auVar32._0_4_ = auVar29._0_4_ * fVar239;
  fVar253 = auVar31._8_4_;
  auVar32._8_4_ = auVar29._8_4_ * fVar253;
  fVar255 = auVar31._12_4_;
  auVar32._12_4_ = auVar29._12_4_ * fVar255;
  fVar238 = auVar31._16_4_;
  auVar32._16_4_ = auVar29._16_4_ * fVar238;
  fVar257 = auVar31._20_4_;
  auVar32._20_4_ = auVar29._20_4_ * fVar257;
  fVar258 = auVar31._24_4_;
  auVar32._24_4_ = auVar29._24_4_ * fVar258;
  auVar32._28_4_ = 0x219392ef;
  auVar386._8_4_ = 0x3f800000;
  auVar386._0_8_ = 0x3f8000003f800000;
  auVar386._12_4_ = 0x3f800000;
  auVar386._16_4_ = 0x3f800000;
  auVar386._20_4_ = 0x3f800000;
  auVar386._24_4_ = 0x3f800000;
  auVar386._28_4_ = 0x3f800000;
  auVar33 = vsubps_avx(auVar386,auVar32);
  auVar32 = vrcpps_avx(auVar30);
  fVar239 = fVar239 + fVar239 * auVar33._0_4_;
  fVar251 = fVar251 + fVar251 * auVar33._4_4_;
  fVar253 = fVar253 + fVar253 * auVar33._8_4_;
  fVar255 = fVar255 + fVar255 * auVar33._12_4_;
  fVar238 = fVar238 + fVar238 * auVar33._16_4_;
  fVar257 = fVar257 + fVar257 * auVar33._20_4_;
  fVar258 = fVar258 + fVar258 * auVar33._24_4_;
  fVar259 = auVar32._0_4_;
  fVar267 = auVar32._4_4_;
  auVar29._4_4_ = fVar267 * auVar30._4_4_;
  auVar29._0_4_ = fVar259 * auVar30._0_4_;
  fVar268 = auVar32._8_4_;
  auVar29._8_4_ = fVar268 * auVar30._8_4_;
  fVar269 = auVar32._12_4_;
  auVar29._12_4_ = fVar269 * auVar30._12_4_;
  fVar271 = auVar32._16_4_;
  auVar29._16_4_ = fVar271 * auVar30._16_4_;
  fVar272 = auVar32._20_4_;
  auVar29._20_4_ = fVar272 * auVar30._20_4_;
  fVar273 = auVar32._24_4_;
  auVar29._24_4_ = fVar273 * auVar30._24_4_;
  auVar29._28_4_ = auVar31._28_4_;
  auVar34 = vsubps_avx(auVar386,auVar29);
  fVar259 = fVar259 + fVar259 * auVar34._0_4_;
  fVar267 = fVar267 + fVar267 * auVar34._4_4_;
  fVar268 = fVar268 + fVar268 * auVar34._8_4_;
  fVar269 = fVar269 + fVar269 * auVar34._12_4_;
  fVar271 = fVar271 + fVar271 * auVar34._16_4_;
  fVar272 = fVar272 + fVar272 * auVar34._20_4_;
  fVar273 = fVar273 + fVar273 * auVar34._24_4_;
  auVar29 = vrcpps_avx(auVar164);
  auVar219._8_8_ = 0;
  auVar219._0_8_ = *(ulong *)(prim + uVar144 * 9 + 6);
  auVar219 = vpmovsxwd_avx(auVar219);
  auVar312._8_8_ = 0;
  auVar312._0_8_ = *(ulong *)(prim + uVar144 * 9 + 0xe);
  auVar312 = vpmovsxwd_avx(auVar312);
  fVar274 = auVar29._0_4_;
  fVar283 = auVar29._4_4_;
  auVar35._4_4_ = auVar164._4_4_ * fVar283;
  auVar35._0_4_ = auVar164._0_4_ * fVar274;
  fVar285 = auVar29._8_4_;
  auVar35._8_4_ = auVar164._8_4_ * fVar285;
  fVar287 = auVar29._12_4_;
  auVar35._12_4_ = auVar164._12_4_ * fVar287;
  fVar289 = auVar29._16_4_;
  auVar35._16_4_ = auVar164._16_4_ * fVar289;
  fVar290 = auVar29._20_4_;
  auVar35._20_4_ = auVar164._20_4_ * fVar290;
  fVar291 = auVar29._24_4_;
  auVar35._24_4_ = auVar164._24_4_ * fVar291;
  auVar35._28_4_ = auVar30._28_4_;
  auVar164 = vsubps_avx(auVar386,auVar35);
  fVar274 = fVar274 + fVar274 * auVar164._0_4_;
  fVar283 = fVar283 + fVar283 * auVar164._4_4_;
  fVar285 = fVar285 + fVar285 * auVar164._8_4_;
  fVar287 = fVar287 + fVar287 * auVar164._12_4_;
  fVar289 = fVar289 + fVar289 * auVar164._16_4_;
  fVar290 = fVar290 + fVar290 * auVar164._20_4_;
  fVar291 = fVar291 + fVar291 * auVar164._24_4_;
  auVar328._16_16_ = auVar204;
  auVar328._0_16_ = auVar263;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar144 * 0xd + 6);
  auVar263 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar144 * 0xd + 0xe);
  auVar204 = vpmovsxwd_avx(auVar38);
  auVar37 = vpermilps_avx(ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) -
                                         *(float *)(prim + lVar146 + 0x16)) *
                                        *(float *)(prim + lVar146 + 0x1a))),0);
  auVar164 = vcvtdq2ps_avx(auVar328);
  auVar296._16_16_ = auVar218;
  auVar296._0_16_ = auVar206;
  auVar29 = vcvtdq2ps_avx(auVar296);
  auVar29 = vsubps_avx(auVar29,auVar164);
  fVar231 = auVar37._0_4_;
  fVar362 = auVar37._4_4_;
  fVar236 = auVar37._8_4_;
  fVar363 = auVar37._12_4_;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar144 * 0x12 + 6);
  auVar206 = vpmovsxwd_avx(auVar39);
  auVar297._0_4_ = auVar164._0_4_ + fVar231 * auVar29._0_4_;
  auVar297._4_4_ = auVar164._4_4_ + fVar362 * auVar29._4_4_;
  auVar297._8_4_ = auVar164._8_4_ + fVar236 * auVar29._8_4_;
  auVar297._12_4_ = auVar164._12_4_ + fVar363 * auVar29._12_4_;
  auVar297._16_4_ = auVar164._16_4_ + fVar231 * auVar29._16_4_;
  auVar297._20_4_ = auVar164._20_4_ + fVar362 * auVar29._20_4_;
  auVar297._24_4_ = auVar164._24_4_ + fVar236 * auVar29._24_4_;
  auVar297._28_4_ = auVar164._28_4_ + auVar29._28_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar144 * 0x12 + 0xe);
  auVar218 = vpmovsxwd_avx(auVar40);
  auVar314._16_16_ = auVar312;
  auVar314._0_16_ = auVar219;
  auVar164 = vcvtdq2ps_avx(auVar314);
  auVar343._16_16_ = auVar204;
  auVar343._0_16_ = auVar263;
  auVar29 = vcvtdq2ps_avx(auVar343);
  auVar29 = vsubps_avx(auVar29,auVar164);
  auVar315._0_4_ = auVar164._0_4_ + auVar29._0_4_ * fVar231;
  auVar315._4_4_ = auVar164._4_4_ + auVar29._4_4_ * fVar362;
  auVar315._8_4_ = auVar164._8_4_ + auVar29._8_4_ * fVar236;
  auVar315._12_4_ = auVar164._12_4_ + auVar29._12_4_ * fVar363;
  auVar315._16_4_ = auVar164._16_4_ + auVar29._16_4_ * fVar231;
  auVar315._20_4_ = auVar164._20_4_ + auVar29._20_4_ * fVar362;
  auVar315._24_4_ = auVar164._24_4_ + auVar29._24_4_ * fVar236;
  auVar315._28_4_ = auVar164._28_4_ + auVar29._28_4_;
  auVar329._16_16_ = auVar218;
  auVar329._0_16_ = auVar206;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar144 * 0x16 + 6);
  auVar263 = vpmovsxwd_avx(auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar144 * 0x16 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar42);
  auVar164 = vcvtdq2ps_avx(auVar329);
  auVar344._16_16_ = auVar204;
  auVar344._0_16_ = auVar263;
  auVar29 = vcvtdq2ps_avx(auVar344);
  auVar29 = vsubps_avx(auVar29,auVar164);
  auVar330._0_4_ = auVar164._0_4_ + auVar29._0_4_ * fVar231;
  auVar330._4_4_ = auVar164._4_4_ + auVar29._4_4_ * fVar362;
  auVar330._8_4_ = auVar164._8_4_ + auVar29._8_4_ * fVar236;
  auVar330._12_4_ = auVar164._12_4_ + auVar29._12_4_ * fVar363;
  auVar330._16_4_ = auVar164._16_4_ + auVar29._16_4_ * fVar231;
  auVar330._20_4_ = auVar164._20_4_ + auVar29._20_4_ * fVar362;
  auVar330._24_4_ = auVar164._24_4_ + auVar29._24_4_ * fVar236;
  auVar330._28_4_ = auVar164._28_4_ + auVar29._28_4_;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar144 * 0x14 + 6);
  auVar263 = vpmovsxwd_avx(auVar43);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar144 * 0x14 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar44);
  auVar345._16_16_ = auVar204;
  auVar345._0_16_ = auVar263;
  auVar164 = vcvtdq2ps_avx(auVar345);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar144 * 0x18 + 6);
  auVar263 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar144 * 0x18 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar11);
  auVar356._16_16_ = auVar204;
  auVar356._0_16_ = auVar263;
  auVar29 = vcvtdq2ps_avx(auVar356);
  auVar29 = vsubps_avx(auVar29,auVar164);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar144 * 0x1d + 6);
  auVar263 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar144 * 0x1d + 0xe);
  auVar204 = vpmovsxwd_avx(auVar13);
  auVar346._0_4_ = auVar164._0_4_ + auVar29._0_4_ * fVar231;
  auVar346._4_4_ = auVar164._4_4_ + auVar29._4_4_ * fVar362;
  auVar346._8_4_ = auVar164._8_4_ + auVar29._8_4_ * fVar236;
  auVar346._12_4_ = auVar164._12_4_ + auVar29._12_4_ * fVar363;
  auVar346._16_4_ = auVar164._16_4_ + auVar29._16_4_ * fVar231;
  auVar346._20_4_ = auVar164._20_4_ + auVar29._20_4_ * fVar362;
  auVar346._24_4_ = auVar164._24_4_ + auVar29._24_4_ * fVar236;
  auVar346._28_4_ = auVar164._28_4_ + auVar29._28_4_;
  auVar357._16_16_ = auVar204;
  auVar357._0_16_ = auVar263;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar144 * 0x21 + 6);
  auVar263 = vpmovsxwd_avx(auVar14);
  auVar164 = vcvtdq2ps_avx(auVar357);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar144 * 0x21 + 0xe);
  auVar204 = vpmovsxwd_avx(auVar15);
  auVar364._16_16_ = auVar204;
  auVar364._0_16_ = auVar263;
  auVar29 = vcvtdq2ps_avx(auVar364);
  auVar29 = vsubps_avx(auVar29,auVar164);
  auVar358._0_4_ = auVar164._0_4_ + auVar29._0_4_ * fVar231;
  auVar358._4_4_ = auVar164._4_4_ + auVar29._4_4_ * fVar362;
  auVar358._8_4_ = auVar164._8_4_ + auVar29._8_4_ * fVar236;
  auVar358._12_4_ = auVar164._12_4_ + auVar29._12_4_ * fVar363;
  auVar358._16_4_ = auVar164._16_4_ + auVar29._16_4_ * fVar231;
  auVar358._20_4_ = auVar164._20_4_ + auVar29._20_4_ * fVar362;
  auVar358._24_4_ = auVar164._24_4_ + auVar29._24_4_ * fVar236;
  auVar358._28_4_ = auVar164._28_4_ + auVar29._28_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar144 * 0x1f + 6);
  auVar263 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar144 * 0x1f + 0xe);
  auVar204 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar144 * 0x23 + 6);
  auVar206 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar144 * 0x23 + 0xe);
  auVar218 = vpmovsxwd_avx(auVar19);
  auVar365._16_16_ = auVar204;
  auVar365._0_16_ = auVar263;
  auVar375._16_16_ = auVar218;
  auVar375._0_16_ = auVar206;
  auVar164 = vcvtdq2ps_avx(auVar365);
  auVar29 = vcvtdq2ps_avx(auVar375);
  auVar29 = vsubps_avx(auVar29,auVar164);
  auVar366._0_4_ = auVar164._0_4_ + auVar29._0_4_ * fVar231;
  auVar366._4_4_ = auVar164._4_4_ + auVar29._4_4_ * fVar362;
  auVar366._8_4_ = auVar164._8_4_ + auVar29._8_4_ * fVar236;
  auVar366._12_4_ = auVar164._12_4_ + auVar29._12_4_ * fVar363;
  auVar366._16_4_ = auVar164._16_4_ + auVar29._16_4_ * fVar231;
  auVar366._20_4_ = auVar164._20_4_ + auVar29._20_4_ * fVar362;
  auVar366._24_4_ = auVar164._24_4_ + auVar29._24_4_ * fVar236;
  auVar366._28_4_ = auVar164._28_4_ + fVar363;
  auVar164 = vsubps_avx(auVar297,auVar186);
  auVar200._0_4_ = fVar239 * auVar164._0_4_;
  auVar200._4_4_ = fVar251 * auVar164._4_4_;
  auVar200._8_4_ = fVar253 * auVar164._8_4_;
  auVar200._12_4_ = fVar255 * auVar164._12_4_;
  auVar30._16_4_ = fVar238 * auVar164._16_4_;
  auVar30._0_16_ = auVar200;
  auVar30._20_4_ = fVar257 * auVar164._20_4_;
  auVar30._24_4_ = fVar258 * auVar164._24_4_;
  auVar30._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar315,auVar186);
  auVar241._0_4_ = fVar239 * auVar164._0_4_;
  auVar241._4_4_ = fVar251 * auVar164._4_4_;
  auVar241._8_4_ = fVar253 * auVar164._8_4_;
  auVar241._12_4_ = fVar255 * auVar164._12_4_;
  auVar36._16_4_ = fVar238 * auVar164._16_4_;
  auVar36._0_16_ = auVar241;
  auVar36._20_4_ = fVar257 * auVar164._20_4_;
  auVar36._24_4_ = fVar258 * auVar164._24_4_;
  auVar36._28_4_ = auVar31._28_4_ + auVar33._28_4_;
  auVar164 = vsubps_avx(auVar330,auVar157);
  auVar181._0_4_ = fVar259 * auVar164._0_4_;
  auVar181._4_4_ = fVar267 * auVar164._4_4_;
  auVar181._8_4_ = fVar268 * auVar164._8_4_;
  auVar181._12_4_ = fVar269 * auVar164._12_4_;
  auVar31._16_4_ = fVar271 * auVar164._16_4_;
  auVar31._0_16_ = auVar181;
  auVar31._20_4_ = fVar272 * auVar164._20_4_;
  auVar31._24_4_ = fVar273 * auVar164._24_4_;
  auVar31._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar346,auVar157);
  auVar261._0_4_ = fVar259 * auVar164._0_4_;
  auVar261._4_4_ = fVar267 * auVar164._4_4_;
  auVar261._8_4_ = fVar268 * auVar164._8_4_;
  auVar261._12_4_ = fVar269 * auVar164._12_4_;
  auVar33._16_4_ = fVar271 * auVar164._16_4_;
  auVar33._0_16_ = auVar261;
  auVar33._20_4_ = fVar272 * auVar164._20_4_;
  auVar33._24_4_ = fVar273 * auVar164._24_4_;
  auVar33._28_4_ = auVar32._28_4_ + auVar34._28_4_;
  auVar164 = vsubps_avx(auVar358,auVar221);
  auVar154._0_4_ = fVar274 * auVar164._0_4_;
  auVar154._4_4_ = fVar283 * auVar164._4_4_;
  auVar154._8_4_ = fVar285 * auVar164._8_4_;
  auVar154._12_4_ = fVar287 * auVar164._12_4_;
  auVar34._16_4_ = fVar289 * auVar164._16_4_;
  auVar34._0_16_ = auVar154;
  auVar34._20_4_ = fVar290 * auVar164._20_4_;
  auVar34._24_4_ = fVar291 * auVar164._24_4_;
  auVar34._28_4_ = auVar164._28_4_;
  auVar164 = vsubps_avx(auVar366,auVar221);
  auVar215._0_4_ = fVar274 * auVar164._0_4_;
  auVar215._4_4_ = fVar283 * auVar164._4_4_;
  auVar215._8_4_ = fVar285 * auVar164._8_4_;
  auVar215._12_4_ = fVar287 * auVar164._12_4_;
  auVar27._16_4_ = fVar289 * auVar164._16_4_;
  auVar27._0_16_ = auVar215;
  auVar27._20_4_ = fVar290 * auVar164._20_4_;
  auVar27._24_4_ = fVar291 * auVar164._24_4_;
  auVar27._28_4_ = auVar164._28_4_;
  auVar263 = vpminsd_avx(auVar30._16_16_,auVar36._16_16_);
  auVar204 = vpminsd_avx(auVar200,auVar241);
  auVar347._16_16_ = auVar263;
  auVar347._0_16_ = auVar204;
  auVar263 = vpminsd_avx(auVar31._16_16_,auVar33._16_16_);
  auVar204 = vpminsd_avx(auVar181,auVar261);
  auVar359._16_16_ = auVar263;
  auVar359._0_16_ = auVar204;
  auVar164 = vmaxps_avx(auVar347,auVar359);
  auVar263 = vpminsd_avx(auVar34._16_16_,auVar27._16_16_);
  auVar204 = vpminsd_avx(auVar154,auVar215);
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar396._4_4_ = uVar151;
  auVar396._0_4_ = uVar151;
  auVar396._8_4_ = uVar151;
  auVar396._12_4_ = uVar151;
  auVar396._16_4_ = uVar151;
  auVar396._20_4_ = uVar151;
  auVar396._24_4_ = uVar151;
  auVar396._28_4_ = uVar151;
  auVar376._16_16_ = auVar263;
  auVar376._0_16_ = auVar204;
  auVar29 = vmaxps_avx(auVar376,auVar396);
  auVar164 = vmaxps_avx(auVar164,auVar29);
  local_80._4_4_ = auVar164._4_4_ * 0.99999964;
  local_80._0_4_ = auVar164._0_4_ * 0.99999964;
  local_80._8_4_ = auVar164._8_4_ * 0.99999964;
  local_80._12_4_ = auVar164._12_4_ * 0.99999964;
  local_80._16_4_ = auVar164._16_4_ * 0.99999964;
  local_80._20_4_ = auVar164._20_4_ * 0.99999964;
  local_80._24_4_ = auVar164._24_4_ * 0.99999964;
  local_80._28_4_ = auVar29._28_4_;
  auVar371 = ZEXT464((uint)(byte)PVar20);
  auVar263 = vpmaxsd_avx(auVar30._16_16_,auVar36._16_16_);
  auVar204 = vpmaxsd_avx(auVar200,auVar241);
  auVar210._16_16_ = auVar263;
  auVar210._0_16_ = auVar204;
  auVar263 = vpmaxsd_avx(auVar31._16_16_,auVar33._16_16_);
  auVar204 = vpmaxsd_avx(auVar181,auVar261);
  auVar164._16_16_ = auVar263;
  auVar164._0_16_ = auVar204;
  auVar164 = vminps_avx(auVar210,auVar164);
  auVar263 = vpmaxsd_avx(auVar34._16_16_,auVar27._16_16_);
  auVar204 = vpmaxsd_avx(auVar154,auVar215);
  auVar158._16_16_ = auVar263;
  auVar158._0_16_ = auVar204;
  uVar151 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar211._4_4_ = uVar151;
  auVar211._0_4_ = uVar151;
  auVar211._8_4_ = uVar151;
  auVar211._12_4_ = uVar151;
  auVar211._16_4_ = uVar151;
  auVar211._20_4_ = uVar151;
  auVar211._24_4_ = uVar151;
  auVar211._28_4_ = uVar151;
  auVar29 = vminps_avx(auVar158,auVar211);
  auVar164 = vminps_avx(auVar164,auVar29);
  auVar28._4_4_ = auVar164._4_4_ * 1.0000004;
  auVar28._0_4_ = auVar164._0_4_ * 1.0000004;
  auVar28._8_4_ = auVar164._8_4_ * 1.0000004;
  auVar28._12_4_ = auVar164._12_4_ * 1.0000004;
  auVar28._16_4_ = auVar164._16_4_ * 1.0000004;
  auVar28._20_4_ = auVar164._20_4_ * 1.0000004;
  auVar28._24_4_ = auVar164._24_4_ * 1.0000004;
  auVar28._28_4_ = auVar164._28_4_;
  auVar164 = vcmpps_avx(local_80,auVar28,2);
  auVar263 = vpshufd_avx(ZEXT416((uint)(byte)PVar20),0);
  auVar187._16_16_ = auVar263;
  auVar187._0_16_ = auVar263;
  auVar29 = vcvtdq2ps_avx(auVar187);
  auVar29 = vcmpps_avx(_DAT_01f7b060,auVar29,1);
  auVar164 = vandps_avx(auVar164,auVar29);
  uVar151 = vmovmskps_avx(auVar164);
  uVar144 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar151);
  local_520 = mm_lookupmask_ps._16_8_;
  uStack_518 = mm_lookupmask_ps._24_8_;
  uStack_510 = mm_lookupmask_ps._16_8_;
  uStack_508 = mm_lookupmask_ps._24_8_;
  local_530 = pre->ray_space + k;
  local_690 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_688 = pre;
  local_528 = prim;
  do {
    if (uVar144 == 0) {
      return;
    }
    auVar164 = auVar371._0_32_;
    lVar146 = 0;
    if (uVar144 != 0) {
      for (; (uVar144 >> lVar146 & 1) == 0; lVar146 = lVar146 + 1) {
      }
    }
    uVar145 = *(uint *)(local_528 + 2);
    uVar143 = *(uint *)(local_528 + lVar146 * 4 + 6);
    auVar152 = (undefined1  [8])CONCAT44(0,uVar143);
    pGVar22 = (context->scene->geometries).items[CONCAT44(0,uVar145)].ptr;
    uVar147 = (ulong)*(uint *)(*(long *)&pGVar22->field_0x58 +
                              (long)auVar152 *
                              pGVar22[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar239 = (pGVar22->time_range).lower;
    fVar239 = pGVar22->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar239) / ((pGVar22->time_range).upper - fVar239))
    ;
    auVar263 = vroundss_avx(ZEXT416((uint)fVar239),ZEXT416((uint)fVar239),9);
    auVar263 = vminss_avx(auVar263,ZEXT416((uint)(pGVar22->fnumTimeSegments + -1.0)));
    auVar263 = vmaxss_avx(ZEXT816(0) << 0x20,auVar263);
    fVar239 = fVar239 - auVar263._0_4_;
    _Var23 = pGVar22[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar149 = (long)(int)auVar263._0_4_ * 0x38;
    lVar146 = *(long *)(_Var23 + 0x10 + lVar149);
    lVar148 = *(long *)(_Var23 + 0x38 + lVar149);
    lVar24 = *(long *)(_Var23 + 0x48 + lVar149);
    auVar263 = vshufps_avx(ZEXT416((uint)fVar239),ZEXT416((uint)fVar239),0);
    pfVar1 = (float *)(lVar148 + uVar147 * lVar24);
    fVar253 = auVar263._0_4_;
    fVar285 = auVar263._4_4_;
    fVar255 = auVar263._8_4_;
    fVar287 = auVar263._12_4_;
    pfVar2 = (float *)(lVar148 + (uVar147 + 1) * lVar24);
    pfVar3 = (float *)(lVar148 + (uVar147 + 2) * lVar24);
    pfVar4 = (float *)(lVar148 + lVar24 * (uVar147 + 3));
    lVar148 = *(long *)(_Var23 + lVar149);
    auVar263 = vshufps_avx(ZEXT416((uint)(1.0 - fVar239)),ZEXT416((uint)(1.0 - fVar239)),0);
    pfVar5 = (float *)(lVar148 + lVar146 * uVar147);
    fVar239 = auVar263._0_4_;
    fVar274 = auVar263._4_4_;
    fVar251 = auVar263._8_4_;
    fVar283 = auVar263._12_4_;
    pfVar6 = (float *)(lVar148 + lVar146 * (uVar147 + 1));
    fVar293 = fVar253 * *pfVar1 + fVar239 * *pfVar5;
    fVar301 = fVar285 * pfVar1[1] + fVar274 * pfVar5[1];
    auVar294._0_8_ = CONCAT44(fVar301,fVar293);
    auVar294._8_4_ = fVar255 * pfVar1[2] + fVar251 * pfVar5[2];
    auVar294._12_4_ = fVar287 * pfVar1[3] + fVar283 * pfVar5[3];
    fVar309 = fVar239 * *pfVar6 + fVar253 * *pfVar2;
    fVar320 = fVar274 * pfVar6[1] + fVar285 * pfVar2[1];
    auVar311._0_8_ = CONCAT44(fVar320,fVar309);
    auVar311._8_4_ = fVar251 * pfVar6[2] + fVar255 * pfVar2[2];
    auVar311._12_4_ = fVar283 * pfVar6[3] + fVar287 * pfVar2[3];
    pfVar1 = (float *)(lVar148 + lVar146 * (uVar147 + 2));
    fVar392 = fVar239 * *pfVar1 + fVar253 * *pfVar3;
    fVar399 = fVar274 * pfVar1[1] + fVar285 * pfVar3[1];
    auVar394._0_8_ = CONCAT44(fVar399,fVar392);
    auVar394._8_4_ = fVar251 * pfVar1[2] + fVar255 * pfVar3[2];
    auVar394._12_4_ = fVar283 * pfVar1[3] + fVar287 * pfVar3[3];
    pfVar1 = (float *)(lVar148 + lVar146 * (uVar147 + 3));
    fVar382 = fVar239 * *pfVar1 + fVar253 * *pfVar4;
    fVar388 = fVar274 * pfVar1[1] + fVar285 * pfVar4[1];
    auVar384._0_8_ = CONCAT44(fVar388,fVar382);
    auVar384._8_4_ = fVar251 * pfVar1[2] + fVar255 * pfVar4[2];
    auVar384._12_4_ = fVar283 * pfVar1[3] + fVar287 * pfVar4[3];
    uVar150 = (uint)pGVar22[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar263 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar218 = vinsertps_avx(auVar263,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar206 = vsubps_avx(auVar294,auVar218);
    auVar263 = vshufps_avx(auVar206,auVar206,0);
    auVar204 = vshufps_avx(auVar206,auVar206,0x55);
    auVar206 = vshufps_avx(auVar206,auVar206,0xaa);
    fVar239 = (local_530->vx).field_0.m128[0];
    fVar274 = (local_530->vx).field_0.m128[1];
    fVar251 = (local_530->vx).field_0.m128[2];
    fVar283 = (local_530->vx).field_0.m128[3];
    fVar253 = (local_530->vy).field_0.m128[0];
    fVar285 = (local_530->vy).field_0.m128[1];
    fVar255 = (local_530->vy).field_0.m128[2];
    fVar287 = (local_530->vy).field_0.m128[3];
    fVar238 = (local_530->vz).field_0.m128[0];
    fVar289 = (local_530->vz).field_0.m128[1];
    fVar257 = (local_530->vz).field_0.m128[2];
    fVar290 = (local_530->vz).field_0.m128[3];
    auVar242._0_4_ = auVar263._0_4_ * fVar239 + auVar204._0_4_ * fVar253 + fVar238 * auVar206._0_4_;
    auVar242._4_4_ = auVar263._4_4_ * fVar274 + auVar204._4_4_ * fVar285 + fVar289 * auVar206._4_4_;
    auVar242._8_4_ = auVar263._8_4_ * fVar251 + auVar204._8_4_ * fVar255 + fVar257 * auVar206._8_4_;
    auVar242._12_4_ =
         auVar263._12_4_ * fVar283 + auVar204._12_4_ * fVar287 + fVar290 * auVar206._12_4_;
    auVar263 = vblendps_avx(auVar242,auVar294,8);
    auVar219 = vsubps_avx(auVar311,auVar218);
    auVar204 = vshufps_avx(auVar219,auVar219,0);
    auVar206 = vshufps_avx(auVar219,auVar219,0x55);
    auVar219 = vshufps_avx(auVar219,auVar219,0xaa);
    auVar262._0_8_ =
         CONCAT44(auVar204._4_4_ * fVar274 + auVar206._4_4_ * fVar285 + fVar289 * auVar219._4_4_,
                  auVar204._0_4_ * fVar239 + auVar206._0_4_ * fVar253 + fVar238 * auVar219._0_4_);
    auVar262._8_4_ = auVar204._8_4_ * fVar251 + auVar206._8_4_ * fVar255 + fVar257 * auVar219._8_4_;
    auVar262._12_4_ =
         auVar204._12_4_ * fVar283 + auVar206._12_4_ * fVar287 + fVar290 * auVar219._12_4_;
    auVar204 = vblendps_avx(auVar262,auVar311,8);
    auVar312 = vsubps_avx(auVar394,auVar218);
    auVar206 = vshufps_avx(auVar312,auVar312,0);
    auVar219 = vshufps_avx(auVar312,auVar312,0x55);
    auVar312 = vshufps_avx(auVar312,auVar312,0xaa);
    auVar243._0_4_ = auVar206._0_4_ * fVar239 + auVar219._0_4_ * fVar253 + auVar312._0_4_ * fVar238;
    auVar243._4_4_ = auVar206._4_4_ * fVar274 + auVar219._4_4_ * fVar285 + auVar312._4_4_ * fVar289;
    auVar243._8_4_ = auVar206._8_4_ * fVar251 + auVar219._8_4_ * fVar255 + auVar312._8_4_ * fVar257;
    auVar243._12_4_ =
         auVar206._12_4_ * fVar283 + auVar219._12_4_ * fVar287 + auVar312._12_4_ * fVar290;
    auVar206 = vblendps_avx(auVar243,auVar394,8);
    auVar312 = vsubps_avx(auVar384,auVar218);
    auVar218 = vshufps_avx(auVar312,auVar312,0);
    auVar219 = vshufps_avx(auVar312,auVar312,0x55);
    auVar312 = vshufps_avx(auVar312,auVar312,0xaa);
    auVar182._0_4_ = auVar218._0_4_ * fVar239 + auVar219._0_4_ * fVar253 + fVar238 * auVar312._0_4_;
    auVar182._4_4_ = auVar218._4_4_ * fVar274 + auVar219._4_4_ * fVar285 + fVar289 * auVar312._4_4_;
    auVar182._8_4_ = auVar218._8_4_ * fVar251 + auVar219._8_4_ * fVar255 + fVar257 * auVar312._8_4_;
    auVar182._12_4_ =
         auVar218._12_4_ * fVar283 + auVar219._12_4_ * fVar287 + fVar290 * auVar312._12_4_;
    auVar218 = vblendps_avx(auVar182,auVar384,8);
    auVar216._8_4_ = 0x7fffffff;
    auVar216._0_8_ = 0x7fffffff7fffffff;
    auVar216._12_4_ = 0x7fffffff;
    auVar263 = vandps_avx(auVar263,auVar216);
    auVar204 = vandps_avx(auVar204,auVar216);
    auVar219 = vmaxps_avx(auVar263,auVar204);
    auVar263 = vandps_avx(auVar206,auVar216);
    auVar204 = vandps_avx(auVar218,auVar216);
    auVar263 = vmaxps_avx(auVar263,auVar204);
    auVar263 = vmaxps_avx(auVar219,auVar263);
    auVar204 = vmovshdup_avx(auVar263);
    auVar204 = vmaxss_avx(auVar204,auVar263);
    auVar263 = vshufpd_avx(auVar263,auVar263,1);
    auVar263 = vmaxss_avx(auVar263,auVar204);
    lVar146 = (long)(int)uVar150 * 0x44;
    fVar259 = *(float *)(bspline_basis0 + lVar146 + 0x908);
    fVar267 = *(float *)(bspline_basis0 + lVar146 + 0x90c);
    fVar268 = *(float *)(bspline_basis0 + lVar146 + 0x910);
    fVar269 = *(float *)(bspline_basis0 + lVar146 + 0x914);
    fVar271 = *(float *)(bspline_basis0 + lVar146 + 0x918);
    fVar272 = *(float *)(bspline_basis0 + lVar146 + 0x91c);
    fVar273 = *(float *)(bspline_basis0 + lVar146 + 0x920);
    auVar204 = vshufps_avx(auVar243,auVar243,0);
    auVar206 = vshufps_avx(auVar243,auVar243,0x55);
    register0x00001290 = auVar206;
    _local_800 = auVar206;
    pauVar8 = (undefined1 (*) [32])(bspline_basis0 + lVar146 + 0xd8c);
    fVar274 = *(float *)*pauVar8;
    fVar251 = *(float *)(bspline_basis0 + lVar146 + 0xd90);
    fVar253 = *(float *)(bspline_basis0 + lVar146 + 0xd94);
    fVar285 = *(float *)(bspline_basis0 + lVar146 + 0xd98);
    fVar287 = *(float *)(bspline_basis0 + lVar146 + 0xd9c);
    fVar238 = *(float *)(bspline_basis0 + lVar146 + 0xda0);
    fVar257 = *(float *)(bspline_basis0 + lVar146 + 0xda4);
    auVar138 = *(undefined1 (*) [28])*pauVar8;
    _auStack_590 = SUB3216(*pauVar8,0x10);
    auVar218 = vshufps_avx(auVar182,auVar182,0);
    register0x00001490 = auVar218;
    _local_400 = auVar218;
    fVar335 = auVar218._0_4_;
    fVar336 = auVar218._4_4_;
    fVar338 = auVar218._8_4_;
    fVar339 = auVar218._12_4_;
    fVar180 = auVar204._0_4_;
    fVar195 = auVar204._4_4_;
    fVar196 = auVar204._8_4_;
    fVar197 = auVar204._12_4_;
    auVar204 = vshufps_avx(auVar182,auVar182,0x55);
    register0x00001510 = auVar204;
    _local_660 = auVar204;
    fVar351 = auVar204._0_4_;
    fVar352 = auVar204._4_4_;
    fVar353 = auVar204._8_4_;
    fVar372 = auVar204._12_4_;
    fVar199 = auVar206._0_4_;
    fVar308 = auVar206._4_4_;
    fVar213 = auVar206._8_4_;
    fVar214 = auVar206._12_4_;
    auVar204 = vshufps_avx(auVar394,auVar394,0xff);
    register0x00001550 = auVar204;
    _local_a0 = auVar204;
    auVar206 = vshufps_avx(auVar384,auVar384,0xff);
    register0x000013d0 = auVar206;
    _local_c0 = auVar206;
    fVar240 = auVar206._0_4_;
    fVar252 = auVar206._4_4_;
    fVar254 = auVar206._8_4_;
    fVar256 = auVar206._12_4_;
    fVar337 = auVar204._0_4_;
    fVar340 = auVar204._4_4_;
    fVar379 = auVar204._8_4_;
    fVar380 = auVar204._12_4_;
    auVar129._8_4_ = auVar262._8_4_;
    auVar129._0_8_ = auVar262._0_8_;
    auVar129._12_4_ = auVar262._12_4_;
    auVar204 = vshufps_avx(auVar129,auVar129,0);
    register0x00001310 = auVar204;
    _local_7a0 = auVar204;
    fVar290 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar146 + 0x484);
    fVar258 = *(float *)(bspline_basis0 + lVar146 + 0x488);
    fVar291 = *(float *)(bspline_basis0 + lVar146 + 0x48c);
    fVar231 = *(float *)(bspline_basis0 + lVar146 + 0x490);
    fVar362 = *(float *)(bspline_basis0 + lVar146 + 0x494);
    fVar236 = *(float *)(bspline_basis0 + lVar146 + 0x498);
    fVar363 = *(float *)(bspline_basis0 + lVar146 + 0x49c);
    auVar139 = *(undefined1 (*) [28])(bspline_basis0 + lVar146 + 0x484);
    fVar239 = auVar204._0_4_;
    fVar283 = auVar204._4_4_;
    fVar255 = auVar204._8_4_;
    fVar289 = auVar204._12_4_;
    auVar204 = vshufps_avx(auVar129,auVar129,0x55);
    register0x000015d0 = auVar204;
    _local_460 = auVar204;
    fVar393 = auVar204._0_4_;
    fVar400 = auVar204._4_4_;
    fVar401 = auVar204._8_4_;
    fVar402 = auVar204._12_4_;
    auVar204 = vpermilps_avx(auVar311,0xff);
    register0x00001590 = auVar204;
    _local_e0 = auVar204;
    fVar381 = auVar204._0_4_;
    fVar383 = auVar204._4_4_;
    fVar389 = auVar204._8_4_;
    fVar390 = auVar204._12_4_;
    auVar204 = vshufps_avx(auVar242,auVar242,0);
    register0x00001390 = auVar204;
    _local_3e0 = auVar204;
    fVar310 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar146);
    fVar230 = *(float *)(bspline_basis0 + lVar146 + 4);
    fVar302 = *(float *)(bspline_basis0 + lVar146 + 8);
    fVar321 = *(float *)(bspline_basis0 + lVar146 + 0xc);
    fVar322 = *(float *)(bspline_basis0 + lVar146 + 0x10);
    fVar233 = *(float *)(bspline_basis0 + lVar146 + 0x14);
    fVar303 = *(float *)(bspline_basis0 + lVar146 + 0x18);
    auVar140 = *(undefined1 (*) [28])(bspline_basis0 + lVar146);
    fVar275 = auVar204._0_4_;
    fVar284 = auVar204._4_4_;
    fVar286 = auVar204._8_4_;
    fVar288 = auVar204._12_4_;
    auVar355._0_4_ = fVar275 * fVar310 + fVar290 * fVar239 + fVar180 * fVar259 + fVar335 * fVar274;
    auVar355._4_4_ = fVar284 * fVar230 + fVar258 * fVar283 + fVar195 * fVar267 + fVar336 * fVar251;
    auVar355._8_4_ = fVar286 * fVar302 + fVar291 * fVar255 + fVar196 * fVar268 + fVar338 * fVar253;
    auVar355._12_4_ = fVar288 * fVar321 + fVar231 * fVar289 + fVar197 * fVar269 + fVar339 * fVar285;
    auVar360._16_4_ = fVar275 * fVar322 + fVar362 * fVar239 + fVar180 * fVar271 + fVar335 * fVar287;
    auVar360._0_16_ = auVar355;
    auVar360._20_4_ = fVar284 * fVar233 + fVar236 * fVar283 + fVar195 * fVar272 + fVar336 * fVar238;
    auVar360._24_4_ = fVar286 * fVar303 + fVar363 * fVar255 + fVar196 * fVar273 + fVar338 * fVar257;
    auVar360._28_4_ = fVar288 + fVar197 + 0.0 + 0.0;
    auVar204 = vshufps_avx(auVar242,auVar242,0x55);
    local_600._16_16_ = auVar204;
    local_600._0_16_ = auVar204;
    fVar260 = auVar204._0_4_;
    fVar179 = auVar204._4_4_;
    fVar292 = auVar204._8_4_;
    fVar270 = auVar204._12_4_;
    auVar316._0_4_ = fVar260 * fVar310 + fVar393 * fVar290 + fVar199 * fVar259 + fVar351 * fVar274;
    auVar316._4_4_ = fVar179 * fVar230 + fVar400 * fVar258 + fVar308 * fVar267 + fVar352 * fVar251;
    auVar316._8_4_ = fVar292 * fVar302 + fVar401 * fVar291 + fVar213 * fVar268 + fVar353 * fVar253;
    auVar316._12_4_ = fVar270 * fVar321 + fVar402 * fVar231 + fVar214 * fVar269 + fVar372 * fVar285;
    auVar316._16_4_ = fVar260 * fVar322 + fVar393 * fVar362 + fVar199 * fVar271 + fVar351 * fVar287;
    auVar316._20_4_ = fVar179 * fVar233 + fVar400 * fVar236 + fVar308 * fVar272 + fVar352 * fVar238;
    auVar316._24_4_ = fVar292 * fVar303 + fVar401 * fVar363 + fVar213 * fVar273 + fVar353 * fVar257;
    auVar316._28_4_ = fVar214 + 0.0 + 0.0 + 0.0;
    auVar204 = vpermilps_avx(auVar294,0xff);
    register0x00001450 = auVar204;
    _local_100 = auVar204;
    fVar304 = auVar204._0_4_;
    fVar306 = auVar204._4_4_;
    fVar327 = auVar204._8_4_;
    auVar159._0_4_ = fVar304 * fVar310 + fVar381 * fVar290 + fVar337 * fVar259 + fVar240 * fVar274;
    auVar159._4_4_ = fVar306 * fVar230 + fVar383 * fVar258 + fVar340 * fVar267 + fVar252 * fVar251;
    auVar159._8_4_ = fVar327 * fVar302 + fVar389 * fVar291 + fVar379 * fVar268 + fVar254 * fVar253;
    auVar159._12_4_ =
         auVar204._12_4_ * fVar321 + fVar390 * fVar231 + fVar380 * fVar269 + fVar256 * fVar285;
    auVar159._16_4_ = fVar304 * fVar322 + fVar381 * fVar362 + fVar337 * fVar271 + fVar240 * fVar287;
    auVar159._20_4_ = fVar306 * fVar233 + fVar383 * fVar236 + fVar340 * fVar272 + fVar252 * fVar238;
    auVar159._24_4_ = fVar327 * fVar303 + fVar389 * fVar363 + fVar379 * fVar273 + fVar254 * fVar257;
    auVar159._28_4_ = 0;
    fVar310 = *(float *)(bspline_basis1 + lVar146 + 0x908);
    fVar230 = *(float *)(bspline_basis1 + lVar146 + 0x90c);
    fVar302 = *(float *)(bspline_basis1 + lVar146 + 0x910);
    fVar321 = *(float *)(bspline_basis1 + lVar146 + 0x914);
    fVar322 = *(float *)(bspline_basis1 + lVar146 + 0x918);
    fVar233 = *(float *)(bspline_basis1 + lVar146 + 0x91c);
    fVar303 = *(float *)(bspline_basis1 + lVar146 + 0x920);
    fVar323 = *(float *)(bspline_basis1 + lVar146 + 0xd8c);
    fVar324 = *(float *)(bspline_basis1 + lVar146 + 0xd90);
    fVar235 = *(float *)(bspline_basis1 + lVar146 + 0xd94);
    fVar305 = *(float *)(bspline_basis1 + lVar146 + 0xd98);
    fVar325 = *(float *)(bspline_basis1 + lVar146 + 0xd9c);
    fVar326 = *(float *)(bspline_basis1 + lVar146 + 0xda0);
    fVar237 = *(float *)(bspline_basis1 + lVar146 + 0xda4);
    fVar198 = *(float *)(bspline_basis1 + lVar146 + 0x484);
    fVar307 = *(float *)(bspline_basis1 + lVar146 + 0x488);
    fVar171 = *(float *)(bspline_basis1 + lVar146 + 0x48c);
    fVar173 = *(float *)(bspline_basis1 + lVar146 + 0x490);
    fVar175 = *(float *)(bspline_basis1 + lVar146 + 0x494);
    fVar177 = *(float *)(bspline_basis1 + lVar146 + 0x498);
    fVar178 = *(float *)(bspline_basis1 + lVar146 + 0x49c);
    fVar251 = fVar380 + 0.0;
    fVar153 = *(float *)(bspline_basis1 + lVar146);
    fVar172 = *(float *)(bspline_basis1 + lVar146 + 4);
    fVar174 = *(float *)(bspline_basis1 + lVar146 + 8);
    fVar176 = *(float *)(bspline_basis1 + lVar146 + 0xc);
    fVar229 = *(float *)(bspline_basis1 + lVar146 + 0x10);
    fVar232 = *(float *)(bspline_basis1 + lVar146 + 0x14);
    fVar234 = *(float *)(bspline_basis1 + lVar146 + 0x18);
    auVar246._0_4_ = fVar275 * fVar153 + fVar239 * fVar198 + fVar310 * fVar180 + fVar335 * fVar323;
    auVar246._4_4_ = fVar284 * fVar172 + fVar283 * fVar307 + fVar230 * fVar195 + fVar336 * fVar324;
    auVar246._8_4_ = fVar286 * fVar174 + fVar255 * fVar171 + fVar302 * fVar196 + fVar338 * fVar235;
    auVar246._12_4_ = fVar288 * fVar176 + fVar289 * fVar173 + fVar321 * fVar197 + fVar339 * fVar305;
    auVar246._16_4_ = fVar275 * fVar229 + fVar239 * fVar175 + fVar322 * fVar180 + fVar335 * fVar325;
    auVar246._20_4_ = fVar284 * fVar232 + fVar283 * fVar177 + fVar233 * fVar195 + fVar336 * fVar326;
    auVar246._24_4_ = fVar286 * fVar234 + fVar255 * fVar178 + fVar303 * fVar196 + fVar338 * fVar237;
    auVar246._28_4_ = fVar390 + fVar251;
    auVar222._0_4_ = fVar260 * fVar153 + fVar393 * fVar198 + fVar310 * fVar199 + fVar351 * fVar323;
    auVar222._4_4_ = fVar179 * fVar172 + fVar400 * fVar307 + fVar230 * fVar308 + fVar352 * fVar324;
    auVar222._8_4_ = fVar292 * fVar174 + fVar401 * fVar171 + fVar302 * fVar213 + fVar353 * fVar235;
    auVar222._12_4_ = fVar270 * fVar176 + fVar402 * fVar173 + fVar321 * fVar214 + fVar372 * fVar305;
    auVar222._16_4_ = fVar260 * fVar229 + fVar393 * fVar175 + fVar322 * fVar199 + fVar351 * fVar325;
    auVar222._20_4_ = fVar179 * fVar232 + fVar400 * fVar177 + fVar233 * fVar308 + fVar352 * fVar326;
    auVar222._24_4_ = fVar292 * fVar234 + fVar401 * fVar178 + fVar303 * fVar213 + fVar353 * fVar237;
    auVar222._28_4_ = fVar251 + fVar380 + fVar288 + 0.0;
    auVar265._0_4_ = fVar381 * fVar198 + fVar337 * fVar310 + fVar240 * fVar323 + fVar304 * fVar153;
    auVar265._4_4_ = fVar383 * fVar307 + fVar340 * fVar230 + fVar252 * fVar324 + fVar306 * fVar172;
    auVar265._8_4_ = fVar389 * fVar171 + fVar379 * fVar302 + fVar254 * fVar235 + fVar327 * fVar174;
    auVar265._12_4_ =
         fVar390 * fVar173 + fVar380 * fVar321 + fVar256 * fVar305 + auVar204._12_4_ * fVar176;
    auVar265._16_4_ = fVar381 * fVar175 + fVar337 * fVar322 + fVar240 * fVar325 + fVar304 * fVar229;
    auVar265._20_4_ = fVar383 * fVar177 + fVar340 * fVar233 + fVar252 * fVar326 + fVar306 * fVar232;
    auVar265._24_4_ = fVar389 * fVar178 + fVar379 * fVar303 + fVar254 * fVar237 + fVar327 * fVar234;
    auVar265._28_4_ = fVar380 + fVar256 + fVar288 + fVar251;
    auVar31 = vsubps_avx(auVar246,auVar360);
    auVar32 = vsubps_avx(auVar222,auVar316);
    fVar274 = auVar31._0_4_;
    fVar253 = auVar31._4_4_;
    auVar45._4_4_ = auVar316._4_4_ * fVar253;
    auVar45._0_4_ = auVar316._0_4_ * fVar274;
    fVar287 = auVar31._8_4_;
    auVar45._8_4_ = auVar316._8_4_ * fVar287;
    fVar257 = auVar31._12_4_;
    auVar45._12_4_ = auVar316._12_4_ * fVar257;
    fVar258 = auVar31._16_4_;
    auVar45._16_4_ = auVar316._16_4_ * fVar258;
    fVar231 = auVar31._20_4_;
    auVar45._20_4_ = auVar316._20_4_ * fVar231;
    fVar236 = auVar31._24_4_;
    auVar45._24_4_ = auVar316._24_4_ * fVar236;
    auVar45._28_4_ = fVar251;
    fVar251 = auVar32._0_4_;
    fVar285 = auVar32._4_4_;
    auVar46._4_4_ = auVar355._4_4_ * fVar285;
    auVar46._0_4_ = auVar355._0_4_ * fVar251;
    fVar238 = auVar32._8_4_;
    auVar46._8_4_ = auVar355._8_4_ * fVar238;
    fVar290 = auVar32._12_4_;
    auVar46._12_4_ = auVar355._12_4_ * fVar290;
    fVar291 = auVar32._16_4_;
    auVar46._16_4_ = auVar360._16_4_ * fVar291;
    fVar362 = auVar32._20_4_;
    auVar46._20_4_ = auVar360._20_4_ * fVar362;
    fVar363 = auVar32._24_4_;
    auVar46._24_4_ = auVar360._24_4_ * fVar363;
    auVar46._28_4_ = auVar222._28_4_;
    auVar30 = vsubps_avx(auVar45,auVar46);
    auVar29 = vmaxps_avx(auVar159,auVar265);
    auVar47._4_4_ = auVar29._4_4_ * auVar29._4_4_ * (fVar253 * fVar253 + fVar285 * fVar285);
    auVar47._0_4_ = auVar29._0_4_ * auVar29._0_4_ * (fVar274 * fVar274 + fVar251 * fVar251);
    auVar47._8_4_ = auVar29._8_4_ * auVar29._8_4_ * (fVar287 * fVar287 + fVar238 * fVar238);
    auVar47._12_4_ = auVar29._12_4_ * auVar29._12_4_ * (fVar257 * fVar257 + fVar290 * fVar290);
    auVar47._16_4_ = auVar29._16_4_ * auVar29._16_4_ * (fVar258 * fVar258 + fVar291 * fVar291);
    auVar47._20_4_ = auVar29._20_4_ * auVar29._20_4_ * (fVar231 * fVar231 + fVar362 * fVar362);
    auVar47._24_4_ = auVar29._24_4_ * auVar29._24_4_ * (fVar236 * fVar236 + fVar363 * fVar363);
    auVar47._28_4_ = auVar246._28_4_ + auVar222._28_4_;
    auVar48._4_4_ = auVar30._4_4_ * auVar30._4_4_;
    auVar48._0_4_ = auVar30._0_4_ * auVar30._0_4_;
    auVar48._8_4_ = auVar30._8_4_ * auVar30._8_4_;
    auVar48._12_4_ = auVar30._12_4_ * auVar30._12_4_;
    auVar48._16_4_ = auVar30._16_4_ * auVar30._16_4_;
    auVar48._20_4_ = auVar30._20_4_ * auVar30._20_4_;
    auVar48._24_4_ = auVar30._24_4_ * auVar30._24_4_;
    auVar48._28_4_ = auVar30._28_4_;
    auVar29 = vcmpps_avx(auVar48,auVar47,2);
    auVar217._0_4_ = (float)(int)uVar150;
    auVar217._4_12_ = auVar355._4_12_;
    auVar219 = ZEXT416((uint)(auVar263._0_4_ * 4.7683716e-07));
    local_7c0._0_16_ = auVar219;
    auVar263 = vshufps_avx(auVar217,auVar217,0);
    auVar223._16_16_ = auVar263;
    auVar223._0_16_ = auVar263;
    auVar30 = vcmpps_avx(_DAT_01f7b060,auVar223,1);
    auVar263 = vpermilps_avx(auVar242,0xaa);
    register0x00001450 = auVar263;
    _local_4e0 = auVar263;
    auVar130._8_4_ = auVar262._8_4_;
    auVar130._0_8_ = auVar262._0_8_;
    auVar130._12_4_ = auVar262._12_4_;
    auVar204 = vpermilps_avx(auVar130,0xaa);
    register0x00001550 = auVar204;
    _local_120 = auVar204;
    auVar206 = vpermilps_avx(auVar243,0xaa);
    register0x00001590 = auVar206;
    _local_140 = auVar206;
    auVar218 = vpermilps_avx(auVar182,0xaa);
    register0x00001310 = auVar218;
    _local_700 = auVar218;
    auVar33 = auVar30 & auVar29;
    local_820 = *(uint *)(ray + k * 4 + 0x30);
    uStack_81c = 0;
    uStack_818 = 0;
    uStack_814 = 0;
    uStack_698 = auVar182._8_8_;
    local_6a0 = CONCAT44(0,uVar145);
    auVar312 = ZEXT416(uVar145);
    local_610 = ZEXT416(uVar143);
    uStack_838 = auVar294._8_8_;
    uStack_848 = auVar311._8_8_;
    fVar274 = fVar351;
    fVar251 = fVar352;
    fVar253 = fVar353;
    fVar285 = fVar372;
    fVar287 = fVar239;
    fVar238 = fVar283;
    fVar257 = fVar255;
    _local_770 = auVar384;
    _local_760 = auVar394;
    local_420 = auVar217._0_4_;
    if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar33 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar33 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar33 >> 0x7f,0) == '\0') &&
          (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar33 >> 0xbf,0) == '\0') &&
        (auVar33 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar33[0x1f]) {
      auVar371 = ZEXT3264(auVar164);
      auVar350 = ZEXT3264(_local_800);
      auVar300 = ZEXT3264(local_600);
LAB_00ae0a2b:
      auVar219 = local_7c0._0_16_;
    }
    else {
      auVar312 = ZEXT416(uVar145);
      local_5e0._0_16_ = auVar312;
      local_2e0 = vandps_avx(auVar29,auVar30);
      fVar304 = auVar263._0_4_;
      fVar306 = auVar263._4_4_;
      fVar327 = auVar263._8_4_;
      fVar337 = auVar263._12_4_;
      fVar340 = auVar204._0_4_;
      fVar379 = auVar204._4_4_;
      fVar380 = auVar204._8_4_;
      fVar381 = auVar204._12_4_;
      fVar383 = auVar206._0_4_;
      fVar389 = auVar206._4_4_;
      fVar390 = auVar206._8_4_;
      fVar391 = auVar206._12_4_;
      fVar240 = auVar218._0_4_;
      fVar252 = auVar218._4_4_;
      fVar254 = auVar218._8_4_;
      fVar256 = auVar218._12_4_;
      local_4a0 = fVar304 * fVar153 + fVar340 * fVar198 + fVar383 * fVar310 + fVar240 * fVar323;
      fStack_49c = fVar306 * fVar172 + fVar379 * fVar307 + fVar389 * fVar230 + fVar252 * fVar324;
      fStack_498 = fVar327 * fVar174 + fVar380 * fVar171 + fVar390 * fVar302 + fVar254 * fVar235;
      fStack_494 = fVar337 * fVar176 + fVar381 * fVar173 + fVar391 * fVar321 + fVar256 * fVar305;
      fStack_490 = fVar304 * fVar229 + fVar340 * fVar175 + fVar383 * fVar322 + fVar240 * fVar325;
      fStack_48c = fVar306 * fVar232 + fVar379 * fVar177 + fVar389 * fVar233 + fVar252 * fVar326;
      fStack_488 = fVar327 * fVar234 + fVar380 * fVar178 + fVar390 * fVar303 + fVar254 * fVar237;
      fStack_484 = local_2e0._28_4_ +
                   auVar30._28_4_ + *(float *)(bspline_basis1 + lVar146 + 0x924) + 0.0;
      local_480._0_4_ = auVar140._0_4_;
      local_480._4_4_ = auVar140._4_4_;
      fStack_478 = auVar140._8_4_;
      fStack_474 = auVar140._12_4_;
      fStack_470 = auVar140._16_4_;
      fStack_46c = auVar140._20_4_;
      fStack_468 = auVar140._24_4_;
      local_5c0._0_4_ = auVar139._0_4_;
      local_5c0._4_4_ = auVar139._4_4_;
      fStack_5b8 = auVar139._8_4_;
      fStack_5b4 = auVar139._12_4_;
      fStack_5b0 = auVar139._16_4_;
      fStack_5ac = auVar139._20_4_;
      fStack_5a8 = auVar139._24_4_;
      local_5a0._0_4_ = auVar138._0_4_;
      local_5a0._4_4_ = auVar138._4_4_;
      fStack_598 = auVar138._8_4_;
      fStack_594 = auVar138._12_4_;
      auStack_590._0_4_ = auVar138._16_4_;
      auStack_590._4_4_ = auVar138._20_4_;
      fStack_588 = auVar138._24_4_;
      local_6e0 = fVar304 * (float)local_480._0_4_ +
                  fVar340 * (float)local_5c0._0_4_ +
                  fVar383 * fVar259 + fVar240 * (float)local_5a0._0_4_;
      fStack_6dc = fVar306 * (float)local_480._4_4_ +
                   fVar379 * (float)local_5c0._4_4_ +
                   fVar389 * fVar267 + fVar252 * (float)local_5a0._4_4_;
      fStack_6d8 = fVar327 * fStack_478 +
                   fVar380 * fStack_5b8 + fVar390 * fVar268 + fVar254 * fStack_598;
      fStack_6d4 = fVar337 * fStack_474 +
                   fVar381 * fStack_5b4 + fVar391 * fVar269 + fVar256 * fStack_594;
      fStack_6d0 = fVar304 * fStack_470 +
                   fVar340 * fStack_5b0 + fVar383 * fVar271 + fVar240 * (float)auStack_590._0_4_;
      fStack_6cc = fVar306 * fStack_46c +
                   fVar379 * fStack_5ac + fVar389 * fVar272 + fVar252 * (float)auStack_590._4_4_;
      fStack_6c8 = fVar327 * fStack_468 +
                   fVar380 * fStack_5a8 + fVar390 * fVar273 + fVar254 * fStack_588;
      fStack_6c4 = fVar288 + fStack_484 + local_2e0._28_4_ + auVar30._28_4_;
      fVar290 = *(float *)(bspline_basis0 + lVar146 + 0x1210);
      fVar258 = *(float *)(bspline_basis0 + lVar146 + 0x1214);
      fVar291 = *(float *)(bspline_basis0 + lVar146 + 0x1218);
      fVar231 = *(float *)(bspline_basis0 + lVar146 + 0x121c);
      fVar362 = *(float *)(bspline_basis0 + lVar146 + 0x1220);
      fVar236 = *(float *)(bspline_basis0 + lVar146 + 0x1224);
      fVar363 = *(float *)(bspline_basis0 + lVar146 + 0x1228);
      fVar259 = *(float *)(bspline_basis0 + lVar146 + 0x1694);
      fVar267 = *(float *)(bspline_basis0 + lVar146 + 0x1698);
      fVar268 = *(float *)(bspline_basis0 + lVar146 + 0x169c);
      fVar269 = *(float *)(bspline_basis0 + lVar146 + 0x16a0);
      fVar271 = *(float *)(bspline_basis0 + lVar146 + 0x16a4);
      fVar272 = *(float *)(bspline_basis0 + lVar146 + 0x16a8);
      fVar273 = *(float *)(bspline_basis0 + lVar146 + 0x16ac);
      fVar310 = *(float *)(bspline_basis0 + lVar146 + 0x1b18);
      fVar230 = *(float *)(bspline_basis0 + lVar146 + 0x1b1c);
      fVar302 = *(float *)(bspline_basis0 + lVar146 + 0x1b20);
      fVar321 = *(float *)(bspline_basis0 + lVar146 + 0x1b24);
      fVar322 = *(float *)(bspline_basis0 + lVar146 + 0x1b28);
      fVar233 = *(float *)(bspline_basis0 + lVar146 + 0x1b2c);
      fVar303 = *(float *)(bspline_basis0 + lVar146 + 0x1b30);
      fVar323 = *(float *)(bspline_basis0 + lVar146 + 0x1f9c);
      fVar324 = *(float *)(bspline_basis0 + lVar146 + 0x1fa0);
      fVar235 = *(float *)(bspline_basis0 + lVar146 + 0x1fa4);
      fVar305 = *(float *)(bspline_basis0 + lVar146 + 0x1fa8);
      fVar325 = *(float *)(bspline_basis0 + lVar146 + 0x1fac);
      fVar326 = *(float *)(bspline_basis0 + lVar146 + 0x1fb0);
      fVar237 = *(float *)(bspline_basis0 + lVar146 + 0x1fb4);
      fVar198 = *(float *)(bspline_basis0 + lVar146 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar146 + 0x1fb8);
      fVar307 = *(float *)(bspline_basis0 + lVar146 + 0x16b0) + fVar198;
      local_480._4_4_ =
           fVar258 * fVar284 + fVar283 * fVar267 + fVar195 * fVar230 + fVar336 * fVar324;
      local_480._0_4_ =
           fVar290 * fVar275 + fVar239 * fVar259 + fVar180 * fVar310 + fVar335 * fVar323;
      fStack_478 = fVar291 * fVar286 + fVar255 * fVar268 + fVar196 * fVar302 + fVar338 * fVar235;
      fStack_474 = fVar231 * fVar288 + fVar289 * fVar269 + fVar197 * fVar321 + fVar339 * fVar305;
      fStack_470 = fVar362 * fVar275 + fVar239 * fVar271 + fVar180 * fVar322 + fVar335 * fVar325;
      fStack_46c = fVar236 * fVar284 + fVar283 * fVar272 + fVar195 * fVar233 + fVar336 * fVar326;
      fStack_468 = fVar363 * fVar286 + fVar255 * fVar273 + fVar196 * fVar303 + fVar338 * fVar237;
      fStack_464 = *(float *)(bspline_basis0 + lVar146 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar146 + 0x1fb8) +
                   fVar337 + *(float *)(bspline_basis1 + lVar146 + 0x4a0);
      auVar188._0_4_ = fVar260 * fVar290 + fVar393 * fVar259 + fVar199 * fVar310 + fVar351 * fVar323
      ;
      auVar188._4_4_ = fVar179 * fVar258 + fVar400 * fVar267 + fVar308 * fVar230 + fVar352 * fVar324
      ;
      auVar188._8_4_ = fVar292 * fVar291 + fVar401 * fVar268 + fVar213 * fVar302 + fVar353 * fVar235
      ;
      auVar188._12_4_ =
           fVar270 * fVar231 + fVar402 * fVar269 + fVar214 * fVar321 + fVar372 * fVar305;
      auVar188._16_4_ =
           fVar260 * fVar362 + fVar393 * fVar271 + fVar199 * fVar322 + fVar351 * fVar325;
      auVar188._20_4_ =
           fVar179 * fVar236 + fVar400 * fVar272 + fVar308 * fVar233 + fVar352 * fVar326;
      auVar188._24_4_ =
           fVar292 * fVar363 + fVar401 * fVar273 + fVar213 * fVar303 + fVar353 * fVar237;
      auVar188._28_4_ =
           fVar198 + fVar337 + *(float *)(bspline_basis1 + lVar146 + 0x4a0) +
                     fVar337 + *(float *)(bspline_basis1 + lVar146 + 0x1c);
      auVar277._0_4_ = fVar304 * fVar290 + fVar340 * fVar259 + fVar383 * fVar310 + fVar240 * fVar323
      ;
      auVar277._4_4_ = fVar306 * fVar258 + fVar379 * fVar267 + fVar389 * fVar230 + fVar252 * fVar324
      ;
      auVar277._8_4_ = fVar327 * fVar291 + fVar380 * fVar268 + fVar390 * fVar302 + fVar254 * fVar235
      ;
      auVar277._12_4_ =
           fVar337 * fVar231 + fVar381 * fVar269 + fVar391 * fVar321 + fVar256 * fVar305;
      auVar277._16_4_ =
           fVar304 * fVar362 + fVar340 * fVar271 + fVar383 * fVar322 + fVar240 * fVar325;
      auVar277._20_4_ =
           fVar306 * fVar236 + fVar379 * fVar272 + fVar389 * fVar233 + fVar252 * fVar326;
      auVar277._24_4_ =
           fVar327 * fVar363 + fVar380 * fVar273 + fVar390 * fVar303 + fVar254 * fVar237;
      auVar277._28_4_ = *(float *)(bspline_basis0 + lVar146 + 0x122c) + fVar307;
      fVar290 = *(float *)(bspline_basis1 + lVar146 + 0x1b18);
      fVar258 = *(float *)(bspline_basis1 + lVar146 + 0x1b1c);
      fVar291 = *(float *)(bspline_basis1 + lVar146 + 0x1b20);
      fVar231 = *(float *)(bspline_basis1 + lVar146 + 0x1b24);
      fVar362 = *(float *)(bspline_basis1 + lVar146 + 0x1b28);
      fVar236 = *(float *)(bspline_basis1 + lVar146 + 0x1b2c);
      fVar363 = *(float *)(bspline_basis1 + lVar146 + 0x1b30);
      fVar259 = *(float *)(bspline_basis1 + lVar146 + 0x1f9c);
      fVar267 = *(float *)(bspline_basis1 + lVar146 + 0x1fa0);
      fVar268 = *(float *)(bspline_basis1 + lVar146 + 0x1fa4);
      fVar269 = *(float *)(bspline_basis1 + lVar146 + 0x1fa8);
      fVar271 = *(float *)(bspline_basis1 + lVar146 + 0x1fac);
      fVar272 = *(float *)(bspline_basis1 + lVar146 + 0x1fb0);
      fVar273 = *(float *)(bspline_basis1 + lVar146 + 0x1fb4);
      fVar310 = *(float *)(bspline_basis1 + lVar146 + 0x1694);
      fVar230 = *(float *)(bspline_basis1 + lVar146 + 0x1698);
      fVar302 = *(float *)(bspline_basis1 + lVar146 + 0x169c);
      fVar321 = *(float *)(bspline_basis1 + lVar146 + 0x16a0);
      fVar322 = *(float *)(bspline_basis1 + lVar146 + 0x16a4);
      fVar233 = *(float *)(bspline_basis1 + lVar146 + 0x16a8);
      fVar303 = *(float *)(bspline_basis1 + lVar146 + 0x16ac);
      fVar323 = *(float *)(bspline_basis1 + lVar146 + 0x1210);
      fVar324 = *(float *)(bspline_basis1 + lVar146 + 0x1214);
      fVar235 = *(float *)(bspline_basis1 + lVar146 + 0x1218);
      fVar305 = *(float *)(bspline_basis1 + lVar146 + 0x121c);
      fVar325 = *(float *)(bspline_basis1 + lVar146 + 0x1220);
      fVar326 = *(float *)(bspline_basis1 + lVar146 + 0x1224);
      fVar237 = *(float *)(bspline_basis1 + lVar146 + 0x1228);
      auVar298._0_4_ = fVar323 * fVar275 + fVar239 * fVar310 + fVar180 * fVar290 + fVar335 * fVar259
      ;
      auVar298._4_4_ = fVar324 * fVar284 + fVar283 * fVar230 + fVar195 * fVar258 + fVar336 * fVar267
      ;
      auVar298._8_4_ = fVar235 * fVar286 + fVar255 * fVar302 + fVar196 * fVar291 + fVar338 * fVar268
      ;
      auVar298._12_4_ =
           fVar305 * fVar288 + fVar289 * fVar321 + fVar197 * fVar231 + fVar339 * fVar269;
      auVar298._16_4_ =
           fVar325 * fVar275 + fVar239 * fVar322 + fVar180 * fVar362 + fVar335 * fVar271;
      auVar298._20_4_ =
           fVar326 * fVar284 + fVar283 * fVar233 + fVar195 * fVar236 + fVar336 * fVar272;
      auVar298._24_4_ =
           fVar237 * fVar286 + fVar255 * fVar303 + fVar196 * fVar363 + fVar338 * fVar273;
      auVar298._28_4_ = fVar339 + fVar339 + fVar337 + fVar307;
      auVar331._0_4_ = fVar260 * fVar323 + fVar393 * fVar310 + fVar199 * fVar290 + fVar351 * fVar259
      ;
      auVar331._4_4_ = fVar179 * fVar324 + fVar400 * fVar230 + fVar308 * fVar258 + fVar352 * fVar267
      ;
      auVar331._8_4_ = fVar292 * fVar235 + fVar401 * fVar302 + fVar213 * fVar291 + fVar353 * fVar268
      ;
      auVar331._12_4_ =
           fVar270 * fVar305 + fVar402 * fVar321 + fVar214 * fVar231 + fVar372 * fVar269;
      auVar331._16_4_ =
           fVar260 * fVar325 + fVar393 * fVar322 + fVar199 * fVar362 + fVar351 * fVar271;
      auVar331._20_4_ =
           fVar179 * fVar326 + fVar400 * fVar233 + fVar308 * fVar236 + fVar352 * fVar272;
      auVar331._24_4_ =
           fVar292 * fVar237 + fVar401 * fVar303 + fVar213 * fVar363 + fVar353 * fVar273;
      auVar331._28_4_ = fVar339 + fVar339 + fVar339 + fVar337;
      auVar212._0_4_ = fVar304 * fVar323 + fVar340 * fVar310 + fVar383 * fVar290 + fVar259 * fVar240
      ;
      auVar212._4_4_ = fVar306 * fVar324 + fVar379 * fVar230 + fVar389 * fVar258 + fVar267 * fVar252
      ;
      auVar212._8_4_ = fVar327 * fVar235 + fVar380 * fVar302 + fVar390 * fVar291 + fVar268 * fVar254
      ;
      auVar212._12_4_ =
           fVar337 * fVar305 + fVar381 * fVar321 + fVar391 * fVar231 + fVar269 * fVar256;
      auVar212._16_4_ =
           fVar304 * fVar325 + fVar340 * fVar322 + fVar383 * fVar362 + fVar271 * fVar240;
      auVar212._20_4_ =
           fVar306 * fVar326 + fVar379 * fVar233 + fVar389 * fVar236 + fVar272 * fVar252;
      auVar212._24_4_ =
           fVar327 * fVar237 + fVar380 * fVar303 + fVar390 * fVar363 + fVar273 * fVar254;
      auVar212._28_4_ =
           *(float *)(bspline_basis1 + lVar146 + 0x122c) +
           *(float *)(bspline_basis1 + lVar146 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar146 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar146 + 0x1fb8);
      auVar247._8_4_ = 0x7fffffff;
      auVar247._0_8_ = 0x7fffffff7fffffff;
      auVar247._12_4_ = 0x7fffffff;
      auVar247._16_4_ = 0x7fffffff;
      auVar247._20_4_ = 0x7fffffff;
      auVar247._24_4_ = 0x7fffffff;
      auVar247._28_4_ = 0x7fffffff;
      auVar29 = vandps_avx(_local_480,auVar247);
      auVar30 = vandps_avx(auVar188,auVar247);
      auVar30 = vmaxps_avx(auVar29,auVar30);
      auVar29 = vandps_avx(auVar277,auVar247);
      auVar29 = vmaxps_avx(auVar30,auVar29);
      auVar263 = vpermilps_avx(auVar219,0);
      auVar278._16_16_ = auVar263;
      auVar278._0_16_ = auVar263;
      auVar29 = vcmpps_avx(auVar29,auVar278,1);
      auVar33 = vblendvps_avx(_local_480,auVar31,auVar29);
      auVar34 = vblendvps_avx(auVar188,auVar32,auVar29);
      auVar29 = vandps_avx(auVar298,auVar247);
      auVar30 = vandps_avx(auVar331,auVar247);
      auVar35 = vmaxps_avx(auVar29,auVar30);
      auVar29 = vandps_avx(auVar212,auVar247);
      auVar29 = vmaxps_avx(auVar35,auVar29);
      auVar35 = vcmpps_avx(auVar29,auVar278,1);
      auVar29 = vblendvps_avx(auVar298,auVar31,auVar35);
      auVar31 = vblendvps_avx(auVar331,auVar32,auVar35);
      fVar307 = auVar33._0_4_;
      fVar171 = auVar33._4_4_;
      fVar173 = auVar33._8_4_;
      fVar175 = auVar33._12_4_;
      fVar177 = auVar33._16_4_;
      fVar178 = auVar33._20_4_;
      fVar153 = auVar33._24_4_;
      fVar172 = auVar29._0_4_;
      fVar174 = auVar29._4_4_;
      fVar176 = auVar29._8_4_;
      fVar229 = auVar29._12_4_;
      fVar232 = auVar29._16_4_;
      fVar234 = auVar29._20_4_;
      fVar199 = auVar29._24_4_;
      fVar308 = -auVar29._28_4_;
      fVar290 = auVar34._0_4_;
      fVar362 = auVar34._4_4_;
      fVar267 = auVar34._8_4_;
      fVar272 = auVar34._12_4_;
      fVar302 = auVar34._16_4_;
      fVar303 = auVar34._20_4_;
      fVar305 = auVar34._24_4_;
      auVar160._0_4_ = fVar290 * fVar290 + fVar307 * fVar307;
      auVar160._4_4_ = fVar362 * fVar362 + fVar171 * fVar171;
      auVar160._8_4_ = fVar267 * fVar267 + fVar173 * fVar173;
      auVar160._12_4_ = fVar272 * fVar272 + fVar175 * fVar175;
      auVar160._16_4_ = fVar302 * fVar302 + fVar177 * fVar177;
      auVar160._20_4_ = fVar303 * fVar303 + fVar178 * fVar178;
      auVar160._24_4_ = fVar305 * fVar305 + fVar153 * fVar153;
      auVar160._28_4_ = auVar331._28_4_ + auVar33._28_4_;
      auVar32 = vrsqrtps_avx(auVar160);
      fVar258 = auVar32._0_4_;
      fVar291 = auVar32._4_4_;
      auVar49._4_4_ = fVar291 * 1.5;
      auVar49._0_4_ = fVar258 * 1.5;
      fVar231 = auVar32._8_4_;
      auVar49._8_4_ = fVar231 * 1.5;
      fVar236 = auVar32._12_4_;
      auVar49._12_4_ = fVar236 * 1.5;
      fVar363 = auVar32._16_4_;
      auVar49._16_4_ = fVar363 * 1.5;
      fVar259 = auVar32._20_4_;
      auVar49._20_4_ = fVar259 * 1.5;
      fVar268 = auVar32._24_4_;
      fVar198 = auVar30._28_4_;
      auVar49._24_4_ = fVar268 * 1.5;
      auVar49._28_4_ = fVar198;
      auVar50._4_4_ = fVar291 * fVar291 * fVar291 * auVar160._4_4_ * 0.5;
      auVar50._0_4_ = fVar258 * fVar258 * fVar258 * auVar160._0_4_ * 0.5;
      auVar50._8_4_ = fVar231 * fVar231 * fVar231 * auVar160._8_4_ * 0.5;
      auVar50._12_4_ = fVar236 * fVar236 * fVar236 * auVar160._12_4_ * 0.5;
      auVar50._16_4_ = fVar363 * fVar363 * fVar363 * auVar160._16_4_ * 0.5;
      auVar50._20_4_ = fVar259 * fVar259 * fVar259 * auVar160._20_4_ * 0.5;
      auVar50._24_4_ = fVar268 * fVar268 * fVar268 * auVar160._24_4_ * 0.5;
      auVar50._28_4_ = auVar160._28_4_;
      auVar30 = vsubps_avx(auVar49,auVar50);
      fVar258 = auVar30._0_4_;
      fVar236 = auVar30._4_4_;
      fVar268 = auVar30._8_4_;
      fVar273 = auVar30._12_4_;
      fVar321 = auVar30._16_4_;
      fVar323 = auVar30._20_4_;
      fVar325 = auVar30._24_4_;
      fVar291 = auVar31._0_4_;
      fVar363 = auVar31._4_4_;
      fVar269 = auVar31._8_4_;
      fVar310 = auVar31._12_4_;
      fVar322 = auVar31._16_4_;
      fVar324 = auVar31._20_4_;
      fVar326 = auVar31._24_4_;
      auVar161._0_4_ = fVar291 * fVar291 + fVar172 * fVar172;
      auVar161._4_4_ = fVar363 * fVar363 + fVar174 * fVar174;
      auVar161._8_4_ = fVar269 * fVar269 + fVar176 * fVar176;
      auVar161._12_4_ = fVar310 * fVar310 + fVar229 * fVar229;
      auVar161._16_4_ = fVar322 * fVar322 + fVar232 * fVar232;
      auVar161._20_4_ = fVar324 * fVar324 + fVar234 * fVar234;
      auVar161._24_4_ = fVar326 * fVar326 + fVar199 * fVar199;
      auVar161._28_4_ = auVar29._28_4_ + auVar30._28_4_;
      auVar29 = vrsqrtps_avx(auVar161);
      fVar231 = auVar29._0_4_;
      fVar259 = auVar29._4_4_;
      auVar51._4_4_ = fVar259 * 1.5;
      auVar51._0_4_ = fVar231 * 1.5;
      fVar271 = auVar29._8_4_;
      auVar51._8_4_ = fVar271 * 1.5;
      fVar230 = auVar29._12_4_;
      auVar51._12_4_ = fVar230 * 1.5;
      fVar233 = auVar29._16_4_;
      auVar51._16_4_ = fVar233 * 1.5;
      fVar235 = auVar29._20_4_;
      auVar51._20_4_ = fVar235 * 1.5;
      fVar237 = auVar29._24_4_;
      auVar51._24_4_ = fVar237 * 1.5;
      auVar51._28_4_ = fVar198;
      auVar52._4_4_ = fVar259 * fVar259 * fVar259 * auVar161._4_4_ * 0.5;
      auVar52._0_4_ = fVar231 * fVar231 * fVar231 * auVar161._0_4_ * 0.5;
      auVar52._8_4_ = fVar271 * fVar271 * fVar271 * auVar161._8_4_ * 0.5;
      auVar52._12_4_ = fVar230 * fVar230 * fVar230 * auVar161._12_4_ * 0.5;
      auVar52._16_4_ = fVar233 * fVar233 * fVar233 * auVar161._16_4_ * 0.5;
      auVar52._20_4_ = fVar235 * fVar235 * fVar235 * auVar161._20_4_ * 0.5;
      auVar52._24_4_ = fVar237 * fVar237 * fVar237 * auVar161._24_4_ * 0.5;
      auVar52._28_4_ = auVar161._28_4_;
      auVar29 = vsubps_avx(auVar51,auVar52);
      fVar231 = auVar29._0_4_;
      fVar259 = auVar29._4_4_;
      fVar271 = auVar29._8_4_;
      fVar230 = auVar29._12_4_;
      fVar233 = auVar29._16_4_;
      fVar235 = auVar29._20_4_;
      fVar237 = auVar29._24_4_;
      fVar290 = auVar159._0_4_ * fVar290 * fVar258;
      fVar362 = auVar159._4_4_ * fVar362 * fVar236;
      auVar53._4_4_ = fVar362;
      auVar53._0_4_ = fVar290;
      fVar267 = auVar159._8_4_ * fVar267 * fVar268;
      auVar53._8_4_ = fVar267;
      fVar272 = auVar159._12_4_ * fVar272 * fVar273;
      auVar53._12_4_ = fVar272;
      fVar302 = auVar159._16_4_ * fVar302 * fVar321;
      auVar53._16_4_ = fVar302;
      fVar303 = auVar159._20_4_ * fVar303 * fVar323;
      auVar53._20_4_ = fVar303;
      fVar305 = auVar159._24_4_ * fVar305 * fVar325;
      auVar53._24_4_ = fVar305;
      auVar53._28_4_ = fVar308;
      local_5a0._4_4_ = auVar355._4_4_ + fVar362;
      local_5a0._0_4_ = auVar355._0_4_ + fVar290;
      fStack_598 = auVar355._8_4_ + fVar267;
      fStack_594 = auVar355._12_4_ + fVar272;
      auStack_590._0_4_ = auVar360._16_4_ + fVar302;
      auStack_590._4_4_ = auVar360._20_4_ + fVar303;
      fStack_588 = auVar360._24_4_ + fVar305;
      fStack_584 = auVar360._28_4_ + fVar308;
      fVar290 = auVar159._0_4_ * fVar258 * -fVar307;
      fVar362 = auVar159._4_4_ * fVar236 * -fVar171;
      auVar54._4_4_ = fVar362;
      auVar54._0_4_ = fVar290;
      fVar267 = auVar159._8_4_ * fVar268 * -fVar173;
      auVar54._8_4_ = fVar267;
      fVar272 = auVar159._12_4_ * fVar273 * -fVar175;
      auVar54._12_4_ = fVar272;
      fVar302 = auVar159._16_4_ * fVar321 * -fVar177;
      auVar54._16_4_ = fVar302;
      fVar303 = auVar159._20_4_ * fVar323 * -fVar178;
      auVar54._20_4_ = fVar303;
      fVar305 = auVar159._24_4_ * fVar325 * -fVar153;
      auVar54._24_4_ = fVar305;
      auVar54._28_4_ = fVar198;
      local_5c0._4_4_ = fVar362 + auVar316._4_4_;
      local_5c0._0_4_ = fVar290 + auVar316._0_4_;
      fStack_5b8 = fVar267 + auVar316._8_4_;
      fStack_5b4 = fVar272 + auVar316._12_4_;
      fStack_5b0 = fVar302 + auVar316._16_4_;
      fStack_5ac = fVar303 + auVar316._20_4_;
      fStack_5a8 = fVar305 + auVar316._24_4_;
      fStack_5a4 = fVar198 + auVar316._28_4_;
      fVar290 = auVar159._0_4_ * fVar258 * 0.0;
      fVar258 = auVar159._4_4_ * fVar236 * 0.0;
      auVar55._4_4_ = fVar258;
      auVar55._0_4_ = fVar290;
      fVar362 = auVar159._8_4_ * fVar268 * 0.0;
      auVar55._8_4_ = fVar362;
      fVar236 = auVar159._12_4_ * fVar273 * 0.0;
      auVar55._12_4_ = fVar236;
      fVar267 = auVar159._16_4_ * fVar321 * 0.0;
      auVar55._16_4_ = fVar267;
      fVar268 = auVar159._20_4_ * fVar323 * 0.0;
      auVar55._20_4_ = fVar268;
      fVar272 = auVar159._24_4_ * fVar325 * 0.0;
      auVar55._24_4_ = fVar272;
      auVar55._28_4_ = fVar197;
      auVar133._4_4_ = fStack_6dc;
      auVar133._0_4_ = local_6e0;
      auVar133._8_4_ = fStack_6d8;
      auVar133._12_4_ = fStack_6d4;
      auVar133._16_4_ = fStack_6d0;
      auVar133._20_4_ = fStack_6cc;
      auVar133._24_4_ = fStack_6c8;
      auVar133._28_4_ = fStack_6c4;
      auVar279._0_4_ = fVar290 + local_6e0;
      auVar279._4_4_ = fVar258 + fStack_6dc;
      auVar279._8_4_ = fVar362 + fStack_6d8;
      auVar279._12_4_ = fVar236 + fStack_6d4;
      auVar279._16_4_ = fVar267 + fStack_6d0;
      auVar279._20_4_ = fVar268 + fStack_6cc;
      auVar279._24_4_ = fVar272 + fStack_6c8;
      auVar279._28_4_ = fVar197 + fStack_6c4;
      fVar290 = auVar265._0_4_ * fVar291 * fVar231;
      fVar258 = auVar265._4_4_ * fVar363 * fVar259;
      auVar56._4_4_ = fVar258;
      auVar56._0_4_ = fVar290;
      fVar291 = auVar265._8_4_ * fVar269 * fVar271;
      auVar56._8_4_ = fVar291;
      fVar362 = auVar265._12_4_ * fVar310 * fVar230;
      auVar56._12_4_ = fVar362;
      fVar236 = auVar265._16_4_ * fVar322 * fVar233;
      auVar56._16_4_ = fVar236;
      fVar363 = auVar265._20_4_ * fVar324 * fVar235;
      auVar56._20_4_ = fVar363;
      fVar267 = auVar265._24_4_ * fVar326 * fVar237;
      auVar56._24_4_ = fVar267;
      auVar56._28_4_ = auVar31._28_4_;
      auVar35 = vsubps_avx(auVar360,auVar53);
      auVar332._0_4_ = auVar246._0_4_ + fVar290;
      auVar332._4_4_ = auVar246._4_4_ + fVar258;
      auVar332._8_4_ = auVar246._8_4_ + fVar291;
      auVar332._12_4_ = auVar246._12_4_ + fVar362;
      auVar332._16_4_ = auVar246._16_4_ + fVar236;
      auVar332._20_4_ = auVar246._20_4_ + fVar363;
      auVar332._24_4_ = auVar246._24_4_ + fVar267;
      auVar332._28_4_ = auVar246._28_4_ + auVar31._28_4_;
      fVar290 = auVar265._0_4_ * fVar231 * -fVar172;
      fVar258 = auVar265._4_4_ * fVar259 * -fVar174;
      auVar57._4_4_ = fVar258;
      auVar57._0_4_ = fVar290;
      fVar291 = auVar265._8_4_ * fVar271 * -fVar176;
      auVar57._8_4_ = fVar291;
      fVar362 = auVar265._12_4_ * fVar230 * -fVar229;
      auVar57._12_4_ = fVar362;
      fVar236 = auVar265._16_4_ * fVar233 * -fVar232;
      auVar57._16_4_ = fVar236;
      fVar363 = auVar265._20_4_ * fVar235 * -fVar234;
      auVar57._20_4_ = fVar363;
      fVar267 = auVar265._24_4_ * fVar237 * -fVar199;
      auVar57._24_4_ = fVar267;
      auVar57._28_4_ = fVar381;
      auVar36 = vsubps_avx(auVar316,auVar54);
      auVar348._0_4_ = fVar290 + auVar222._0_4_;
      auVar348._4_4_ = fVar258 + auVar222._4_4_;
      auVar348._8_4_ = fVar291 + auVar222._8_4_;
      auVar348._12_4_ = fVar362 + auVar222._12_4_;
      auVar348._16_4_ = fVar236 + auVar222._16_4_;
      auVar348._20_4_ = fVar363 + auVar222._20_4_;
      auVar348._24_4_ = fVar267 + auVar222._24_4_;
      auVar348._28_4_ = fVar381 + auVar222._28_4_;
      fVar290 = auVar265._0_4_ * fVar231 * 0.0;
      fVar258 = auVar265._4_4_ * fVar259 * 0.0;
      auVar58._4_4_ = fVar258;
      auVar58._0_4_ = fVar290;
      fVar291 = auVar265._8_4_ * fVar271 * 0.0;
      auVar58._8_4_ = fVar291;
      fVar231 = auVar265._12_4_ * fVar230 * 0.0;
      auVar58._12_4_ = fVar231;
      fVar362 = auVar265._16_4_ * fVar233 * 0.0;
      auVar58._16_4_ = fVar362;
      fVar236 = auVar265._20_4_ * fVar235 * 0.0;
      auVar58._20_4_ = fVar236;
      fVar363 = auVar265._24_4_ * fVar237 * 0.0;
      auVar58._24_4_ = fVar363;
      auVar58._28_4_ = 0x3f000000;
      auVar27 = vsubps_avx(auVar133,auVar55);
      auVar135._4_4_ = fStack_49c;
      auVar135._0_4_ = local_4a0;
      auVar135._8_4_ = fStack_498;
      auVar135._12_4_ = fStack_494;
      auVar135._16_4_ = fStack_490;
      auVar135._20_4_ = fStack_48c;
      auVar135._24_4_ = fStack_488;
      auVar135._28_4_ = fStack_484;
      auVar387._0_4_ = fVar290 + local_4a0;
      auVar387._4_4_ = fVar258 + fStack_49c;
      auVar387._8_4_ = fVar291 + fStack_498;
      auVar387._12_4_ = fVar231 + fStack_494;
      auVar387._16_4_ = fVar362 + fStack_490;
      auVar387._20_4_ = fVar236 + fStack_48c;
      auVar387._24_4_ = fVar363 + fStack_488;
      auVar387._28_4_ = fStack_484 + 0.5;
      auVar29 = vsubps_avx(auVar246,auVar56);
      auVar30 = vsubps_avx(auVar222,auVar57);
      auVar157 = vsubps_avx(auVar135,auVar58);
      auVar31 = vsubps_avx(auVar348,auVar36);
      auVar32 = vsubps_avx(auVar387,auVar27);
      auVar59._4_4_ = auVar27._4_4_ * auVar31._4_4_;
      auVar59._0_4_ = auVar27._0_4_ * auVar31._0_4_;
      auVar59._8_4_ = auVar27._8_4_ * auVar31._8_4_;
      auVar59._12_4_ = auVar27._12_4_ * auVar31._12_4_;
      auVar59._16_4_ = auVar27._16_4_ * auVar31._16_4_;
      auVar59._20_4_ = auVar27._20_4_ * auVar31._20_4_;
      auVar59._24_4_ = auVar27._24_4_ * auVar31._24_4_;
      auVar59._28_4_ = fVar402;
      auVar60._4_4_ = auVar36._4_4_ * auVar32._4_4_;
      auVar60._0_4_ = auVar36._0_4_ * auVar32._0_4_;
      auVar60._8_4_ = auVar36._8_4_ * auVar32._8_4_;
      auVar60._12_4_ = auVar36._12_4_ * auVar32._12_4_;
      auVar60._16_4_ = auVar36._16_4_ * auVar32._16_4_;
      auVar60._20_4_ = auVar36._20_4_ * auVar32._20_4_;
      auVar60._24_4_ = auVar36._24_4_ * auVar32._24_4_;
      auVar60._28_4_ = auVar222._28_4_;
      auVar33 = vsubps_avx(auVar60,auVar59);
      auVar61._4_4_ = auVar35._4_4_ * auVar32._4_4_;
      auVar61._0_4_ = auVar35._0_4_ * auVar32._0_4_;
      auVar61._8_4_ = auVar35._8_4_ * auVar32._8_4_;
      auVar61._12_4_ = auVar35._12_4_ * auVar32._12_4_;
      auVar61._16_4_ = auVar35._16_4_ * auVar32._16_4_;
      auVar61._20_4_ = auVar35._20_4_ * auVar32._20_4_;
      auVar61._24_4_ = auVar35._24_4_ * auVar32._24_4_;
      auVar61._28_4_ = auVar32._28_4_;
      auVar34 = vsubps_avx(auVar332,auVar35);
      auVar62._4_4_ = auVar27._4_4_ * auVar34._4_4_;
      auVar62._0_4_ = auVar27._0_4_ * auVar34._0_4_;
      auVar62._8_4_ = auVar27._8_4_ * auVar34._8_4_;
      auVar62._12_4_ = auVar27._12_4_ * auVar34._12_4_;
      auVar62._16_4_ = auVar27._16_4_ * auVar34._16_4_;
      auVar62._20_4_ = auVar27._20_4_ * auVar34._20_4_;
      auVar62._24_4_ = auVar27._24_4_ * auVar34._24_4_;
      auVar62._28_4_ = auVar246._28_4_;
      auVar28 = vsubps_avx(auVar62,auVar61);
      auVar63._4_4_ = auVar34._4_4_ * auVar36._4_4_;
      auVar63._0_4_ = auVar34._0_4_ * auVar36._0_4_;
      auVar63._8_4_ = auVar34._8_4_ * auVar36._8_4_;
      auVar63._12_4_ = auVar34._12_4_ * auVar36._12_4_;
      auVar63._16_4_ = auVar34._16_4_ * auVar36._16_4_;
      auVar63._20_4_ = auVar34._20_4_ * auVar36._20_4_;
      auVar63._24_4_ = auVar34._24_4_ * auVar36._24_4_;
      auVar63._28_4_ = auVar32._28_4_;
      auVar64._4_4_ = auVar35._4_4_ * auVar31._4_4_;
      auVar64._0_4_ = auVar35._0_4_ * auVar31._0_4_;
      auVar64._8_4_ = auVar35._8_4_ * auVar31._8_4_;
      auVar64._12_4_ = auVar35._12_4_ * auVar31._12_4_;
      auVar64._16_4_ = auVar35._16_4_ * auVar31._16_4_;
      auVar64._20_4_ = auVar35._20_4_ * auVar31._20_4_;
      auVar64._24_4_ = auVar35._24_4_ * auVar31._24_4_;
      auVar64._28_4_ = auVar31._28_4_;
      auVar31 = vsubps_avx(auVar64,auVar63);
      auVar162._0_4_ = auVar33._0_4_ * 0.0 + auVar31._0_4_ + auVar28._0_4_ * 0.0;
      auVar162._4_4_ = auVar33._4_4_ * 0.0 + auVar31._4_4_ + auVar28._4_4_ * 0.0;
      auVar162._8_4_ = auVar33._8_4_ * 0.0 + auVar31._8_4_ + auVar28._8_4_ * 0.0;
      auVar162._12_4_ = auVar33._12_4_ * 0.0 + auVar31._12_4_ + auVar28._12_4_ * 0.0;
      auVar162._16_4_ = auVar33._16_4_ * 0.0 + auVar31._16_4_ + auVar28._16_4_ * 0.0;
      auVar162._20_4_ = auVar33._20_4_ * 0.0 + auVar31._20_4_ + auVar28._20_4_ * 0.0;
      auVar162._24_4_ = auVar33._24_4_ * 0.0 + auVar31._24_4_ + auVar28._24_4_ * 0.0;
      auVar162._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar28._28_4_;
      auVar28 = vcmpps_avx(auVar162,ZEXT432(0) << 0x20,2);
      auVar29 = vblendvps_avx(auVar29,_local_5a0,auVar28);
      auVar30 = vblendvps_avx(auVar30,_local_5c0,auVar28);
      auVar31 = vblendvps_avx(auVar157,auVar279,auVar28);
      auVar32 = vblendvps_avx(auVar35,auVar332,auVar28);
      auVar33 = vblendvps_avx(auVar36,auVar348,auVar28);
      auVar34 = vblendvps_avx(auVar27,auVar387,auVar28);
      auVar35 = vblendvps_avx(auVar332,auVar35,auVar28);
      auVar36 = vblendvps_avx(auVar348,auVar36,auVar28);
      auVar263 = vpackssdw_avx(local_2e0._0_16_,local_2e0._16_16_);
      local_580._16_16_ = auVar360._16_16_;
      auVar27 = vblendvps_avx(auVar387,auVar27,auVar28);
      auVar35 = vsubps_avx(auVar35,auVar29);
      auVar158 = vsubps_avx(auVar36,auVar30);
      auVar27 = vsubps_avx(auVar27,auVar31);
      auVar185 = vsubps_avx(auVar30,auVar33);
      fVar290 = auVar158._0_4_;
      fVar153 = auVar31._0_4_;
      fVar236 = auVar158._4_4_;
      fVar172 = auVar31._4_4_;
      auVar65._4_4_ = fVar172 * fVar236;
      auVar65._0_4_ = fVar153 * fVar290;
      fVar269 = auVar158._8_4_;
      fVar174 = auVar31._8_4_;
      auVar65._8_4_ = fVar174 * fVar269;
      fVar230 = auVar158._12_4_;
      fVar176 = auVar31._12_4_;
      auVar65._12_4_ = fVar176 * fVar230;
      fVar303 = auVar158._16_4_;
      fVar229 = auVar31._16_4_;
      auVar65._16_4_ = fVar229 * fVar303;
      fVar325 = auVar158._20_4_;
      fVar232 = auVar31._20_4_;
      auVar65._20_4_ = fVar232 * fVar325;
      fVar171 = auVar158._24_4_;
      fVar234 = auVar31._24_4_;
      auVar65._24_4_ = fVar234 * fVar171;
      auVar65._28_4_ = auVar36._28_4_;
      fVar258 = auVar30._0_4_;
      fVar270 = auVar27._0_4_;
      fVar363 = auVar30._4_4_;
      fVar275 = auVar27._4_4_;
      auVar66._4_4_ = fVar275 * fVar363;
      auVar66._0_4_ = fVar270 * fVar258;
      fVar271 = auVar30._8_4_;
      fVar284 = auVar27._8_4_;
      auVar66._8_4_ = fVar284 * fVar271;
      fVar302 = auVar30._12_4_;
      fVar286 = auVar27._12_4_;
      auVar66._12_4_ = fVar286 * fVar302;
      fVar323 = auVar30._16_4_;
      fVar288 = auVar27._16_4_;
      auVar66._16_4_ = fVar288 * fVar323;
      fVar326 = auVar30._20_4_;
      fVar240 = auVar27._20_4_;
      auVar66._20_4_ = fVar240 * fVar326;
      fVar173 = auVar30._24_4_;
      fVar252 = auVar27._24_4_;
      uVar151 = auVar157._28_4_;
      auVar66._24_4_ = fVar252 * fVar173;
      auVar66._28_4_ = uVar151;
      auVar36 = vsubps_avx(auVar66,auVar65);
      fVar291 = auVar29._0_4_;
      fVar259 = auVar29._4_4_;
      auVar67._4_4_ = fVar275 * fVar259;
      auVar67._0_4_ = fVar270 * fVar291;
      fVar272 = auVar29._8_4_;
      auVar67._8_4_ = fVar284 * fVar272;
      fVar321 = auVar29._12_4_;
      auVar67._12_4_ = fVar286 * fVar321;
      fVar324 = auVar29._16_4_;
      auVar67._16_4_ = fVar288 * fVar324;
      fVar237 = auVar29._20_4_;
      auVar67._20_4_ = fVar240 * fVar237;
      fVar175 = auVar29._24_4_;
      auVar67._24_4_ = fVar252 * fVar175;
      auVar67._28_4_ = uVar151;
      fVar231 = auVar35._0_4_;
      fVar267 = auVar35._4_4_;
      auVar68._4_4_ = fVar172 * fVar267;
      auVar68._0_4_ = fVar153 * fVar231;
      fVar273 = auVar35._8_4_;
      auVar68._8_4_ = fVar174 * fVar273;
      fVar322 = auVar35._12_4_;
      auVar68._12_4_ = fVar176 * fVar322;
      fVar235 = auVar35._16_4_;
      auVar68._16_4_ = fVar229 * fVar235;
      fVar198 = auVar35._20_4_;
      auVar68._20_4_ = fVar232 * fVar198;
      fVar177 = auVar35._24_4_;
      auVar68._24_4_ = fVar234 * fVar177;
      auVar68._28_4_ = auVar387._28_4_;
      auVar157 = vsubps_avx(auVar68,auVar67);
      auVar69._4_4_ = fVar363 * fVar267;
      auVar69._0_4_ = fVar258 * fVar231;
      auVar69._8_4_ = fVar271 * fVar273;
      auVar69._12_4_ = fVar302 * fVar322;
      auVar69._16_4_ = fVar323 * fVar235;
      auVar69._20_4_ = fVar326 * fVar198;
      auVar69._24_4_ = fVar173 * fVar177;
      auVar69._28_4_ = uVar151;
      auVar397._0_4_ = fVar291 * fVar290;
      auVar397._4_4_ = fVar259 * fVar236;
      auVar397._8_4_ = fVar272 * fVar269;
      auVar397._12_4_ = fVar321 * fVar230;
      auVar397._16_4_ = fVar324 * fVar303;
      auVar397._20_4_ = fVar237 * fVar325;
      auVar397._24_4_ = fVar175 * fVar171;
      auVar397._28_4_ = 0;
      auVar186 = vsubps_avx(auVar397,auVar69);
      auVar187 = vsubps_avx(auVar31,auVar34);
      fVar362 = auVar186._28_4_ + auVar157._28_4_;
      auVar189._0_4_ = auVar186._0_4_ + auVar157._0_4_ * 0.0 + auVar36._0_4_ * 0.0;
      auVar189._4_4_ = auVar186._4_4_ + auVar157._4_4_ * 0.0 + auVar36._4_4_ * 0.0;
      auVar189._8_4_ = auVar186._8_4_ + auVar157._8_4_ * 0.0 + auVar36._8_4_ * 0.0;
      auVar189._12_4_ = auVar186._12_4_ + auVar157._12_4_ * 0.0 + auVar36._12_4_ * 0.0;
      auVar189._16_4_ = auVar186._16_4_ + auVar157._16_4_ * 0.0 + auVar36._16_4_ * 0.0;
      auVar189._20_4_ = auVar186._20_4_ + auVar157._20_4_ * 0.0 + auVar36._20_4_ * 0.0;
      auVar189._24_4_ = auVar186._24_4_ + auVar157._24_4_ * 0.0 + auVar36._24_4_ * 0.0;
      auVar189._28_4_ = fVar362 + auVar36._28_4_;
      fVar199 = auVar185._0_4_;
      fVar308 = auVar185._4_4_;
      auVar70._4_4_ = fVar308 * auVar34._4_4_;
      auVar70._0_4_ = fVar199 * auVar34._0_4_;
      fVar213 = auVar185._8_4_;
      auVar70._8_4_ = fVar213 * auVar34._8_4_;
      fVar214 = auVar185._12_4_;
      auVar70._12_4_ = fVar214 * auVar34._12_4_;
      fVar260 = auVar185._16_4_;
      auVar70._16_4_ = fVar260 * auVar34._16_4_;
      fVar179 = auVar185._20_4_;
      auVar70._20_4_ = fVar179 * auVar34._20_4_;
      fVar292 = auVar185._24_4_;
      auVar70._24_4_ = fVar292 * auVar34._24_4_;
      auVar70._28_4_ = fVar362;
      fVar362 = auVar187._0_4_;
      fVar268 = auVar187._4_4_;
      auVar71._4_4_ = auVar33._4_4_ * fVar268;
      auVar71._0_4_ = auVar33._0_4_ * fVar362;
      fVar310 = auVar187._8_4_;
      auVar71._8_4_ = auVar33._8_4_ * fVar310;
      fVar233 = auVar187._12_4_;
      auVar71._12_4_ = auVar33._12_4_ * fVar233;
      fVar305 = auVar187._16_4_;
      auVar71._16_4_ = auVar33._16_4_ * fVar305;
      fVar307 = auVar187._20_4_;
      auVar71._20_4_ = auVar33._20_4_ * fVar307;
      fVar178 = auVar187._24_4_;
      auVar71._24_4_ = auVar33._24_4_ * fVar178;
      auVar71._28_4_ = auVar186._28_4_;
      auVar157 = vsubps_avx(auVar71,auVar70);
      auVar185 = vsubps_avx(auVar29,auVar32);
      fVar254 = auVar185._0_4_;
      fVar256 = auVar185._4_4_;
      auVar72._4_4_ = fVar256 * auVar34._4_4_;
      auVar72._0_4_ = fVar254 * auVar34._0_4_;
      fVar304 = auVar185._8_4_;
      auVar72._8_4_ = fVar304 * auVar34._8_4_;
      fVar306 = auVar185._12_4_;
      auVar72._12_4_ = fVar306 * auVar34._12_4_;
      fVar327 = auVar185._16_4_;
      auVar72._16_4_ = fVar327 * auVar34._16_4_;
      fVar335 = auVar185._20_4_;
      auVar72._20_4_ = fVar335 * auVar34._20_4_;
      fVar336 = auVar185._24_4_;
      auVar72._24_4_ = fVar336 * auVar34._24_4_;
      auVar72._28_4_ = auVar34._28_4_;
      auVar73._4_4_ = auVar32._4_4_ * fVar268;
      auVar73._0_4_ = auVar32._0_4_ * fVar362;
      auVar73._8_4_ = auVar32._8_4_ * fVar310;
      auVar73._12_4_ = auVar32._12_4_ * fVar233;
      auVar73._16_4_ = auVar32._16_4_ * fVar305;
      auVar73._20_4_ = auVar32._20_4_ * fVar307;
      auVar73._24_4_ = auVar32._24_4_ * fVar178;
      auVar73._28_4_ = auVar36._28_4_;
      auVar36 = vsubps_avx(auVar72,auVar73);
      auVar74._4_4_ = auVar33._4_4_ * fVar256;
      auVar74._0_4_ = auVar33._0_4_ * fVar254;
      auVar74._8_4_ = auVar33._8_4_ * fVar304;
      auVar74._12_4_ = auVar33._12_4_ * fVar306;
      auVar74._16_4_ = auVar33._16_4_ * fVar327;
      auVar74._20_4_ = auVar33._20_4_ * fVar335;
      auVar74._24_4_ = auVar33._24_4_ * fVar336;
      auVar74._28_4_ = auVar34._28_4_;
      auVar75._4_4_ = auVar32._4_4_ * fVar308;
      auVar75._0_4_ = auVar32._0_4_ * fVar199;
      auVar75._8_4_ = auVar32._8_4_ * fVar213;
      auVar75._12_4_ = auVar32._12_4_ * fVar214;
      auVar75._16_4_ = auVar32._16_4_ * fVar260;
      auVar75._20_4_ = auVar32._20_4_ * fVar179;
      auVar75._24_4_ = auVar32._24_4_ * fVar292;
      auVar75._28_4_ = auVar32._28_4_;
      auVar32 = vsubps_avx(auVar75,auVar74);
      auVar248._0_4_ = auVar157._0_4_ * 0.0 + auVar32._0_4_ + auVar36._0_4_ * 0.0;
      auVar248._4_4_ = auVar157._4_4_ * 0.0 + auVar32._4_4_ + auVar36._4_4_ * 0.0;
      auVar248._8_4_ = auVar157._8_4_ * 0.0 + auVar32._8_4_ + auVar36._8_4_ * 0.0;
      auVar248._12_4_ = auVar157._12_4_ * 0.0 + auVar32._12_4_ + auVar36._12_4_ * 0.0;
      auVar248._16_4_ = auVar157._16_4_ * 0.0 + auVar32._16_4_ + auVar36._16_4_ * 0.0;
      auVar248._20_4_ = auVar157._20_4_ * 0.0 + auVar32._20_4_ + auVar36._20_4_ * 0.0;
      auVar248._24_4_ = auVar157._24_4_ * 0.0 + auVar32._24_4_ + auVar36._24_4_ * 0.0;
      auVar248._28_4_ = auVar32._28_4_ + auVar32._28_4_ + auVar36._28_4_;
      auVar32 = vmaxps_avx(auVar189,auVar248);
      auVar32 = vcmpps_avx(auVar32,ZEXT832(0) << 0x20,2);
      auVar204 = vpackssdw_avx(auVar32._0_16_,auVar32._16_16_);
      auVar263 = vpand_avx(auVar204,auVar263);
      auVar204 = vpmovsxwd_avx(auVar263);
      auVar206 = vpunpckhwd_avx(auVar263,auVar263);
      auVar224._16_16_ = auVar206;
      auVar224._0_16_ = auVar204;
      if ((((((((auVar224 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar224 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar224 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar224 >> 0x7f,0) == '\0') &&
            (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar206 >> 0x3f,0) == '\0') &&
          (auVar224 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar206[0xf]
         ) {
LAB_00ae256c:
        auVar228 = ZEXT3264(CONCAT824(uStack_508,
                                      CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
        auVar371 = ZEXT3264(auVar164);
      }
      else {
        auVar76._4_4_ = fVar268 * fVar236;
        auVar76._0_4_ = fVar362 * fVar290;
        auVar76._8_4_ = fVar310 * fVar269;
        auVar76._12_4_ = fVar233 * fVar230;
        auVar76._16_4_ = fVar305 * fVar303;
        auVar76._20_4_ = fVar307 * fVar325;
        auVar76._24_4_ = fVar178 * fVar171;
        auVar76._28_4_ = auVar206._12_4_;
        auVar367._0_4_ = fVar199 * fVar270;
        auVar367._4_4_ = fVar308 * fVar275;
        auVar367._8_4_ = fVar213 * fVar284;
        auVar367._12_4_ = fVar214 * fVar286;
        auVar367._16_4_ = fVar260 * fVar288;
        auVar367._20_4_ = fVar179 * fVar240;
        auVar367._24_4_ = fVar292 * fVar252;
        auVar367._28_4_ = 0;
        auVar32 = vsubps_avx(auVar367,auVar76);
        auVar77._4_4_ = fVar256 * fVar275;
        auVar77._0_4_ = fVar254 * fVar270;
        auVar77._8_4_ = fVar304 * fVar284;
        auVar77._12_4_ = fVar306 * fVar286;
        auVar77._16_4_ = fVar327 * fVar288;
        auVar77._20_4_ = fVar335 * fVar240;
        auVar77._24_4_ = fVar336 * fVar252;
        auVar77._28_4_ = auVar27._28_4_;
        auVar78._4_4_ = fVar268 * fVar267;
        auVar78._0_4_ = fVar362 * fVar231;
        auVar78._8_4_ = fVar310 * fVar273;
        auVar78._12_4_ = fVar233 * fVar322;
        auVar78._16_4_ = fVar305 * fVar235;
        auVar78._20_4_ = fVar307 * fVar198;
        auVar78._24_4_ = fVar178 * fVar177;
        auVar78._28_4_ = auVar187._28_4_;
        auVar34 = vsubps_avx(auVar78,auVar77);
        auVar79._4_4_ = fVar308 * fVar267;
        auVar79._0_4_ = fVar199 * fVar231;
        auVar79._8_4_ = fVar213 * fVar273;
        auVar79._12_4_ = fVar214 * fVar322;
        auVar79._16_4_ = fVar260 * fVar235;
        auVar79._20_4_ = fVar179 * fVar198;
        auVar79._24_4_ = fVar292 * fVar177;
        auVar79._28_4_ = auVar189._28_4_;
        auVar80._4_4_ = fVar256 * fVar236;
        auVar80._0_4_ = fVar254 * fVar290;
        auVar80._8_4_ = fVar304 * fVar269;
        auVar80._12_4_ = fVar306 * fVar230;
        auVar80._16_4_ = fVar327 * fVar303;
        auVar80._20_4_ = fVar335 * fVar325;
        auVar80._24_4_ = fVar336 * fVar171;
        auVar80._28_4_ = auVar158._28_4_;
        auVar36 = vsubps_avx(auVar80,auVar79);
        auVar299._0_4_ = auVar32._0_4_ * 0.0 + auVar36._0_4_ + auVar34._0_4_ * 0.0;
        auVar299._4_4_ = auVar32._4_4_ * 0.0 + auVar36._4_4_ + auVar34._4_4_ * 0.0;
        auVar299._8_4_ = auVar32._8_4_ * 0.0 + auVar36._8_4_ + auVar34._8_4_ * 0.0;
        auVar299._12_4_ = auVar32._12_4_ * 0.0 + auVar36._12_4_ + auVar34._12_4_ * 0.0;
        auVar299._16_4_ = auVar32._16_4_ * 0.0 + auVar36._16_4_ + auVar34._16_4_ * 0.0;
        auVar299._20_4_ = auVar32._20_4_ * 0.0 + auVar36._20_4_ + auVar34._20_4_ * 0.0;
        auVar299._24_4_ = auVar32._24_4_ * 0.0 + auVar36._24_4_ + auVar34._24_4_ * 0.0;
        auVar299._28_4_ = auVar158._28_4_ + auVar36._28_4_ + auVar189._28_4_;
        auVar33 = vrcpps_avx(auVar299);
        fVar290 = auVar33._0_4_;
        fVar231 = auVar33._4_4_;
        auVar81._4_4_ = auVar299._4_4_ * fVar231;
        auVar81._0_4_ = auVar299._0_4_ * fVar290;
        fVar362 = auVar33._8_4_;
        auVar81._8_4_ = auVar299._8_4_ * fVar362;
        fVar236 = auVar33._12_4_;
        auVar81._12_4_ = auVar299._12_4_ * fVar236;
        fVar267 = auVar33._16_4_;
        auVar81._16_4_ = auVar299._16_4_ * fVar267;
        fVar268 = auVar33._20_4_;
        auVar81._20_4_ = auVar299._20_4_ * fVar268;
        fVar269 = auVar33._24_4_;
        auVar81._24_4_ = auVar299._24_4_ * fVar269;
        auVar81._28_4_ = auVar187._28_4_;
        auVar368._8_4_ = 0x3f800000;
        auVar368._0_8_ = 0x3f8000003f800000;
        auVar368._12_4_ = 0x3f800000;
        auVar368._16_4_ = 0x3f800000;
        auVar368._20_4_ = 0x3f800000;
        auVar368._24_4_ = 0x3f800000;
        auVar368._28_4_ = 0x3f800000;
        auVar27 = vsubps_avx(auVar368,auVar81);
        fVar290 = auVar27._0_4_ * fVar290 + fVar290;
        fVar231 = auVar27._4_4_ * fVar231 + fVar231;
        fVar362 = auVar27._8_4_ * fVar362 + fVar362;
        fVar236 = auVar27._12_4_ * fVar236 + fVar236;
        fVar267 = auVar27._16_4_ * fVar267 + fVar267;
        fVar268 = auVar27._20_4_ * fVar268 + fVar268;
        fVar269 = auVar27._24_4_ * fVar269 + fVar269;
        auVar82._4_4_ =
             (auVar32._4_4_ * fVar259 + auVar34._4_4_ * fVar363 + auVar36._4_4_ * fVar172) * fVar231
        ;
        auVar82._0_4_ =
             (auVar32._0_4_ * fVar291 + auVar34._0_4_ * fVar258 + auVar36._0_4_ * fVar153) * fVar290
        ;
        auVar82._8_4_ =
             (auVar32._8_4_ * fVar272 + auVar34._8_4_ * fVar271 + auVar36._8_4_ * fVar174) * fVar362
        ;
        auVar82._12_4_ =
             (auVar32._12_4_ * fVar321 + auVar34._12_4_ * fVar302 + auVar36._12_4_ * fVar176) *
             fVar236;
        auVar82._16_4_ =
             (auVar32._16_4_ * fVar324 + auVar34._16_4_ * fVar323 + auVar36._16_4_ * fVar229) *
             fVar267;
        auVar82._20_4_ =
             (auVar32._20_4_ * fVar237 + auVar34._20_4_ * fVar326 + auVar36._20_4_ * fVar232) *
             fVar268;
        auVar82._24_4_ =
             (auVar32._24_4_ * fVar175 + auVar34._24_4_ * fVar173 + auVar36._24_4_ * fVar234) *
             fVar269;
        auVar82._28_4_ = auVar35._28_4_ + auVar31._28_4_;
        auVar204 = vpermilps_avx(ZEXT416(local_820),0);
        auVar163._16_16_ = auVar204;
        auVar163._0_16_ = auVar204;
        auVar31 = vcmpps_avx(auVar163,auVar82,2);
        uVar151 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar225._4_4_ = uVar151;
        auVar225._0_4_ = uVar151;
        auVar225._8_4_ = uVar151;
        auVar225._12_4_ = uVar151;
        auVar225._16_4_ = uVar151;
        auVar225._20_4_ = uVar151;
        auVar225._24_4_ = uVar151;
        auVar225._28_4_ = uVar151;
        auVar32 = vcmpps_avx(auVar82,auVar225,2);
        auVar31 = vandps_avx(auVar32,auVar31);
        auVar204 = vpackssdw_avx(auVar31._0_16_,auVar31._16_16_);
        auVar263 = vpand_avx(auVar263,auVar204);
        auVar204 = vpmovsxwd_avx(auVar263);
        auVar206 = vpshufd_avx(auVar263,0xee);
        auVar206 = vpmovsxwd_avx(auVar206);
        auVar226._16_16_ = auVar206;
        auVar226._0_16_ = auVar204;
        if ((((((((auVar226 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar226 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar226 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar226 >> 0x7f,0) == '\0') &&
              (auVar226 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar206 >> 0x3f,0) == '\0') &&
            (auVar226 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar206[0xf]) goto LAB_00ae256c;
        auVar31 = vcmpps_avx(ZEXT832(0) << 0x20,auVar299,4);
        auVar204 = vpackssdw_avx(auVar31._0_16_,auVar31._16_16_);
        auVar263 = vpand_avx(auVar263,auVar204);
        auVar204 = vpmovsxwd_avx(auVar263);
        auVar263 = vpunpckhwd_avx(auVar263,auVar263);
        auVar280._16_16_ = auVar263;
        auVar280._0_16_ = auVar204;
        auVar228 = ZEXT3264(CONCAT824(uStack_508,
                                      CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
        auVar371 = ZEXT3264(auVar164);
        if ((((((((auVar280 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar280 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar280 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar280 >> 0x7f,0) != '\0') ||
              (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar263 >> 0x3f,0) != '\0') ||
            (auVar280 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar263[0xf] < '\0') {
          auVar83._4_4_ = auVar189._4_4_ * fVar231;
          auVar83._0_4_ = auVar189._0_4_ * fVar290;
          auVar83._8_4_ = auVar189._8_4_ * fVar362;
          auVar83._12_4_ = auVar189._12_4_ * fVar236;
          auVar83._16_4_ = auVar189._16_4_ * fVar267;
          auVar83._20_4_ = auVar189._20_4_ * fVar268;
          auVar83._24_4_ = auVar189._24_4_ * fVar269;
          auVar83._28_4_ = SUB84(uStack_508,4);
          auVar84._4_4_ = auVar248._4_4_ * fVar231;
          auVar84._0_4_ = auVar248._0_4_ * fVar290;
          auVar84._8_4_ = auVar248._8_4_ * fVar362;
          auVar84._12_4_ = auVar248._12_4_ * fVar236;
          auVar84._16_4_ = auVar248._16_4_ * fVar267;
          auVar84._20_4_ = auVar248._20_4_ * fVar268;
          auVar84._24_4_ = auVar248._24_4_ * fVar269;
          auVar84._28_4_ = auVar27._28_4_ + auVar33._28_4_;
          auVar249._8_4_ = 0x3f800000;
          auVar249._0_8_ = 0x3f8000003f800000;
          auVar249._12_4_ = 0x3f800000;
          auVar249._16_4_ = 0x3f800000;
          auVar249._20_4_ = 0x3f800000;
          auVar249._24_4_ = 0x3f800000;
          auVar249._28_4_ = 0x3f800000;
          auVar164 = vsubps_avx(auVar249,auVar83);
          auVar164 = vblendvps_avx(auVar164,auVar83,auVar28);
          auVar371 = ZEXT3264(auVar164);
          auVar164 = vsubps_avx(auVar249,auVar84);
          _local_300 = vblendvps_avx(auVar164,auVar84,auVar28);
          auVar228 = ZEXT3264(auVar280);
          local_440 = auVar82;
        }
      }
      auVar350 = ZEXT3264(_local_800);
      auVar300 = ZEXT3264(local_600);
      auVar164 = auVar228._0_32_;
      if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar164 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar164 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar164 >> 0x7f,0) != '\0') ||
            (auVar228 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
           SUB321(auVar164 >> 0xbf,0) != '\0') ||
          (auVar228 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
          auVar228[0x1f] < '\0') {
        auVar31 = vsubps_avx(auVar265,auVar159);
        fVar258 = auVar159._0_4_ + auVar371._0_4_ * auVar31._0_4_;
        fVar291 = auVar159._4_4_ + auVar371._4_4_ * auVar31._4_4_;
        fVar231 = auVar159._8_4_ + auVar371._8_4_ * auVar31._8_4_;
        fVar362 = auVar159._12_4_ + auVar371._12_4_ * auVar31._12_4_;
        fVar236 = auVar159._16_4_ + auVar371._16_4_ * auVar31._16_4_;
        fVar363 = auVar159._20_4_ + auVar371._20_4_ * auVar31._20_4_;
        fVar259 = auVar159._24_4_ + auVar371._24_4_ * auVar31._24_4_;
        fVar267 = auVar31._28_4_ + 0.0;
        fVar290 = *(float *)((long)local_688->ray_space + k * 4 + -0x10);
        auVar85._4_4_ = (fVar291 + fVar291) * fVar290;
        auVar85._0_4_ = (fVar258 + fVar258) * fVar290;
        auVar85._8_4_ = (fVar231 + fVar231) * fVar290;
        auVar85._12_4_ = (fVar362 + fVar362) * fVar290;
        auVar85._16_4_ = (fVar236 + fVar236) * fVar290;
        auVar85._20_4_ = (fVar363 + fVar363) * fVar290;
        auVar85._24_4_ = (fVar259 + fVar259) * fVar290;
        auVar85._28_4_ = fVar267 + fVar267;
        auVar31 = vcmpps_avx(local_440,auVar85,6);
        auVar32 = auVar164 & auVar31;
        if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar32 >> 0x7f,0) != '\0') ||
              (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar32 >> 0xbf,0) != '\0') ||
            (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar32[0x1f] < '\0') {
          local_300._0_4_ = (float)local_300._0_4_ + (float)local_300._0_4_ + -1.0;
          local_300._4_4_ = (float)local_300._4_4_ + (float)local_300._4_4_ + -1.0;
          uStack_2f8._0_4_ = (float)uStack_2f8 + (float)uStack_2f8 + -1.0;
          uStack_2f8._4_4_ = uStack_2f8._4_4_ + uStack_2f8._4_4_ + -1.0;
          uStack_2f0._0_4_ = (float)uStack_2f0 + (float)uStack_2f0 + -1.0;
          uStack_2f0._4_4_ = uStack_2f0._4_4_ + uStack_2f0._4_4_ + -1.0;
          uStack_2e8._0_4_ = (float)uStack_2e8 + (float)uStack_2e8 + -1.0;
          uStack_2e8._4_4_ = uStack_2e8._4_4_ + uStack_2e8._4_4_ + -1.0;
          local_7e0 = auVar371._0_32_;
          local_2a0 = local_7e0;
          auVar141 = _local_300;
          auVar32 = _local_300;
          local_280 = (float)local_300._0_4_;
          fStack_27c = (float)local_300._4_4_;
          fStack_278 = (float)uStack_2f8;
          fStack_274 = uStack_2f8._4_4_;
          fStack_270 = (float)uStack_2f0;
          fStack_26c = uStack_2f0._4_4_;
          fStack_268 = (float)uStack_2e8;
          fStack_264 = uStack_2e8._4_4_;
          local_260 = local_440;
          local_240 = 0;
          local_23c = uVar150;
          local_230 = auVar294._0_8_;
          uStack_228 = uStack_838;
          local_220 = auVar311._0_8_;
          uStack_218 = uStack_848;
          uStack_758 = auVar394._8_8_;
          local_210 = auVar394._0_8_;
          uStack_208 = uStack_758;
          uStack_768 = auVar384._8_8_;
          local_200 = auVar384._0_8_;
          uStack_1f8 = uStack_768;
          _local_300 = auVar32;
          if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_560 = vandps_avx(auVar31,auVar164);
            auVar201._0_4_ = 1.0 / auVar217._0_4_;
            auVar201._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar263 = vshufps_avx(auVar201,auVar201,0);
            local_1c0[0] = auVar263._0_4_ * (auVar371._0_4_ + 0.0);
            local_1c0[1] = auVar263._4_4_ * (auVar371._4_4_ + 1.0);
            local_1c0[2] = auVar263._8_4_ * (auVar371._8_4_ + 2.0);
            local_1c0[3] = auVar263._12_4_ * (auVar371._12_4_ + 3.0);
            fStack_1b0 = auVar263._0_4_ * (auVar371._16_4_ + 4.0);
            fStack_1ac = auVar263._4_4_ * (auVar371._20_4_ + 5.0);
            fStack_1a8 = auVar263._8_4_ * (auVar371._24_4_ + 6.0);
            fStack_1a4 = auVar371._28_4_ + 7.0;
            uStack_2f0 = auVar141._16_8_;
            uStack_2e8 = auVar32._24_8_;
            local_1a0 = local_300;
            uStack_198 = uStack_2f8;
            uStack_190 = uStack_2f0;
            uStack_188 = uStack_2e8;
            local_180 = local_440;
            auVar190._8_4_ = 0x7f800000;
            auVar190._0_8_ = 0x7f8000007f800000;
            auVar190._12_4_ = 0x7f800000;
            auVar190._16_4_ = 0x7f800000;
            auVar190._20_4_ = 0x7f800000;
            auVar190._24_4_ = 0x7f800000;
            auVar190._28_4_ = 0x7f800000;
            auVar164 = vblendvps_avx(auVar190,local_440,local_560);
            auVar31 = vshufps_avx(auVar164,auVar164,0xb1);
            auVar31 = vminps_avx(auVar164,auVar31);
            auVar32 = vshufpd_avx(auVar31,auVar31,5);
            auVar31 = vminps_avx(auVar31,auVar32);
            auVar32 = vperm2f128_avx(auVar31,auVar31,1);
            auVar31 = vminps_avx(auVar31,auVar32);
            auVar31 = vcmpps_avx(auVar164,auVar31,0);
            auVar32 = local_560 & auVar31;
            auVar164 = local_560;
            if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar32 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar32 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar32 >> 0x7f,0) != '\0') ||
                  (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar32 >> 0xbf,0) != '\0') ||
                (auVar32 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar32[0x1f] < '\0') {
              auVar164 = vandps_avx(auVar31,local_560);
            }
            uVar142 = vmovmskps_avx(auVar164);
            uVar26 = 0;
            if (uVar142 != 0) {
              for (; (uVar142 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
              }
            }
            uVar147 = (ulong)uVar26;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar274 = local_1c0[uVar147];
              uVar151 = *(undefined4 *)((long)&local_1a0 + uVar147 * 4);
              fVar253 = 1.0 - fVar274;
              fVar251 = fVar274 * fVar253 * 4.0;
              auVar263 = ZEXT416((uint)(fVar274 * fVar274 * 0.5));
              auVar263 = vshufps_avx(auVar263,auVar263,0);
              auVar204 = ZEXT416((uint)((fVar253 * fVar253 + fVar251) * 0.5));
              auVar204 = vshufps_avx(auVar204,auVar204,0);
              auVar206 = ZEXT416((uint)((-fVar274 * fVar274 - fVar251) * 0.5));
              auVar206 = vshufps_avx(auVar206,auVar206,0);
              auVar218 = ZEXT416((uint)(fVar253 * -fVar253 * 0.5));
              auVar218 = vshufps_avx(auVar218,auVar218,0);
              auVar202._0_4_ =
                   auVar218._0_4_ * fVar293 +
                   auVar206._0_4_ * fVar309 + auVar263._0_4_ * fVar382 + auVar204._0_4_ * fVar392;
              auVar202._4_4_ =
                   auVar218._4_4_ * fVar301 +
                   auVar206._4_4_ * fVar320 + auVar263._4_4_ * fVar388 + auVar204._4_4_ * fVar399;
              auVar202._8_4_ =
                   auVar218._8_4_ * auVar294._8_4_ +
                   auVar206._8_4_ * auVar311._8_4_ +
                   auVar263._8_4_ * auVar384._8_4_ + auVar204._8_4_ * auVar394._8_4_;
              auVar202._12_4_ =
                   auVar218._12_4_ * auVar294._12_4_ +
                   auVar206._12_4_ * auVar311._12_4_ +
                   auVar263._12_4_ * auVar384._12_4_ + auVar204._12_4_ * auVar394._12_4_;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar147 * 4);
              *(float *)(ray + k * 4 + 0xc0) = auVar202._0_4_;
              uVar21 = vextractps_avx(auVar202,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar21;
              uVar21 = vextractps_avx(auVar202,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar21;
              *(float *)(ray + k * 4 + 0xf0) = fVar274;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar151;
              *(uint *)(ray + k * 4 + 0x110) = uVar143;
              *(uint *)(ray + k * 4 + 0x120) = uVar145;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_580._0_16_ = vpshufd_avx(auVar312,0);
              _local_640 = vpermilps_avx(local_610,0);
              _auStack_630 = auVar29._16_16_;
              _auStack_670 = auVar30._16_16_;
              _local_680 = *local_690;
              auStack_6b0 = auVar265._16_16_;
              local_6c0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              _auStack_718 = auVar222._8_24_;
              local_720 = auVar152;
              fStack_41c = auVar355._4_4_;
              fStack_418 = auVar355._8_4_;
              fStack_414 = auVar355._12_4_;
              while( true ) {
                local_380 = local_1c0[uVar147];
                local_370 = *(undefined4 *)((long)&local_1a0 + uVar147 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar147 * 4);
                fVar251 = 1.0 - local_380;
                fVar274 = local_380 * fVar251 * 4.0;
                auVar263 = ZEXT416((uint)(local_380 * local_380 * 0.5));
                auVar263 = vshufps_avx(auVar263,auVar263,0);
                auVar204 = ZEXT416((uint)((fVar251 * fVar251 + fVar274) * 0.5));
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar206 = ZEXT416((uint)((-local_380 * local_380 - fVar274) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                local_750.context = context->user;
                auVar218 = ZEXT416((uint)(fVar251 * -fVar251 * 0.5));
                auVar218 = vshufps_avx(auVar218,auVar218,0);
                auVar208._0_4_ =
                     auVar218._0_4_ * fVar293 +
                     auVar206._0_4_ * fVar309 +
                     auVar263._0_4_ * (float)local_770._0_4_ +
                     auVar204._0_4_ * (float)local_760._0_4_;
                auVar208._4_4_ =
                     auVar218._4_4_ * fVar301 +
                     auVar206._4_4_ * fVar320 +
                     auVar263._4_4_ * (float)local_770._4_4_ +
                     auVar204._4_4_ * (float)local_760._4_4_;
                auVar208._8_4_ =
                     auVar218._8_4_ * auVar294._8_4_ +
                     auVar206._8_4_ * auVar311._8_4_ +
                     auVar263._8_4_ * (float)uStack_768 + auVar204._8_4_ * (float)uStack_758;
                auVar208._12_4_ =
                     auVar218._12_4_ * auVar294._12_4_ +
                     auVar206._12_4_ * auVar311._12_4_ +
                     auVar263._12_4_ * uStack_768._4_4_ + auVar204._12_4_ * uStack_758._4_4_;
                auVar263 = vshufps_avx(auVar208,auVar208,0);
                local_3b0[0] = (RTCHitN)auVar263[0];
                local_3b0[1] = (RTCHitN)auVar263[1];
                local_3b0[2] = (RTCHitN)auVar263[2];
                local_3b0[3] = (RTCHitN)auVar263[3];
                local_3b0[4] = (RTCHitN)auVar263[4];
                local_3b0[5] = (RTCHitN)auVar263[5];
                local_3b0[6] = (RTCHitN)auVar263[6];
                local_3b0[7] = (RTCHitN)auVar263[7];
                local_3b0[8] = (RTCHitN)auVar263[8];
                local_3b0[9] = (RTCHitN)auVar263[9];
                local_3b0[10] = (RTCHitN)auVar263[10];
                local_3b0[0xb] = (RTCHitN)auVar263[0xb];
                local_3b0[0xc] = (RTCHitN)auVar263[0xc];
                local_3b0[0xd] = (RTCHitN)auVar263[0xd];
                local_3b0[0xe] = (RTCHitN)auVar263[0xe];
                local_3b0[0xf] = (RTCHitN)auVar263[0xf];
                auVar263 = vshufps_avx(auVar208,auVar208,0x55);
                local_3a0 = auVar263;
                local_390 = vshufps_avx(auVar208,auVar208,0xaa);
                fStack_37c = local_380;
                fStack_378 = local_380;
                fStack_374 = local_380;
                uStack_36c = local_370;
                uStack_368 = local_370;
                uStack_364 = local_370;
                local_360 = local_640;
                uStack_358 = uStack_638;
                local_350 = local_580._0_16_;
                vcmpps_avx(ZEXT1632(local_580._0_16_),ZEXT1632(local_580._0_16_),0xf);
                uStack_33c = (local_750.context)->instID[0];
                local_340 = uStack_33c;
                uStack_338 = uStack_33c;
                uStack_334 = uStack_33c;
                uStack_330 = (local_750.context)->instPrimID[0];
                uStack_32c = uStack_330;
                uStack_328 = uStack_330;
                uStack_324 = uStack_330;
                local_830 = _local_680;
                local_750.valid = (int *)local_830;
                local_750.geometryUserPtr = pGVar22->userPtr;
                local_750.hit = local_3b0;
                local_750.N = 4;
                local_750.ray = (RTCRayN *)ray;
                if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  (*pGVar22->intersectionFilterN)(&local_750);
                  auVar300 = ZEXT3264(local_600);
                  auVar350 = ZEXT3264(_local_800);
                  auVar371 = ZEXT3264(local_7e0);
                  auVar152 = local_720;
                  fVar239 = (float)local_7a0._0_4_;
                  fVar283 = (float)local_7a0._4_4_;
                  fVar255 = fStack_798;
                  fVar289 = fStack_794;
                  fVar287 = fStack_790;
                  fVar238 = fStack_78c;
                  fVar257 = fStack_788;
                }
                if (local_830 == (undefined1  [16])0x0) {
                  auVar263 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar263 = auVar263 ^ _DAT_01f46b70;
                  auVar312 = local_5e0._0_16_;
                }
                else {
                  p_Var25 = context->args->filter;
                  if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar22->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    (*p_Var25)(&local_750);
                    auVar300 = ZEXT3264(local_600);
                    auVar350 = ZEXT3264(_local_800);
                    auVar371 = ZEXT3264(local_7e0);
                    auVar152 = local_720;
                    fVar239 = (float)local_7a0._0_4_;
                    fVar283 = (float)local_7a0._4_4_;
                    fVar255 = fStack_798;
                    fVar289 = fStack_794;
                    fVar287 = fStack_790;
                    fVar238 = fStack_78c;
                    fVar257 = fStack_788;
                  }
                  auVar204 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                  auVar206 = vpcmpeqd_avx(auVar263,auVar263);
                  auVar263 = auVar204 ^ auVar206;
                  auVar312 = local_5e0._0_16_;
                  if (local_830 != (undefined1  [16])0x0) {
                    auVar204 = auVar204 ^ auVar206;
                    auVar206 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])local_750.hit);
                    *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar206;
                    auVar206 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])(local_750.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar206;
                    auVar206 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])(local_750.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar206;
                    auVar206 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])(local_750.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar206;
                    auVar206 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])(local_750.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar206;
                    auVar206 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])(local_750.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar206;
                    auVar206 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])(local_750.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar206;
                    auVar206 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])(local_750.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar206;
                    auVar204 = vmaskmovps_avx(auVar204,*(undefined1 (*) [16])(local_750.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar204;
                  }
                }
                auVar164 = local_440;
                auVar184._8_8_ = 0x100000001;
                auVar184._0_8_ = 0x100000001;
                if ((auVar184 & auVar263) == (undefined1  [16])0x0) {
                  *(int *)(ray + k * 4 + 0x80) = local_6c0._0_4_;
                  auVar263 = local_6c0;
                }
                else {
                  auVar263 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                }
                *(undefined4 *)(local_560 + uVar147 * 4) = 0;
                local_6c0 = auVar263;
                auVar263 = vshufps_avx(auVar263,auVar263,0);
                auVar170._16_16_ = auVar263;
                auVar170._0_16_ = auVar263;
                auVar30 = vcmpps_avx(auVar164,auVar170,2);
                auVar29 = vandps_avx(auVar30,local_560);
                local_560 = local_560 & auVar30;
                if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_560 >> 0x7f,0) == '\0') &&
                      (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_560 >> 0xbf,0) == '\0') &&
                    (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_560[0x1f]) break;
                auVar194._8_4_ = 0x7f800000;
                auVar194._0_8_ = 0x7f8000007f800000;
                auVar194._12_4_ = 0x7f800000;
                auVar194._16_4_ = 0x7f800000;
                auVar194._20_4_ = 0x7f800000;
                auVar194._24_4_ = 0x7f800000;
                auVar194._28_4_ = 0x7f800000;
                auVar164 = vblendvps_avx(auVar194,auVar164,auVar29);
                auVar30 = vshufps_avx(auVar164,auVar164,0xb1);
                auVar30 = vminps_avx(auVar164,auVar30);
                auVar31 = vshufpd_avx(auVar30,auVar30,5);
                auVar30 = vminps_avx(auVar30,auVar31);
                auVar31 = vperm2f128_avx(auVar30,auVar30,1);
                auVar30 = vminps_avx(auVar30,auVar31);
                auVar30 = vcmpps_avx(auVar164,auVar30,0);
                auVar31 = auVar29 & auVar30;
                auVar164 = auVar29;
                if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar31 >> 0x7f,0) != '\0') ||
                      (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0xbf,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar31[0x1f] < '\0') {
                  auVar164 = vandps_avx(auVar30,auVar29);
                }
                uVar143 = vmovmskps_avx(auVar164);
                uVar145 = 0;
                if (uVar143 != 0) {
                  for (; (uVar143 >> uVar145 & 1) == 0; uVar145 = uVar145 + 1) {
                  }
                }
                uVar147 = (ulong)uVar145;
                local_560 = auVar29;
              }
            }
          }
          fVar351 = (float)local_660._0_4_;
          fVar352 = (float)local_660._4_4_;
          fVar353 = fStack_658;
          fVar372 = fStack_654;
          fVar274 = fStack_650;
          fVar251 = fStack_64c;
          fVar253 = fStack_648;
          fVar285 = fStack_644;
          goto LAB_00ae0a2b;
        }
      }
    }
    if (8 < (int)uVar150) {
      _local_5a0 = vpshufd_avx(ZEXT416(uVar150),0);
      auVar263 = vshufps_avx(auVar219,auVar219,0);
      local_5e0._16_16_ = auVar263;
      local_5e0._0_16_ = auVar263;
      auVar131._4_4_ = uStack_81c;
      auVar131._0_4_ = local_820;
      auVar131._8_4_ = uStack_818;
      auVar131._12_4_ = uStack_814;
      auVar263 = vpermilps_avx(auVar131,0);
      local_2e0._16_16_ = auVar263;
      local_2e0._0_16_ = auVar263;
      auVar155._0_4_ = 1.0 / local_420;
      auVar155._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar263 = vshufps_avx(auVar155,auVar155,0);
      register0x00001210 = auVar263;
      _local_160 = auVar263;
      local_2b0 = vpshufd_avx(auVar312,0);
      local_610 = vpermilps_avx(local_610,0);
      lVar148 = 8;
      local_7e0 = auVar371._0_32_;
      local_600 = auVar300._0_32_;
      local_6c0._0_8_ = (long)(int)uVar150;
      while( true ) {
        if ((long)local_6c0._0_8_ <= lVar148) break;
        pauVar7 = (undefined1 (*) [28])(bspline_basis0 + lVar148 * 4 + lVar146);
        fVar290 = *(float *)*pauVar7;
        fVar258 = *(float *)(*pauVar7 + 4);
        fVar291 = *(float *)(*pauVar7 + 8);
        fVar231 = *(float *)(*pauVar7 + 0xc);
        fVar362 = *(float *)(*pauVar7 + 0x10);
        fVar236 = *(float *)(*pauVar7 + 0x14);
        fVar363 = *(float *)(*pauVar7 + 0x18);
        auVar140 = *pauVar7;
        pauVar9 = (undefined1 (*) [28])(lVar146 + 0x21fffac + lVar148 * 4);
        fVar259 = *(float *)*pauVar9;
        fVar267 = *(float *)(*pauVar9 + 4);
        fVar268 = *(float *)(*pauVar9 + 8);
        fVar269 = *(float *)(*pauVar9 + 0xc);
        fVar271 = *(float *)(*pauVar9 + 0x10);
        fVar272 = *(float *)(*pauVar9 + 0x14);
        fVar273 = *(float *)(*pauVar9 + 0x18);
        auVar139 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar146 + 0x2200430 + lVar148 * 4);
        fVar310 = *(float *)*pauVar9;
        fVar230 = *(float *)(*pauVar9 + 4);
        fVar302 = *(float *)(*pauVar9 + 8);
        fVar321 = *(float *)(*pauVar9 + 0xc);
        fVar322 = *(float *)(*pauVar9 + 0x10);
        fVar233 = *(float *)(*pauVar9 + 0x14);
        fVar303 = *(float *)(*pauVar9 + 0x18);
        auVar138 = *pauVar9;
        pfVar1 = (float *)(lVar146 + 0x22008b4 + lVar148 * 4);
        fVar323 = *pfVar1;
        fVar324 = pfVar1[1];
        fVar235 = pfVar1[2];
        fVar305 = pfVar1[3];
        fVar325 = pfVar1[4];
        fVar326 = pfVar1[5];
        fVar237 = pfVar1[6];
        fVar198 = pfVar1[7];
        local_880._0_4_ =
             (float)local_3e0._0_4_ * fVar290 +
             fVar239 * fVar259 + fVar180 * fVar310 + (float)local_400._0_4_ * fVar323;
        local_880._4_4_ =
             (float)local_3e0._4_4_ * fVar258 +
             fVar283 * fVar267 + fVar195 * fVar230 + (float)local_400._4_4_ * fVar324;
        fStack_878 = fStack_3d8 * fVar291 +
                     fVar255 * fVar268 + fVar196 * fVar302 + fStack_3f8 * fVar235;
        fStack_874 = fStack_3d4 * fVar231 +
                     fVar289 * fVar269 + fVar197 * fVar321 + fStack_3f4 * fVar305;
        fStack_870 = fStack_3d0 * fVar362 +
                     fVar287 * fVar271 + fVar180 * fVar322 + fStack_3f0 * fVar325;
        fStack_86c = fStack_3cc * fVar236 +
                     fVar238 * fVar272 + fVar195 * fVar233 + fStack_3ec * fVar326;
        fStack_868 = fStack_3c8 * fVar363 +
                     fVar257 * fVar273 + fVar196 * fVar303 + fStack_3e8 * fVar237;
        fStack_864 = fVar198 + fVar285 + fVar198 + fVar198 + fStack_3e4;
        fVar229 = auVar300._0_4_;
        fVar232 = auVar300._4_4_;
        fVar234 = auVar300._8_4_;
        fVar199 = auVar300._12_4_;
        fVar308 = auVar300._16_4_;
        fVar213 = auVar300._20_4_;
        fVar214 = auVar300._24_4_;
        local_7c0._0_4_ =
             fVar229 * fVar290 +
             fVar259 * (float)local_460._0_4_ + auVar350._0_4_ * fVar310 + fVar351 * fVar323;
        local_7c0._4_4_ =
             fVar232 * fVar258 +
             fVar267 * (float)local_460._4_4_ + auVar350._4_4_ * fVar230 + fVar352 * fVar324;
        local_7c0._8_4_ =
             fVar234 * fVar291 + fVar268 * fStack_458 + auVar350._8_4_ * fVar302 + fVar353 * fVar235
        ;
        local_7c0._12_4_ =
             fVar199 * fVar231 +
             fVar269 * fStack_454 + auVar350._12_4_ * fVar321 + fVar372 * fVar305;
        local_7c0._16_4_ =
             fVar308 * fVar362 +
             fVar271 * fStack_450 + auVar350._16_4_ * fVar322 + fVar274 * fVar325;
        local_7c0._20_4_ =
             fVar213 * fVar236 +
             fVar272 * fStack_44c + auVar350._20_4_ * fVar233 + fVar251 * fVar326;
        local_7c0._24_4_ =
             fVar214 * fVar363 +
             fVar273 * fStack_448 + auVar350._24_4_ * fVar303 + fVar253 * fVar237;
        local_7c0._28_4_ = fStack_864 + fVar198 + fVar198 + fStack_4e4;
        fVar153 = (float)local_e0._0_4_ * fVar259 +
                  (float)local_a0._0_4_ * fVar310 + (float)local_c0._0_4_ * fVar323 +
                  (float)local_100._0_4_ * fVar290;
        fVar172 = (float)local_e0._4_4_ * fVar267 +
                  (float)local_a0._4_4_ * fVar230 + (float)local_c0._4_4_ * fVar324 +
                  (float)local_100._4_4_ * fVar258;
        fVar174 = fStack_d8 * fVar268 + fStack_98 * fVar302 + fStack_b8 * fVar235 +
                  fStack_f8 * fVar291;
        fVar176 = fStack_d4 * fVar269 + fStack_94 * fVar321 + fStack_b4 * fVar305 +
                  fStack_f4 * fVar231;
        fStack_810 = fStack_d0 * fVar271 + fStack_90 * fVar322 + fStack_b0 * fVar325 +
                     fStack_f0 * fVar362;
        fStack_80c = fStack_cc * fVar272 + fStack_8c * fVar233 + fStack_ac * fVar326 +
                     fStack_ec * fVar236;
        fStack_808 = fStack_c8 * fVar273 + fStack_88 * fVar303 + fStack_a8 * fVar237 +
                     fStack_e8 * fVar363;
        fStack_804 = fVar198 + fVar198 + fVar285 + fStack_864;
        pfVar1 = (float *)(bspline_basis1 + lVar148 * 4 + lVar146);
        fVar290 = *pfVar1;
        fVar258 = pfVar1[1];
        fVar291 = pfVar1[2];
        fVar231 = pfVar1[3];
        fVar362 = pfVar1[4];
        fVar236 = pfVar1[5];
        fVar363 = pfVar1[6];
        pfVar2 = (float *)(lVar146 + 0x22023cc + lVar148 * 4);
        fVar259 = *pfVar2;
        fVar267 = pfVar2[1];
        fVar268 = pfVar2[2];
        fVar269 = pfVar2[3];
        fVar271 = pfVar2[4];
        fVar272 = pfVar2[5];
        fVar273 = pfVar2[6];
        pfVar3 = (float *)(lVar146 + 0x2202850 + lVar148 * 4);
        fVar310 = *pfVar3;
        fVar230 = pfVar3[1];
        fVar302 = pfVar3[2];
        fVar321 = pfVar3[3];
        fVar322 = pfVar3[4];
        fVar233 = pfVar3[5];
        fVar303 = pfVar3[6];
        pfVar4 = (float *)(lVar146 + 0x2202cd4 + lVar148 * 4);
        fVar198 = *pfVar4;
        fVar307 = pfVar4[1];
        fVar171 = pfVar4[2];
        fVar173 = pfVar4[3];
        fVar175 = pfVar4[4];
        fVar177 = pfVar4[5];
        fVar178 = pfVar4[6];
        fVar260 = auVar300._28_4_;
        fVar287 = fVar260 + fVar260 + fStack_3e4;
        auVar281._0_4_ =
             (float)local_3e0._0_4_ * fVar290 +
             (float)local_7a0._0_4_ * fVar259 + fVar180 * fVar310 + (float)local_400._0_4_ * fVar198
        ;
        auVar281._4_4_ =
             (float)local_3e0._4_4_ * fVar258 +
             (float)local_7a0._4_4_ * fVar267 + fVar195 * fVar230 + (float)local_400._4_4_ * fVar307
        ;
        auVar281._8_4_ =
             fStack_3d8 * fVar291 + fStack_798 * fVar268 + fVar196 * fVar302 + fStack_3f8 * fVar171;
        auVar281._12_4_ =
             fStack_3d4 * fVar231 + fStack_794 * fVar269 + fVar197 * fVar321 + fStack_3f4 * fVar173;
        auVar281._16_4_ =
             fStack_3d0 * fVar362 + fStack_790 * fVar271 + fVar180 * fVar322 + fStack_3f0 * fVar175;
        auVar281._20_4_ =
             fStack_3cc * fVar236 + fStack_78c * fVar272 + fVar195 * fVar233 + fStack_3ec * fVar177;
        auVar281._24_4_ =
             fStack_3c8 * fVar363 + fStack_788 * fVar273 + fVar196 * fVar303 + fStack_3e8 * fVar178;
        auVar281._28_4_ = fVar260 + fStack_a4 + fVar287;
        local_580._0_4_ =
             fVar229 * fVar290 +
             fVar259 * (float)local_460._0_4_ + auVar350._0_4_ * fVar310 + fVar351 * fVar198;
        local_580._4_4_ =
             fVar232 * fVar258 +
             fVar267 * (float)local_460._4_4_ + auVar350._4_4_ * fVar230 + fVar352 * fVar307;
        local_580._8_4_ =
             fVar234 * fVar291 + fVar268 * fStack_458 + auVar350._8_4_ * fVar302 + fVar353 * fVar171
        ;
        local_580._12_4_ =
             fVar199 * fVar231 +
             fVar269 * fStack_454 + auVar350._12_4_ * fVar321 + fVar372 * fVar173;
        local_580._16_4_ =
             fVar308 * fVar362 +
             fVar271 * fStack_450 + auVar350._16_4_ * fVar322 + fVar274 * fVar175;
        local_580._20_4_ =
             fVar213 * fVar236 +
             fVar272 * fStack_44c + auVar350._20_4_ * fVar233 + fVar251 * fVar177;
        local_580._24_4_ =
             fVar214 * fVar363 +
             fVar273 * fStack_448 + auVar350._24_4_ * fVar303 + fVar253 * fVar178;
        local_580._28_4_ = fVar287 + fVar260 + fVar260 + *(float *)pauVar7[1];
        auVar361._0_4_ =
             (float)local_e0._0_4_ * fVar259 +
             (float)local_a0._0_4_ * fVar310 + (float)local_c0._0_4_ * fVar198 +
             fVar290 * (float)local_100._0_4_;
        auVar361._4_4_ =
             (float)local_e0._4_4_ * fVar267 +
             (float)local_a0._4_4_ * fVar230 + (float)local_c0._4_4_ * fVar307 +
             fVar258 * (float)local_100._4_4_;
        auVar361._8_4_ =
             fStack_d8 * fVar268 + fStack_98 * fVar302 + fStack_b8 * fVar171 + fVar291 * fStack_f8;
        auVar361._12_4_ =
             fStack_d4 * fVar269 + fStack_94 * fVar321 + fStack_b4 * fVar173 + fVar231 * fStack_f4;
        auVar361._16_4_ =
             fStack_d0 * fVar271 + fStack_90 * fVar322 + fStack_b0 * fVar175 + fVar362 * fStack_f0;
        auVar361._20_4_ =
             fStack_cc * fVar272 + fStack_8c * fVar233 + fStack_ac * fVar177 + fVar236 * fStack_ec;
        auVar361._24_4_ =
             fStack_c8 * fVar273 + fStack_88 * fVar303 + fStack_a8 * fVar178 + fVar363 * fStack_e8;
        auVar361._28_4_ = fVar260 + fVar260 + fStack_a4 + fVar287;
        auVar29 = vsubps_avx(auVar281,_local_880);
        auVar30 = vsubps_avx(local_580,local_7c0);
        fVar239 = auVar29._0_4_;
        fVar274 = auVar29._4_4_;
        auVar86._4_4_ = local_7c0._4_4_ * fVar274;
        auVar86._0_4_ = (float)local_7c0._0_4_ * fVar239;
        fVar251 = auVar29._8_4_;
        auVar86._8_4_ = local_7c0._8_4_ * fVar251;
        fVar283 = auVar29._12_4_;
        auVar86._12_4_ = local_7c0._12_4_ * fVar283;
        fVar253 = auVar29._16_4_;
        auVar86._16_4_ = local_7c0._16_4_ * fVar253;
        fVar285 = auVar29._20_4_;
        auVar86._20_4_ = local_7c0._20_4_ * fVar285;
        fVar255 = auVar29._24_4_;
        auVar86._24_4_ = local_7c0._24_4_ * fVar255;
        auVar86._28_4_ = fVar287;
        fVar287 = auVar30._0_4_;
        fVar238 = auVar30._4_4_;
        auVar87._4_4_ = fVar238 * (float)local_880._4_4_;
        auVar87._0_4_ = fVar287 * (float)local_880._0_4_;
        fVar289 = auVar30._8_4_;
        auVar87._8_4_ = fVar289 * fStack_878;
        fVar257 = auVar30._12_4_;
        auVar87._12_4_ = fVar257 * fStack_874;
        fVar351 = auVar30._16_4_;
        auVar87._16_4_ = fVar351 * fStack_870;
        fVar352 = auVar30._20_4_;
        auVar87._20_4_ = fVar352 * fStack_86c;
        fVar353 = auVar30._24_4_;
        auVar87._24_4_ = fVar353 * fStack_868;
        auVar87._28_4_ = local_580._28_4_;
        auVar31 = vsubps_avx(auVar86,auVar87);
        auVar132._4_4_ = fVar172;
        auVar132._0_4_ = fVar153;
        auVar132._8_4_ = fVar174;
        auVar132._12_4_ = fVar176;
        auVar132._16_4_ = fStack_810;
        auVar132._20_4_ = fStack_80c;
        auVar132._24_4_ = fStack_808;
        auVar132._28_4_ = fStack_804;
        auVar164 = vmaxps_avx(auVar132,auVar361);
        auVar88._4_4_ = auVar164._4_4_ * auVar164._4_4_ * (fVar274 * fVar274 + fVar238 * fVar238);
        auVar88._0_4_ = auVar164._0_4_ * auVar164._0_4_ * (fVar239 * fVar239 + fVar287 * fVar287);
        auVar88._8_4_ = auVar164._8_4_ * auVar164._8_4_ * (fVar251 * fVar251 + fVar289 * fVar289);
        auVar88._12_4_ = auVar164._12_4_ * auVar164._12_4_ * (fVar283 * fVar283 + fVar257 * fVar257)
        ;
        auVar88._16_4_ = auVar164._16_4_ * auVar164._16_4_ * (fVar253 * fVar253 + fVar351 * fVar351)
        ;
        auVar88._20_4_ = auVar164._20_4_ * auVar164._20_4_ * (fVar285 * fVar285 + fVar352 * fVar352)
        ;
        auVar88._24_4_ = auVar164._24_4_ * auVar164._24_4_ * (fVar255 * fVar255 + fVar353 * fVar353)
        ;
        auVar88._28_4_ = auVar281._28_4_ + local_580._28_4_;
        auVar89._4_4_ = auVar31._4_4_ * auVar31._4_4_;
        auVar89._0_4_ = auVar31._0_4_ * auVar31._0_4_;
        auVar89._8_4_ = auVar31._8_4_ * auVar31._8_4_;
        auVar89._12_4_ = auVar31._12_4_ * auVar31._12_4_;
        auVar89._16_4_ = auVar31._16_4_ * auVar31._16_4_;
        auVar89._20_4_ = auVar31._20_4_ * auVar31._20_4_;
        auVar89._24_4_ = auVar31._24_4_ * auVar31._24_4_;
        auVar89._28_4_ = auVar31._28_4_;
        _local_5c0 = vcmpps_avx(auVar89,auVar88,2);
        local_240 = (uint)lVar148;
        auVar204 = vpshufd_avx(ZEXT416(local_240),0);
        auVar263 = vpor_avx(auVar204,_DAT_01f4ad30);
        auVar204 = vpor_avx(auVar204,_DAT_01f7afa0);
        auVar263 = vpcmpgtd_avx(_local_5a0,auVar263);
        auVar204 = vpcmpgtd_avx(_local_5a0,auVar204);
        register0x00001290 = auVar204;
        _local_480 = auVar263;
        auVar164 = _local_480 & _local_5c0;
        fVar351 = (float)local_660._0_4_;
        fVar352 = (float)local_660._4_4_;
        fVar353 = fStack_658;
        fVar372 = fStack_654;
        fVar274 = fStack_650;
        fVar251 = fStack_64c;
        fVar253 = fStack_648;
        fVar285 = fStack_644;
        fVar239 = (float)local_7a0._0_4_;
        fVar283 = (float)local_7a0._4_4_;
        fVar255 = fStack_798;
        fVar289 = fStack_794;
        fVar287 = fStack_790;
        fVar238 = fStack_78c;
        fVar257 = fStack_788;
        if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0x7f,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar164 >> 0xbf,0) == '\0') &&
            (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar164[0x1f]) {
          auVar371 = ZEXT3264(local_7e0);
          auVar350 = ZEXT3264(_local_800);
          auVar300 = ZEXT3264(auVar300._0_32_);
        }
        else {
          local_4a0 = fVar290 * (float)local_4e0._0_4_ +
                      fVar259 * (float)local_120._0_4_ +
                      (float)local_140._0_4_ * fVar310 + (float)local_700._0_4_ * fVar198;
          fStack_49c = fVar258 * (float)local_4e0._4_4_ +
                       fVar267 * (float)local_120._4_4_ +
                       (float)local_140._4_4_ * fVar230 + (float)local_700._4_4_ * fVar307;
          fStack_498 = fVar291 * fStack_4d8 +
                       fVar268 * fStack_118 + fStack_138 * fVar302 + fStack_6f8 * fVar171;
          fStack_494 = fVar231 * fStack_4d4 +
                       fVar269 * fStack_114 + fStack_134 * fVar321 + fStack_6f4 * fVar173;
          fStack_490 = fVar362 * fStack_4d0 +
                       fVar271 * fStack_110 + fStack_130 * fVar322 + fStack_6f0 * fVar175;
          fStack_48c = fVar236 * fStack_4cc +
                       fVar272 * fStack_10c + fStack_12c * fVar233 + fStack_6ec * fVar177;
          fStack_488 = fVar363 * fStack_4c8 +
                       fVar273 * fStack_108 + fStack_128 * fVar303 + fStack_6e8 * fVar178;
          fStack_484 = pfVar1[7] + pfVar3[7] + pfVar4[7] + 0.0;
          local_680._0_4_ = auVar139._0_4_;
          local_680._4_4_ = auVar139._4_4_;
          fStack_678 = auVar139._8_4_;
          fStack_674 = auVar139._12_4_;
          auStack_670._0_4_ = auVar139._16_4_;
          auStack_670._4_4_ = auVar139._20_4_;
          fStack_668 = auVar139._24_4_;
          local_720._0_4_ = auVar138._0_4_;
          local_720._4_4_ = auVar138._4_4_;
          auStack_718._0_4_ = auVar138._8_4_;
          auStack_718._4_4_ = auVar138._12_4_;
          fStack_710 = auVar138._16_4_;
          fStack_70c = auVar138._20_4_;
          fStack_708 = auVar138._24_4_;
          pfVar1 = (float *)(lVar146 + 0x2201640 + lVar148 * 4);
          fVar290 = *pfVar1;
          fVar258 = pfVar1[1];
          fVar291 = pfVar1[2];
          fVar231 = pfVar1[3];
          fVar362 = pfVar1[4];
          fVar236 = pfVar1[5];
          fVar363 = pfVar1[6];
          pfVar3 = (float *)(lVar146 + 0x2201ac4 + lVar148 * 4);
          fVar259 = *pfVar3;
          fVar267 = pfVar3[1];
          fVar268 = pfVar3[2];
          fVar269 = pfVar3[3];
          fVar271 = pfVar3[4];
          fVar272 = pfVar3[5];
          fVar273 = pfVar3[6];
          fVar292 = pfVar2[7] + 0.0;
          pfVar5 = (float *)(lVar146 + 0x22011bc + lVar148 * 4);
          fVar310 = *pfVar5;
          fVar230 = pfVar5[1];
          fVar302 = pfVar5[2];
          fVar321 = pfVar5[3];
          fVar322 = pfVar5[4];
          fVar233 = pfVar5[5];
          fVar303 = pfVar5[6];
          fVar179 = pfVar1[7] + pfVar3[7];
          fStack_404 = pfVar3[7] + fVar292;
          fVar292 = fVar292 + pfVar2[7] + auVar204._12_4_;
          pfVar1 = (float *)(lVar146 + 0x2200d38 + lVar148 * 4);
          fVar198 = *pfVar1;
          fVar307 = pfVar1[1];
          fVar171 = pfVar1[2];
          fVar173 = pfVar1[3];
          fVar175 = pfVar1[4];
          fVar177 = pfVar1[5];
          fVar178 = pfVar1[6];
          local_6e0 = (float)local_3e0._0_4_ * fVar198 +
                      (float)local_7a0._0_4_ * fVar310 +
                      fVar180 * fVar290 + (float)local_400._0_4_ * fVar259;
          fStack_6dc = (float)local_3e0._4_4_ * fVar307 +
                       (float)local_7a0._4_4_ * fVar230 +
                       fVar195 * fVar258 + (float)local_400._4_4_ * fVar267;
          fStack_6d8 = fStack_3d8 * fVar171 +
                       fStack_798 * fVar302 + fVar196 * fVar291 + fStack_3f8 * fVar268;
          fStack_6d4 = fStack_3d4 * fVar173 +
                       fStack_794 * fVar321 + fVar197 * fVar231 + fStack_3f4 * fVar269;
          fStack_6d0 = fStack_3d0 * fVar175 +
                       fStack_790 * fVar322 + fVar180 * fVar362 + fStack_3f0 * fVar271;
          fStack_6cc = fStack_3cc * fVar177 +
                       fStack_78c * fVar233 + fVar195 * fVar236 + fStack_3ec * fVar272;
          fStack_6c8 = fStack_3c8 * fVar178 +
                       fStack_788 * fVar303 + fVar196 * fVar363 + fStack_3e8 * fVar273;
          fStack_6c4 = fVar179 + fStack_404;
          local_420 = fVar229 * fVar198 +
                      fVar310 * (float)local_460._0_4_ +
                      (float)local_800._0_4_ * fVar290 + (float)local_660._0_4_ * fVar259;
          fStack_41c = fVar232 * fVar307 +
                       fVar230 * (float)local_460._4_4_ +
                       (float)local_800._4_4_ * fVar258 + (float)local_660._4_4_ * fVar267;
          fStack_418 = fVar234 * fVar171 +
                       fVar302 * fStack_458 + fStack_7f8 * fVar291 + fStack_658 * fVar268;
          fStack_414 = fVar199 * fVar173 +
                       fVar321 * fStack_454 + fStack_7f4 * fVar231 + fStack_654 * fVar269;
          fStack_410 = fVar308 * fVar175 +
                       fVar322 * fStack_450 + fStack_7f0 * fVar362 + fStack_650 * fVar271;
          fStack_40c = fVar213 * fVar177 +
                       fVar233 * fStack_44c + fStack_7ec * fVar236 + fStack_64c * fVar272;
          fStack_408 = fVar214 * fVar178 +
                       fVar303 * fStack_448 + fStack_7e8 * fVar363 + fStack_648 * fVar273;
          fStack_404 = fStack_404 + fVar292;
          auVar377._0_4_ =
               fVar310 * (float)local_120._0_4_ +
               (float)local_140._0_4_ * fVar290 + (float)local_700._0_4_ * fVar259 +
               fVar198 * (float)local_4e0._0_4_;
          auVar377._4_4_ =
               fVar230 * (float)local_120._4_4_ +
               (float)local_140._4_4_ * fVar258 + (float)local_700._4_4_ * fVar267 +
               fVar307 * (float)local_4e0._4_4_;
          auVar377._8_4_ =
               fVar302 * fStack_118 + fStack_138 * fVar291 + fStack_6f8 * fVar268 +
               fVar171 * fStack_4d8;
          auVar377._12_4_ =
               fVar321 * fStack_114 + fStack_134 * fVar231 + fStack_6f4 * fVar269 +
               fVar173 * fStack_4d4;
          auVar377._16_4_ =
               fVar322 * fStack_110 + fStack_130 * fVar362 + fStack_6f0 * fVar271 +
               fVar175 * fStack_4d0;
          auVar377._20_4_ =
               fVar233 * fStack_10c + fStack_12c * fVar236 + fStack_6ec * fVar272 +
               fVar177 * fStack_4cc;
          auVar377._24_4_ =
               fVar303 * fStack_108 + fStack_128 * fVar363 + fStack_6e8 * fVar273 +
               fVar178 * fStack_4c8;
          auVar377._28_4_ = pfVar5[7] + fVar179 + fVar292;
          pfVar1 = (float *)(lVar146 + 0x2203a60 + lVar148 * 4);
          fVar290 = *pfVar1;
          fVar258 = pfVar1[1];
          fVar291 = pfVar1[2];
          fVar231 = pfVar1[3];
          fVar362 = pfVar1[4];
          fVar236 = pfVar1[5];
          fVar363 = pfVar1[6];
          pfVar2 = (float *)(lVar146 + 0x2203ee4 + lVar148 * 4);
          fVar259 = *pfVar2;
          fVar267 = pfVar2[1];
          fVar268 = pfVar2[2];
          fVar269 = pfVar2[3];
          fVar271 = pfVar2[4];
          fVar272 = pfVar2[5];
          fVar273 = pfVar2[6];
          pfVar3 = (float *)(lVar146 + 0x22035dc + lVar148 * 4);
          fVar310 = *pfVar3;
          fVar230 = pfVar3[1];
          fVar302 = pfVar3[2];
          fVar321 = pfVar3[3];
          fVar322 = pfVar3[4];
          fVar233 = pfVar3[5];
          fVar303 = pfVar3[6];
          pfVar5 = (float *)(lVar146 + 0x2203158 + lVar148 * 4);
          fVar198 = *pfVar5;
          fVar307 = pfVar5[1];
          fVar171 = pfVar5[2];
          fVar173 = pfVar5[3];
          fVar175 = pfVar5[4];
          fVar177 = pfVar5[5];
          fVar178 = pfVar5[6];
          auVar333._0_4_ =
               (float)local_3e0._0_4_ * fVar198 +
               fVar310 * (float)local_7a0._0_4_ +
               fVar180 * fVar290 + (float)local_400._0_4_ * fVar259;
          auVar333._4_4_ =
               (float)local_3e0._4_4_ * fVar307 +
               fVar230 * (float)local_7a0._4_4_ +
               fVar195 * fVar258 + (float)local_400._4_4_ * fVar267;
          auVar333._8_4_ =
               fStack_3d8 * fVar171 +
               fVar302 * fStack_798 + fVar196 * fVar291 + fStack_3f8 * fVar268;
          auVar333._12_4_ =
               fStack_3d4 * fVar173 +
               fVar321 * fStack_794 + fVar197 * fVar231 + fStack_3f4 * fVar269;
          auVar333._16_4_ =
               fStack_3d0 * fVar175 +
               fVar322 * fStack_790 + fVar180 * fVar362 + fStack_3f0 * fVar271;
          auVar333._20_4_ =
               fStack_3cc * fVar177 +
               fVar233 * fStack_78c + fVar195 * fVar236 + fStack_3ec * fVar272;
          auVar333._24_4_ =
               fStack_3c8 * fVar178 +
               fVar303 * fStack_788 + fVar196 * fVar363 + fStack_3e8 * fVar273;
          auVar333._28_4_ = fVar260 + fVar260 + fVar197 + fVar260;
          auVar369._0_4_ =
               fVar198 * fVar229 +
               fVar310 * (float)local_460._0_4_ +
               (float)local_800._0_4_ * fVar290 + (float)local_660._0_4_ * fVar259;
          auVar369._4_4_ =
               fVar307 * fVar232 +
               fVar230 * (float)local_460._4_4_ +
               (float)local_800._4_4_ * fVar258 + (float)local_660._4_4_ * fVar267;
          auVar369._8_4_ =
               fVar171 * fVar234 +
               fVar302 * fStack_458 + fStack_7f8 * fVar291 + fStack_658 * fVar268;
          auVar369._12_4_ =
               fVar173 * fVar199 +
               fVar321 * fStack_454 + fStack_7f4 * fVar231 + fStack_654 * fVar269;
          auVar369._16_4_ =
               fVar175 * fVar308 +
               fVar322 * fStack_450 + fStack_7f0 * fVar362 + fStack_650 * fVar271;
          auVar369._20_4_ =
               fVar177 * fVar213 +
               fVar233 * fStack_44c + fStack_7ec * fVar236 + fStack_64c * fVar272;
          auVar369._24_4_ =
               fVar178 * fVar214 +
               fVar303 * fStack_448 + fStack_7e8 * fVar363 + fStack_648 * fVar273;
          auVar369._28_4_ = fVar260 + fVar260 + fStack_3e4 + fVar260;
          auVar266._8_4_ = 0x7fffffff;
          auVar266._0_8_ = 0x7fffffff7fffffff;
          auVar266._12_4_ = 0x7fffffff;
          auVar266._16_4_ = 0x7fffffff;
          auVar266._20_4_ = 0x7fffffff;
          auVar266._24_4_ = 0x7fffffff;
          auVar266._28_4_ = 0x7fffffff;
          auVar134._4_4_ = fStack_6dc;
          auVar134._0_4_ = local_6e0;
          auVar134._8_4_ = fStack_6d8;
          auVar134._12_4_ = fStack_6d4;
          auVar134._16_4_ = fStack_6d0;
          auVar134._20_4_ = fStack_6cc;
          auVar134._24_4_ = fStack_6c8;
          auVar134._28_4_ = fStack_6c4;
          auVar164 = vandps_avx(auVar134,auVar266);
          auVar137._4_4_ = fStack_41c;
          auVar137._0_4_ = local_420;
          auVar137._8_4_ = fStack_418;
          auVar137._12_4_ = fStack_414;
          auVar137._16_4_ = fStack_410;
          auVar137._20_4_ = fStack_40c;
          auVar137._24_4_ = fStack_408;
          auVar137._28_4_ = fStack_404;
          auVar31 = vandps_avx(auVar137,auVar266);
          auVar31 = vmaxps_avx(auVar164,auVar31);
          auVar164 = vandps_avx(auVar377,auVar266);
          auVar31 = vmaxps_avx(auVar31,auVar164);
          auVar31 = vcmpps_avx(auVar31,local_5e0,1);
          auVar32 = vblendvps_avx(auVar134,auVar29,auVar31);
          auVar166._0_4_ =
               fVar198 * (float)local_4e0._0_4_ +
               fVar310 * (float)local_120._0_4_ +
               fVar259 * (float)local_700._0_4_ + (float)local_140._0_4_ * fVar290;
          auVar166._4_4_ =
               fVar307 * (float)local_4e0._4_4_ +
               fVar230 * (float)local_120._4_4_ +
               fVar267 * (float)local_700._4_4_ + (float)local_140._4_4_ * fVar258;
          auVar166._8_4_ =
               fVar171 * fStack_4d8 +
               fVar302 * fStack_118 + fVar268 * fStack_6f8 + fStack_138 * fVar291;
          auVar166._12_4_ =
               fVar173 * fStack_4d4 +
               fVar321 * fStack_114 + fVar269 * fStack_6f4 + fStack_134 * fVar231;
          auVar166._16_4_ =
               fVar175 * fStack_4d0 +
               fVar322 * fStack_110 + fVar271 * fStack_6f0 + fStack_130 * fVar362;
          auVar166._20_4_ =
               fVar177 * fStack_4cc +
               fVar233 * fStack_10c + fVar272 * fStack_6ec + fStack_12c * fVar236;
          auVar166._24_4_ =
               fVar178 * fStack_4c8 +
               fVar303 * fStack_108 + fVar273 * fStack_6e8 + fStack_128 * fVar363;
          auVar166._28_4_ = auVar164._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar33 = vblendvps_avx(auVar137,auVar30,auVar31);
          auVar164 = vandps_avx(auVar333,auVar266);
          auVar31 = vandps_avx(auVar369,auVar266);
          auVar34 = vmaxps_avx(auVar164,auVar31);
          auVar164 = vandps_avx(auVar166,auVar266);
          auVar164 = vmaxps_avx(auVar34,auVar164);
          local_640._0_4_ = auVar140._0_4_;
          local_640._4_4_ = auVar140._4_4_;
          uStack_638._0_4_ = auVar140._8_4_;
          uStack_638._4_4_ = auVar140._12_4_;
          auStack_630._0_4_ = auVar140._16_4_;
          auStack_630._4_4_ = auVar140._20_4_;
          fStack_628 = auVar140._24_4_;
          auVar31 = vcmpps_avx(auVar164,local_5e0,1);
          auVar164 = vblendvps_avx(auVar333,auVar29,auVar31);
          auVar167._0_4_ =
               (float)local_4e0._0_4_ * (float)local_640._0_4_ +
               (float)local_120._0_4_ * (float)local_680._0_4_ +
               (float)local_140._0_4_ * (float)local_720._0_4_ + (float)local_700._0_4_ * fVar323;
          auVar167._4_4_ =
               (float)local_4e0._4_4_ * (float)local_640._4_4_ +
               (float)local_120._4_4_ * (float)local_680._4_4_ +
               (float)local_140._4_4_ * (float)local_720._4_4_ + (float)local_700._4_4_ * fVar324;
          auVar167._8_4_ =
               fStack_4d8 * (float)uStack_638 +
               fStack_118 * fStack_678 +
               fStack_138 * (float)auStack_718._0_4_ + fStack_6f8 * fVar235;
          auVar167._12_4_ =
               fStack_4d4 * uStack_638._4_4_ +
               fStack_114 * fStack_674 +
               fStack_134 * (float)auStack_718._4_4_ + fStack_6f4 * fVar305;
          auVar167._16_4_ =
               fStack_4d0 * (float)auStack_630._0_4_ +
               fStack_110 * (float)auStack_670._0_4_ +
               fStack_130 * fStack_710 + fStack_6f0 * fVar325;
          auVar167._20_4_ =
               fStack_4cc * (float)auStack_630._4_4_ +
               fStack_10c * (float)auStack_670._4_4_ +
               fStack_12c * fStack_70c + fStack_6ec * fVar326;
          auVar167._24_4_ =
               fStack_4c8 * fStack_628 +
               fStack_108 * fStack_668 + fStack_128 * fStack_708 + fStack_6e8 * fVar237;
          auVar167._28_4_ = auVar34._28_4_ + fStack_484 + pfVar4[7] + 0.0;
          auVar29 = vblendvps_avx(auVar369,auVar30,auVar31);
          fVar229 = auVar32._0_4_;
          fVar232 = auVar32._4_4_;
          fVar234 = auVar32._8_4_;
          fVar199 = auVar32._12_4_;
          fVar308 = auVar32._16_4_;
          fVar213 = auVar32._20_4_;
          fVar214 = auVar32._24_4_;
          fVar260 = auVar32._28_4_;
          fVar310 = auVar164._0_4_;
          fVar302 = auVar164._4_4_;
          fVar322 = auVar164._8_4_;
          fVar303 = auVar164._12_4_;
          fVar324 = auVar164._16_4_;
          fVar305 = auVar164._20_4_;
          fVar326 = auVar164._24_4_;
          fVar290 = auVar33._0_4_;
          fVar291 = auVar33._4_4_;
          fVar362 = auVar33._8_4_;
          fVar363 = auVar33._12_4_;
          fVar267 = auVar33._16_4_;
          fVar269 = auVar33._20_4_;
          fVar272 = auVar33._24_4_;
          auVar349._0_4_ = fVar290 * fVar290 + fVar229 * fVar229;
          auVar349._4_4_ = fVar291 * fVar291 + fVar232 * fVar232;
          auVar349._8_4_ = fVar362 * fVar362 + fVar234 * fVar234;
          auVar349._12_4_ = fVar363 * fVar363 + fVar199 * fVar199;
          auVar349._16_4_ = fVar267 * fVar267 + fVar308 * fVar308;
          auVar349._20_4_ = fVar269 * fVar269 + fVar213 * fVar213;
          auVar349._24_4_ = fVar272 * fVar272 + fVar214 * fVar214;
          auVar349._28_4_ = fStack_644 + auVar30._28_4_;
          auVar30 = vrsqrtps_avx(auVar349);
          fVar258 = auVar30._0_4_;
          fVar231 = auVar30._4_4_;
          auVar90._4_4_ = fVar231 * 1.5;
          auVar90._0_4_ = fVar258 * 1.5;
          fVar236 = auVar30._8_4_;
          auVar90._8_4_ = fVar236 * 1.5;
          fVar259 = auVar30._12_4_;
          auVar90._12_4_ = fVar259 * 1.5;
          fVar268 = auVar30._16_4_;
          auVar90._16_4_ = fVar268 * 1.5;
          fVar271 = auVar30._20_4_;
          auVar90._20_4_ = fVar271 * 1.5;
          fVar273 = auVar30._24_4_;
          auVar90._24_4_ = fVar273 * 1.5;
          auVar90._28_4_ = auVar369._28_4_;
          auVar91._4_4_ = fVar231 * fVar231 * fVar231 * auVar349._4_4_ * 0.5;
          auVar91._0_4_ = fVar258 * fVar258 * fVar258 * auVar349._0_4_ * 0.5;
          auVar91._8_4_ = fVar236 * fVar236 * fVar236 * auVar349._8_4_ * 0.5;
          auVar91._12_4_ = fVar259 * fVar259 * fVar259 * auVar349._12_4_ * 0.5;
          auVar91._16_4_ = fVar268 * fVar268 * fVar268 * auVar349._16_4_ * 0.5;
          auVar91._20_4_ = fVar271 * fVar271 * fVar271 * auVar349._20_4_ * 0.5;
          auVar91._24_4_ = fVar273 * fVar273 * fVar273 * auVar349._24_4_ * 0.5;
          auVar91._28_4_ = auVar349._28_4_;
          auVar31 = vsubps_avx(auVar90,auVar91);
          fVar198 = auVar31._0_4_;
          fVar307 = auVar31._4_4_;
          fVar171 = auVar31._8_4_;
          fVar173 = auVar31._12_4_;
          fVar175 = auVar31._16_4_;
          fVar177 = auVar31._20_4_;
          fVar178 = auVar31._24_4_;
          fVar258 = auVar29._0_4_;
          fVar231 = auVar29._4_4_;
          fVar236 = auVar29._8_4_;
          fVar259 = auVar29._12_4_;
          fVar268 = auVar29._16_4_;
          fVar271 = auVar29._20_4_;
          fVar273 = auVar29._24_4_;
          auVar317._0_4_ = fVar258 * fVar258 + fVar310 * fVar310;
          auVar317._4_4_ = fVar231 * fVar231 + fVar302 * fVar302;
          auVar317._8_4_ = fVar236 * fVar236 + fVar322 * fVar322;
          auVar317._12_4_ = fVar259 * fVar259 + fVar303 * fVar303;
          auVar317._16_4_ = fVar268 * fVar268 + fVar324 * fVar324;
          auVar317._20_4_ = fVar271 * fVar271 + fVar305 * fVar305;
          auVar317._24_4_ = fVar273 * fVar273 + fVar326 * fVar326;
          auVar317._28_4_ = auVar30._28_4_ + auVar164._28_4_;
          auVar164 = vrsqrtps_avx(auVar317);
          fVar230 = auVar164._0_4_;
          fVar321 = auVar164._4_4_;
          auVar92._4_4_ = fVar321 * 1.5;
          auVar92._0_4_ = fVar230 * 1.5;
          fVar233 = auVar164._8_4_;
          auVar92._8_4_ = fVar233 * 1.5;
          fVar323 = auVar164._12_4_;
          auVar92._12_4_ = fVar323 * 1.5;
          fVar235 = auVar164._16_4_;
          auVar92._16_4_ = fVar235 * 1.5;
          fVar325 = auVar164._20_4_;
          auVar92._20_4_ = fVar325 * 1.5;
          fVar237 = auVar164._24_4_;
          auVar92._24_4_ = fVar237 * 1.5;
          auVar92._28_4_ = auVar369._28_4_;
          auVar93._4_4_ = fVar321 * fVar321 * fVar321 * auVar317._4_4_ * 0.5;
          auVar93._0_4_ = fVar230 * fVar230 * fVar230 * auVar317._0_4_ * 0.5;
          auVar93._8_4_ = fVar233 * fVar233 * fVar233 * auVar317._8_4_ * 0.5;
          auVar93._12_4_ = fVar323 * fVar323 * fVar323 * auVar317._12_4_ * 0.5;
          auVar93._16_4_ = fVar235 * fVar235 * fVar235 * auVar317._16_4_ * 0.5;
          auVar93._20_4_ = fVar325 * fVar325 * fVar325 * auVar317._20_4_ * 0.5;
          auVar93._24_4_ = fVar237 * fVar237 * fVar237 * auVar317._24_4_ * 0.5;
          auVar93._28_4_ = auVar317._28_4_;
          auVar29 = vsubps_avx(auVar92,auVar93);
          fVar230 = auVar29._0_4_;
          fVar321 = auVar29._4_4_;
          fVar233 = auVar29._8_4_;
          fVar323 = auVar29._12_4_;
          fVar235 = auVar29._16_4_;
          fVar325 = auVar29._20_4_;
          fVar237 = auVar29._24_4_;
          fVar290 = fVar153 * fVar198 * fVar290;
          fVar291 = fVar172 * fVar307 * fVar291;
          auVar94._4_4_ = fVar291;
          auVar94._0_4_ = fVar290;
          fVar362 = fVar174 * fVar171 * fVar362;
          auVar94._8_4_ = fVar362;
          fVar363 = fVar176 * fVar173 * fVar363;
          auVar94._12_4_ = fVar363;
          fVar267 = fStack_810 * fVar175 * fVar267;
          auVar94._16_4_ = fVar267;
          fVar269 = fStack_80c * fVar177 * fVar269;
          auVar94._20_4_ = fVar269;
          fVar272 = fStack_808 * fVar178 * fVar272;
          auVar94._24_4_ = fVar272;
          auVar94._28_4_ = auVar164._28_4_;
          local_640._4_4_ = fVar291 + (float)local_880._4_4_;
          local_640._0_4_ = fVar290 + (float)local_880._0_4_;
          uStack_638._0_4_ = fVar362 + fStack_878;
          uStack_638._4_4_ = fVar363 + fStack_874;
          auStack_630._0_4_ = fVar267 + fStack_870;
          auStack_630._4_4_ = fVar269 + fStack_86c;
          fStack_628 = fVar272 + fStack_868;
          fStack_624 = auVar164._28_4_ + fStack_864;
          fVar290 = fVar153 * fVar198 * -fVar229;
          fVar291 = fVar172 * fVar307 * -fVar232;
          auVar95._4_4_ = fVar291;
          auVar95._0_4_ = fVar290;
          fVar362 = fVar174 * fVar171 * -fVar234;
          auVar95._8_4_ = fVar362;
          fVar363 = fVar176 * fVar173 * -fVar199;
          auVar95._12_4_ = fVar363;
          fVar267 = fStack_810 * fVar175 * -fVar308;
          auVar95._16_4_ = fVar267;
          fVar269 = fStack_80c * fVar177 * -fVar213;
          auVar95._20_4_ = fVar269;
          fVar272 = fStack_808 * fVar178 * -fVar214;
          auVar95._24_4_ = fVar272;
          auVar95._28_4_ = -fVar260;
          local_720._4_4_ = local_7c0._4_4_ + fVar291;
          local_720._0_4_ = (float)local_7c0._0_4_ + fVar290;
          auStack_718._0_4_ = local_7c0._8_4_ + fVar362;
          auStack_718._4_4_ = local_7c0._12_4_ + fVar363;
          fStack_710 = local_7c0._16_4_ + fVar267;
          fStack_70c = local_7c0._20_4_ + fVar269;
          fStack_708 = local_7c0._24_4_ + fVar272;
          fStack_704 = local_7c0._28_4_ + -fVar260;
          fVar290 = fVar198 * 0.0 * fVar153;
          fVar291 = fVar307 * 0.0 * fVar172;
          auVar96._4_4_ = fVar291;
          auVar96._0_4_ = fVar290;
          fVar362 = fVar171 * 0.0 * fVar174;
          auVar96._8_4_ = fVar362;
          fVar363 = fVar173 * 0.0 * fVar176;
          auVar96._12_4_ = fVar363;
          fVar267 = fVar175 * 0.0 * fStack_810;
          auVar96._16_4_ = fVar267;
          fVar269 = fVar177 * 0.0 * fStack_80c;
          auVar96._20_4_ = fVar269;
          fVar272 = fVar178 * 0.0 * fStack_808;
          auVar96._24_4_ = fVar272;
          auVar96._28_4_ = fVar260;
          auVar164 = vsubps_avx(_local_880,auVar94);
          auVar398._0_4_ = fVar290 + auVar167._0_4_;
          auVar398._4_4_ = fVar291 + auVar167._4_4_;
          auVar398._8_4_ = fVar362 + auVar167._8_4_;
          auVar398._12_4_ = fVar363 + auVar167._12_4_;
          auVar398._16_4_ = fVar267 + auVar167._16_4_;
          auVar398._20_4_ = fVar269 + auVar167._20_4_;
          auVar398._24_4_ = fVar272 + auVar167._24_4_;
          auVar398._28_4_ = fVar260 + auVar167._28_4_;
          fVar290 = auVar361._0_4_ * fVar230 * fVar258;
          fVar258 = auVar361._4_4_ * fVar321 * fVar231;
          auVar97._4_4_ = fVar258;
          auVar97._0_4_ = fVar290;
          fVar291 = auVar361._8_4_ * fVar233 * fVar236;
          auVar97._8_4_ = fVar291;
          fVar231 = auVar361._12_4_ * fVar323 * fVar259;
          auVar97._12_4_ = fVar231;
          fVar362 = auVar361._16_4_ * fVar235 * fVar268;
          auVar97._16_4_ = fVar362;
          fVar236 = auVar361._20_4_ * fVar325 * fVar271;
          auVar97._20_4_ = fVar236;
          fVar363 = auVar361._24_4_ * fVar237 * fVar273;
          auVar97._24_4_ = fVar363;
          auVar97._28_4_ = fStack_864;
          auVar157 = vsubps_avx(local_7c0,auVar95);
          auVar378._0_4_ = auVar281._0_4_ + fVar290;
          auVar378._4_4_ = auVar281._4_4_ + fVar258;
          auVar378._8_4_ = auVar281._8_4_ + fVar291;
          auVar378._12_4_ = auVar281._12_4_ + fVar231;
          auVar378._16_4_ = auVar281._16_4_ + fVar362;
          auVar378._20_4_ = auVar281._20_4_ + fVar236;
          auVar378._24_4_ = auVar281._24_4_ + fVar363;
          auVar378._28_4_ = auVar281._28_4_ + fStack_864;
          fVar290 = fVar230 * -fVar310 * auVar361._0_4_;
          fVar258 = fVar321 * -fVar302 * auVar361._4_4_;
          auVar98._4_4_ = fVar258;
          auVar98._0_4_ = fVar290;
          fVar291 = fVar233 * -fVar322 * auVar361._8_4_;
          auVar98._8_4_ = fVar291;
          fVar231 = fVar323 * -fVar303 * auVar361._12_4_;
          auVar98._12_4_ = fVar231;
          fVar362 = fVar235 * -fVar324 * auVar361._16_4_;
          auVar98._16_4_ = fVar362;
          fVar236 = fVar325 * -fVar305 * auVar361._20_4_;
          auVar98._20_4_ = fVar236;
          fVar363 = fVar237 * -fVar326 * auVar361._24_4_;
          auVar98._24_4_ = fVar363;
          auVar98._28_4_ = fStack_804;
          auVar158 = vsubps_avx(auVar167,auVar96);
          auVar250._0_4_ = local_580._0_4_ + fVar290;
          auVar250._4_4_ = local_580._4_4_ + fVar258;
          auVar250._8_4_ = local_580._8_4_ + fVar291;
          auVar250._12_4_ = local_580._12_4_ + fVar231;
          auVar250._16_4_ = local_580._16_4_ + fVar362;
          auVar250._20_4_ = local_580._20_4_ + fVar236;
          auVar250._24_4_ = local_580._24_4_ + fVar363;
          auVar250._28_4_ = local_580._28_4_ + fStack_804;
          fVar290 = fVar230 * 0.0 * auVar361._0_4_;
          fVar258 = fVar321 * 0.0 * auVar361._4_4_;
          auVar99._4_4_ = fVar258;
          auVar99._0_4_ = fVar290;
          fVar291 = fVar233 * 0.0 * auVar361._8_4_;
          auVar99._8_4_ = fVar291;
          fVar231 = fVar323 * 0.0 * auVar361._12_4_;
          auVar99._12_4_ = fVar231;
          fVar362 = fVar235 * 0.0 * auVar361._16_4_;
          auVar99._16_4_ = fVar362;
          fVar236 = fVar325 * 0.0 * auVar361._20_4_;
          auVar99._20_4_ = fVar236;
          fVar363 = fVar237 * 0.0 * auVar361._24_4_;
          auVar99._24_4_ = fVar363;
          auVar99._28_4_ = auVar167._28_4_;
          auVar30 = vsubps_avx(auVar281,auVar97);
          auVar136._4_4_ = fStack_49c;
          auVar136._0_4_ = local_4a0;
          auVar136._8_4_ = fStack_498;
          auVar136._12_4_ = fStack_494;
          auVar136._16_4_ = fStack_490;
          auVar136._20_4_ = fStack_48c;
          auVar136._24_4_ = fStack_488;
          auVar136._28_4_ = fStack_484;
          auVar334._0_4_ = local_4a0 + fVar290;
          auVar334._4_4_ = fStack_49c + fVar258;
          auVar334._8_4_ = fStack_498 + fVar291;
          auVar334._12_4_ = fStack_494 + fVar231;
          auVar334._16_4_ = fStack_490 + fVar362;
          auVar334._20_4_ = fStack_48c + fVar236;
          auVar334._24_4_ = fStack_488 + fVar363;
          auVar334._28_4_ = fStack_484 + auVar167._28_4_;
          auVar31 = vsubps_avx(local_580,auVar98);
          auVar32 = vsubps_avx(auVar136,auVar99);
          auVar33 = vsubps_avx(auVar250,auVar157);
          auVar34 = vsubps_avx(auVar334,auVar158);
          auVar100._4_4_ = auVar158._4_4_ * auVar33._4_4_;
          auVar100._0_4_ = auVar158._0_4_ * auVar33._0_4_;
          auVar100._8_4_ = auVar158._8_4_ * auVar33._8_4_;
          auVar100._12_4_ = auVar158._12_4_ * auVar33._12_4_;
          auVar100._16_4_ = auVar158._16_4_ * auVar33._16_4_;
          auVar100._20_4_ = auVar158._20_4_ * auVar33._20_4_;
          auVar100._24_4_ = auVar158._24_4_ * auVar33._24_4_;
          auVar100._28_4_ = auVar369._28_4_;
          auVar101._4_4_ = auVar157._4_4_ * auVar34._4_4_;
          auVar101._0_4_ = auVar157._0_4_ * auVar34._0_4_;
          auVar101._8_4_ = auVar157._8_4_ * auVar34._8_4_;
          auVar101._12_4_ = auVar157._12_4_ * auVar34._12_4_;
          auVar101._16_4_ = auVar157._16_4_ * auVar34._16_4_;
          auVar101._20_4_ = auVar157._20_4_ * auVar34._20_4_;
          auVar101._24_4_ = auVar157._24_4_ * auVar34._24_4_;
          auVar101._28_4_ = fStack_484;
          auVar35 = vsubps_avx(auVar101,auVar100);
          auVar102._4_4_ = auVar164._4_4_ * auVar34._4_4_;
          auVar102._0_4_ = auVar164._0_4_ * auVar34._0_4_;
          auVar102._8_4_ = auVar164._8_4_ * auVar34._8_4_;
          auVar102._12_4_ = auVar164._12_4_ * auVar34._12_4_;
          auVar102._16_4_ = auVar164._16_4_ * auVar34._16_4_;
          auVar102._20_4_ = auVar164._20_4_ * auVar34._20_4_;
          auVar102._24_4_ = auVar164._24_4_ * auVar34._24_4_;
          auVar102._28_4_ = auVar34._28_4_;
          auVar34 = vsubps_avx(auVar378,auVar164);
          auVar103._4_4_ = auVar158._4_4_ * auVar34._4_4_;
          auVar103._0_4_ = auVar158._0_4_ * auVar34._0_4_;
          auVar103._8_4_ = auVar158._8_4_ * auVar34._8_4_;
          auVar103._12_4_ = auVar158._12_4_ * auVar34._12_4_;
          auVar103._16_4_ = auVar158._16_4_ * auVar34._16_4_;
          auVar103._20_4_ = auVar158._20_4_ * auVar34._20_4_;
          auVar103._24_4_ = auVar158._24_4_ * auVar34._24_4_;
          auVar103._28_4_ = auVar29._28_4_;
          auVar36 = vsubps_avx(auVar103,auVar102);
          auVar104._4_4_ = auVar157._4_4_ * auVar34._4_4_;
          auVar104._0_4_ = auVar157._0_4_ * auVar34._0_4_;
          auVar104._8_4_ = auVar157._8_4_ * auVar34._8_4_;
          auVar104._12_4_ = auVar157._12_4_ * auVar34._12_4_;
          auVar104._16_4_ = auVar157._16_4_ * auVar34._16_4_;
          auVar104._20_4_ = auVar157._20_4_ * auVar34._20_4_;
          auVar104._24_4_ = auVar157._24_4_ * auVar34._24_4_;
          auVar104._28_4_ = auVar29._28_4_;
          auVar105._4_4_ = auVar164._4_4_ * auVar33._4_4_;
          auVar105._0_4_ = auVar164._0_4_ * auVar33._0_4_;
          auVar105._8_4_ = auVar164._8_4_ * auVar33._8_4_;
          auVar105._12_4_ = auVar164._12_4_ * auVar33._12_4_;
          auVar105._16_4_ = auVar164._16_4_ * auVar33._16_4_;
          auVar105._20_4_ = auVar164._20_4_ * auVar33._20_4_;
          auVar105._24_4_ = auVar164._24_4_ * auVar33._24_4_;
          auVar105._28_4_ = auVar33._28_4_;
          auVar29 = vsubps_avx(auVar105,auVar104);
          auVar191._0_4_ = auVar35._0_4_ * 0.0 + auVar29._0_4_ + auVar36._0_4_ * 0.0;
          auVar191._4_4_ = auVar35._4_4_ * 0.0 + auVar29._4_4_ + auVar36._4_4_ * 0.0;
          auVar191._8_4_ = auVar35._8_4_ * 0.0 + auVar29._8_4_ + auVar36._8_4_ * 0.0;
          auVar191._12_4_ = auVar35._12_4_ * 0.0 + auVar29._12_4_ + auVar36._12_4_ * 0.0;
          auVar191._16_4_ = auVar35._16_4_ * 0.0 + auVar29._16_4_ + auVar36._16_4_ * 0.0;
          auVar191._20_4_ = auVar35._20_4_ * 0.0 + auVar29._20_4_ + auVar36._20_4_ * 0.0;
          auVar191._24_4_ = auVar35._24_4_ * 0.0 + auVar29._24_4_ + auVar36._24_4_ * 0.0;
          auVar191._28_4_ = auVar35._28_4_ + auVar29._28_4_ + auVar36._28_4_;
          auVar28 = vcmpps_avx(auVar191,ZEXT832(0) << 0x20,2);
          auVar29 = vblendvps_avx(auVar30,_local_640,auVar28);
          auVar30 = vblendvps_avx(auVar31,_local_720,auVar28);
          auVar31 = vblendvps_avx(auVar32,auVar398,auVar28);
          auVar32 = vblendvps_avx(auVar164,auVar378,auVar28);
          auVar33 = vblendvps_avx(auVar157,auVar250,auVar28);
          auVar34 = vblendvps_avx(auVar158,auVar334,auVar28);
          auVar35 = vblendvps_avx(auVar378,auVar164,auVar28);
          auVar36 = vblendvps_avx(auVar250,auVar157,auVar28);
          auVar27 = vblendvps_avx(auVar334,auVar158,auVar28);
          auVar164 = vandps_avx(_local_480,_local_5c0);
          auVar35 = vsubps_avx(auVar35,auVar29);
          auVar185 = vsubps_avx(auVar36,auVar30);
          auVar27 = vsubps_avx(auVar27,auVar31);
          auVar186 = vsubps_avx(auVar30,auVar33);
          fVar290 = auVar185._0_4_;
          fVar288 = auVar31._0_4_;
          fVar259 = auVar185._4_4_;
          fVar240 = auVar31._4_4_;
          auVar106._4_4_ = fVar240 * fVar259;
          auVar106._0_4_ = fVar288 * fVar290;
          fVar310 = auVar185._8_4_;
          fVar252 = auVar31._8_4_;
          auVar106._8_4_ = fVar252 * fVar310;
          fVar323 = auVar185._12_4_;
          fVar254 = auVar31._12_4_;
          auVar106._12_4_ = fVar254 * fVar323;
          fVar198 = auVar185._16_4_;
          fVar256 = auVar31._16_4_;
          auVar106._16_4_ = fVar256 * fVar198;
          fVar229 = auVar185._20_4_;
          fVar304 = auVar31._20_4_;
          auVar106._20_4_ = fVar304 * fVar229;
          fVar260 = auVar185._24_4_;
          fVar306 = auVar31._24_4_;
          auVar106._24_4_ = fVar306 * fVar260;
          auVar106._28_4_ = auVar36._28_4_;
          fVar258 = auVar30._0_4_;
          fVar327 = auVar27._0_4_;
          fVar267 = auVar30._4_4_;
          fVar335 = auVar27._4_4_;
          auVar107._4_4_ = fVar335 * fVar267;
          auVar107._0_4_ = fVar327 * fVar258;
          fVar230 = auVar30._8_4_;
          fVar336 = auVar27._8_4_;
          auVar107._8_4_ = fVar336 * fVar230;
          fVar324 = auVar30._12_4_;
          fVar338 = auVar27._12_4_;
          auVar107._12_4_ = fVar338 * fVar324;
          fVar307 = auVar30._16_4_;
          fVar339 = auVar27._16_4_;
          auVar107._16_4_ = fVar339 * fVar307;
          fVar232 = auVar30._20_4_;
          fVar337 = auVar27._20_4_;
          auVar107._20_4_ = fVar337 * fVar232;
          fVar179 = auVar30._24_4_;
          fVar340 = auVar27._24_4_;
          uVar151 = auVar157._28_4_;
          auVar107._24_4_ = fVar340 * fVar179;
          auVar107._28_4_ = uVar151;
          auVar36 = vsubps_avx(auVar107,auVar106);
          fVar291 = auVar29._0_4_;
          fVar268 = auVar29._4_4_;
          auVar108._4_4_ = fVar335 * fVar268;
          auVar108._0_4_ = fVar327 * fVar291;
          fVar302 = auVar29._8_4_;
          auVar108._8_4_ = fVar336 * fVar302;
          fVar235 = auVar29._12_4_;
          auVar108._12_4_ = fVar338 * fVar235;
          fVar171 = auVar29._16_4_;
          auVar108._16_4_ = fVar339 * fVar171;
          fVar234 = auVar29._20_4_;
          auVar108._20_4_ = fVar337 * fVar234;
          fVar292 = auVar29._24_4_;
          auVar108._24_4_ = fVar340 * fVar292;
          auVar108._28_4_ = uVar151;
          fVar231 = auVar35._0_4_;
          fVar269 = auVar35._4_4_;
          auVar109._4_4_ = fVar240 * fVar269;
          auVar109._0_4_ = fVar288 * fVar231;
          fVar321 = auVar35._8_4_;
          auVar109._8_4_ = fVar252 * fVar321;
          fVar305 = auVar35._12_4_;
          auVar109._12_4_ = fVar254 * fVar305;
          fVar173 = auVar35._16_4_;
          auVar109._16_4_ = fVar256 * fVar173;
          fVar199 = auVar35._20_4_;
          auVar109._20_4_ = fVar304 * fVar199;
          fVar270 = auVar35._24_4_;
          auVar109._24_4_ = fVar306 * fVar270;
          auVar109._28_4_ = auVar378._28_4_;
          auVar157 = vsubps_avx(auVar109,auVar108);
          auVar110._4_4_ = fVar267 * fVar269;
          auVar110._0_4_ = fVar258 * fVar231;
          auVar110._8_4_ = fVar230 * fVar321;
          auVar110._12_4_ = fVar324 * fVar305;
          auVar110._16_4_ = fVar307 * fVar173;
          auVar110._20_4_ = fVar232 * fVar199;
          auVar110._24_4_ = fVar179 * fVar270;
          auVar110._28_4_ = uVar151;
          auVar111._4_4_ = fVar268 * fVar259;
          auVar111._0_4_ = fVar291 * fVar290;
          auVar111._8_4_ = fVar302 * fVar310;
          auVar111._12_4_ = fVar235 * fVar323;
          auVar111._16_4_ = fVar171 * fVar198;
          auVar111._20_4_ = fVar234 * fVar229;
          auVar111._24_4_ = fVar292 * fVar260;
          auVar111._28_4_ = auVar158._28_4_;
          auVar158 = vsubps_avx(auVar111,auVar110);
          auVar31 = vsubps_avx(auVar31,auVar34);
          fVar236 = auVar158._28_4_ + auVar157._28_4_;
          local_7c0._0_4_ = auVar158._0_4_ + auVar157._0_4_ * 0.0 + auVar36._0_4_ * 0.0;
          local_7c0._4_4_ = auVar158._4_4_ + auVar157._4_4_ * 0.0 + auVar36._4_4_ * 0.0;
          local_7c0._8_4_ = auVar158._8_4_ + auVar157._8_4_ * 0.0 + auVar36._8_4_ * 0.0;
          local_7c0._12_4_ = auVar158._12_4_ + auVar157._12_4_ * 0.0 + auVar36._12_4_ * 0.0;
          local_7c0._16_4_ = auVar158._16_4_ + auVar157._16_4_ * 0.0 + auVar36._16_4_ * 0.0;
          local_7c0._20_4_ = auVar158._20_4_ + auVar157._20_4_ * 0.0 + auVar36._20_4_ * 0.0;
          local_7c0._24_4_ = auVar158._24_4_ + auVar157._24_4_ * 0.0 + auVar36._24_4_ * 0.0;
          local_7c0._28_4_ = fVar236 + auVar36._28_4_;
          fVar362 = auVar186._0_4_;
          fVar271 = auVar186._4_4_;
          auVar112._4_4_ = auVar34._4_4_ * fVar271;
          auVar112._0_4_ = auVar34._0_4_ * fVar362;
          fVar322 = auVar186._8_4_;
          auVar112._8_4_ = auVar34._8_4_ * fVar322;
          fVar325 = auVar186._12_4_;
          auVar112._12_4_ = auVar34._12_4_ * fVar325;
          fVar175 = auVar186._16_4_;
          auVar112._16_4_ = auVar34._16_4_ * fVar175;
          fVar308 = auVar186._20_4_;
          auVar112._20_4_ = auVar34._20_4_ * fVar308;
          fVar275 = auVar186._24_4_;
          auVar112._24_4_ = auVar34._24_4_ * fVar275;
          auVar112._28_4_ = fVar236;
          fVar236 = auVar31._0_4_;
          fVar272 = auVar31._4_4_;
          auVar113._4_4_ = auVar33._4_4_ * fVar272;
          auVar113._0_4_ = auVar33._0_4_ * fVar236;
          fVar233 = auVar31._8_4_;
          auVar113._8_4_ = auVar33._8_4_ * fVar233;
          fVar326 = auVar31._12_4_;
          auVar113._12_4_ = auVar33._12_4_ * fVar326;
          fVar177 = auVar31._16_4_;
          auVar113._16_4_ = auVar33._16_4_ * fVar177;
          fVar213 = auVar31._20_4_;
          auVar113._20_4_ = auVar33._20_4_ * fVar213;
          fVar284 = auVar31._24_4_;
          auVar113._24_4_ = auVar33._24_4_ * fVar284;
          auVar113._28_4_ = auVar158._28_4_;
          auVar157 = vsubps_avx(auVar113,auVar112);
          auVar29 = vsubps_avx(auVar29,auVar32);
          fVar363 = auVar29._0_4_;
          fVar273 = auVar29._4_4_;
          auVar114._4_4_ = auVar34._4_4_ * fVar273;
          auVar114._0_4_ = auVar34._0_4_ * fVar363;
          fVar303 = auVar29._8_4_;
          auVar114._8_4_ = auVar34._8_4_ * fVar303;
          fVar237 = auVar29._12_4_;
          auVar114._12_4_ = auVar34._12_4_ * fVar237;
          fVar178 = auVar29._16_4_;
          auVar114._16_4_ = auVar34._16_4_ * fVar178;
          fVar214 = auVar29._20_4_;
          auVar114._20_4_ = auVar34._20_4_ * fVar214;
          fVar286 = auVar29._24_4_;
          auVar114._24_4_ = auVar34._24_4_ * fVar286;
          auVar114._28_4_ = auVar34._28_4_;
          auVar115._4_4_ = fVar272 * auVar32._4_4_;
          auVar115._0_4_ = fVar236 * auVar32._0_4_;
          auVar115._8_4_ = fVar233 * auVar32._8_4_;
          auVar115._12_4_ = fVar326 * auVar32._12_4_;
          auVar115._16_4_ = fVar177 * auVar32._16_4_;
          auVar115._20_4_ = fVar213 * auVar32._20_4_;
          auVar115._24_4_ = fVar284 * auVar32._24_4_;
          auVar115._28_4_ = auVar36._28_4_;
          auVar29 = vsubps_avx(auVar114,auVar115);
          auVar116._4_4_ = auVar33._4_4_ * fVar273;
          auVar116._0_4_ = auVar33._0_4_ * fVar363;
          auVar116._8_4_ = auVar33._8_4_ * fVar303;
          auVar116._12_4_ = auVar33._12_4_ * fVar237;
          auVar116._16_4_ = auVar33._16_4_ * fVar178;
          auVar116._20_4_ = auVar33._20_4_ * fVar214;
          auVar116._24_4_ = auVar33._24_4_ * fVar286;
          auVar116._28_4_ = auVar33._28_4_;
          auVar117._4_4_ = fVar271 * auVar32._4_4_;
          auVar117._0_4_ = fVar362 * auVar32._0_4_;
          auVar117._8_4_ = fVar322 * auVar32._8_4_;
          auVar117._12_4_ = fVar325 * auVar32._12_4_;
          auVar117._16_4_ = fVar175 * auVar32._16_4_;
          auVar117._20_4_ = fVar308 * auVar32._20_4_;
          auVar117._24_4_ = fVar275 * auVar32._24_4_;
          auVar117._28_4_ = auVar32._28_4_;
          auVar32 = vsubps_avx(auVar117,auVar116);
          auVar168._0_4_ = auVar157._0_4_ * 0.0 + auVar32._0_4_ + auVar29._0_4_ * 0.0;
          auVar168._4_4_ = auVar157._4_4_ * 0.0 + auVar32._4_4_ + auVar29._4_4_ * 0.0;
          auVar168._8_4_ = auVar157._8_4_ * 0.0 + auVar32._8_4_ + auVar29._8_4_ * 0.0;
          auVar168._12_4_ = auVar157._12_4_ * 0.0 + auVar32._12_4_ + auVar29._12_4_ * 0.0;
          auVar168._16_4_ = auVar157._16_4_ * 0.0 + auVar32._16_4_ + auVar29._16_4_ * 0.0;
          auVar168._20_4_ = auVar157._20_4_ * 0.0 + auVar32._20_4_ + auVar29._20_4_ * 0.0;
          auVar168._24_4_ = auVar157._24_4_ * 0.0 + auVar32._24_4_ + auVar29._24_4_ * 0.0;
          auVar168._28_4_ = auVar29._28_4_ + auVar32._28_4_ + auVar29._28_4_;
          auVar29 = vmaxps_avx(local_7c0,auVar168);
          auVar29 = vcmpps_avx(auVar29,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar32 = auVar164 & auVar29;
          if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar32 >> 0x7f,0) == '\0') &&
                (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar32 >> 0xbf,0) == '\0') &&
              (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar32[0x1f]) {
LAB_00ae20ff:
            auVar228 = ZEXT3264(CONCAT824(uStack_508,
                                          CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
            auVar319._4_4_ = fVar172;
            auVar319._0_4_ = fVar153;
            auVar319._8_4_ = fVar174;
            auVar319._12_4_ = fVar176;
            auVar319._16_4_ = fStack_810;
            auVar319._20_4_ = fStack_80c;
            auVar319._24_4_ = fStack_808;
            auVar319._28_4_ = fStack_804;
          }
          else {
            auVar32 = vandps_avx(auVar29,auVar164);
            auVar118._4_4_ = fVar272 * fVar259;
            auVar118._0_4_ = fVar236 * fVar290;
            auVar118._8_4_ = fVar233 * fVar310;
            auVar118._12_4_ = fVar326 * fVar323;
            auVar118._16_4_ = fVar177 * fVar198;
            auVar118._20_4_ = fVar213 * fVar229;
            auVar118._24_4_ = fVar284 * fVar260;
            auVar118._28_4_ = auVar164._28_4_;
            auVar119._4_4_ = fVar271 * fVar335;
            auVar119._0_4_ = fVar362 * fVar327;
            auVar119._8_4_ = fVar322 * fVar336;
            auVar119._12_4_ = fVar325 * fVar338;
            auVar119._16_4_ = fVar175 * fVar339;
            auVar119._20_4_ = fVar308 * fVar337;
            auVar119._24_4_ = fVar275 * fVar340;
            auVar119._28_4_ = auVar29._28_4_;
            auVar29 = vsubps_avx(auVar119,auVar118);
            auVar120._4_4_ = fVar273 * fVar335;
            auVar120._0_4_ = fVar363 * fVar327;
            auVar120._8_4_ = fVar303 * fVar336;
            auVar120._12_4_ = fVar237 * fVar338;
            auVar120._16_4_ = fVar178 * fVar339;
            auVar120._20_4_ = fVar214 * fVar337;
            auVar120._24_4_ = fVar286 * fVar340;
            auVar120._28_4_ = auVar27._28_4_;
            auVar121._4_4_ = fVar272 * fVar269;
            auVar121._0_4_ = fVar236 * fVar231;
            auVar121._8_4_ = fVar233 * fVar321;
            auVar121._12_4_ = fVar326 * fVar305;
            auVar121._16_4_ = fVar177 * fVar173;
            auVar121._20_4_ = fVar213 * fVar199;
            auVar121._24_4_ = fVar284 * fVar270;
            auVar121._28_4_ = auVar31._28_4_;
            auVar33 = vsubps_avx(auVar121,auVar120);
            auVar122._4_4_ = fVar271 * fVar269;
            auVar122._0_4_ = fVar362 * fVar231;
            auVar122._8_4_ = fVar322 * fVar321;
            auVar122._12_4_ = fVar325 * fVar305;
            auVar122._16_4_ = fVar175 * fVar173;
            auVar122._20_4_ = fVar308 * fVar199;
            auVar122._24_4_ = fVar275 * fVar270;
            auVar122._28_4_ = auVar35._28_4_;
            auVar123._4_4_ = fVar273 * fVar259;
            auVar123._0_4_ = fVar363 * fVar290;
            auVar123._8_4_ = fVar303 * fVar310;
            auVar123._12_4_ = fVar237 * fVar323;
            auVar123._16_4_ = fVar178 * fVar198;
            auVar123._20_4_ = fVar214 * fVar229;
            auVar123._24_4_ = fVar286 * fVar260;
            auVar123._28_4_ = auVar185._28_4_;
            auVar34 = vsubps_avx(auVar123,auVar122);
            auVar318._0_4_ = auVar29._0_4_ * 0.0 + auVar34._0_4_ + auVar33._0_4_ * 0.0;
            auVar318._4_4_ = auVar29._4_4_ * 0.0 + auVar34._4_4_ + auVar33._4_4_ * 0.0;
            auVar318._8_4_ = auVar29._8_4_ * 0.0 + auVar34._8_4_ + auVar33._8_4_ * 0.0;
            auVar318._12_4_ = auVar29._12_4_ * 0.0 + auVar34._12_4_ + auVar33._12_4_ * 0.0;
            auVar318._16_4_ = auVar29._16_4_ * 0.0 + auVar34._16_4_ + auVar33._16_4_ * 0.0;
            auVar318._20_4_ = auVar29._20_4_ * 0.0 + auVar34._20_4_ + auVar33._20_4_ * 0.0;
            auVar318._24_4_ = auVar29._24_4_ * 0.0 + auVar34._24_4_ + auVar33._24_4_ * 0.0;
            auVar318._28_4_ = auVar186._28_4_ + auVar34._28_4_ + auVar35._28_4_;
            auVar164 = vrcpps_avx(auVar318);
            fVar290 = auVar164._0_4_;
            fVar231 = auVar164._4_4_;
            auVar124._4_4_ = auVar318._4_4_ * fVar231;
            auVar124._0_4_ = auVar318._0_4_ * fVar290;
            fVar362 = auVar164._8_4_;
            auVar124._8_4_ = auVar318._8_4_ * fVar362;
            fVar236 = auVar164._12_4_;
            auVar124._12_4_ = auVar318._12_4_ * fVar236;
            fVar363 = auVar164._16_4_;
            auVar124._16_4_ = auVar318._16_4_ * fVar363;
            fVar259 = auVar164._20_4_;
            auVar124._20_4_ = auVar318._20_4_ * fVar259;
            fVar269 = auVar164._24_4_;
            auVar124._24_4_ = auVar318._24_4_ * fVar269;
            auVar124._28_4_ = auVar31._28_4_;
            auVar370._8_4_ = 0x3f800000;
            auVar370._0_8_ = 0x3f8000003f800000;
            auVar370._12_4_ = 0x3f800000;
            auVar370._16_4_ = 0x3f800000;
            auVar370._20_4_ = 0x3f800000;
            auVar370._24_4_ = 0x3f800000;
            auVar370._28_4_ = 0x3f800000;
            auVar164 = vsubps_avx(auVar370,auVar124);
            fVar290 = auVar164._0_4_ * fVar290 + fVar290;
            fVar231 = auVar164._4_4_ * fVar231 + fVar231;
            fVar362 = auVar164._8_4_ * fVar362 + fVar362;
            fVar236 = auVar164._12_4_ * fVar236 + fVar236;
            fVar363 = auVar164._16_4_ * fVar363 + fVar363;
            fVar259 = auVar164._20_4_ * fVar259 + fVar259;
            fVar269 = auVar164._24_4_ * fVar269 + fVar269;
            auVar125._4_4_ =
                 (fVar268 * auVar29._4_4_ + auVar33._4_4_ * fVar267 + fVar240 * auVar34._4_4_) *
                 fVar231;
            auVar125._0_4_ =
                 (fVar291 * auVar29._0_4_ + auVar33._0_4_ * fVar258 + fVar288 * auVar34._0_4_) *
                 fVar290;
            auVar125._8_4_ =
                 (fVar302 * auVar29._8_4_ + auVar33._8_4_ * fVar230 + fVar252 * auVar34._8_4_) *
                 fVar362;
            auVar125._12_4_ =
                 (fVar235 * auVar29._12_4_ + auVar33._12_4_ * fVar324 + fVar254 * auVar34._12_4_) *
                 fVar236;
            auVar125._16_4_ =
                 (fVar171 * auVar29._16_4_ + auVar33._16_4_ * fVar307 + fVar256 * auVar34._16_4_) *
                 fVar363;
            auVar125._20_4_ =
                 (fVar234 * auVar29._20_4_ + auVar33._20_4_ * fVar232 + fVar304 * auVar34._20_4_) *
                 fVar259;
            auVar125._24_4_ =
                 (fVar292 * auVar29._24_4_ + auVar33._24_4_ * fVar179 + fVar306 * auVar34._24_4_) *
                 fVar269;
            auVar125._28_4_ = auVar30._28_4_ + auVar34._28_4_;
            uVar151 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar227._4_4_ = uVar151;
            auVar227._0_4_ = uVar151;
            auVar227._8_4_ = uVar151;
            auVar227._12_4_ = uVar151;
            auVar227._16_4_ = uVar151;
            auVar227._20_4_ = uVar151;
            auVar227._24_4_ = uVar151;
            auVar227._28_4_ = uVar151;
            auVar29 = vcmpps_avx(local_2e0,auVar125,2);
            auVar164 = vcmpps_avx(auVar125,auVar227,2);
            auVar164 = vandps_avx(auVar29,auVar164);
            auVar30 = auVar32 & auVar164;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar30 >> 0x7f,0) == '\0') &&
                  (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0xbf,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar30[0x1f]) goto LAB_00ae20ff;
            auVar164 = vandps_avx(auVar32,auVar164);
            auVar30 = vcmpps_avx(auVar318,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar31 = auVar164 & auVar30;
            auVar228 = ZEXT3264(CONCAT824(uStack_508,
                                          CONCAT816(uStack_510,CONCAT88(uStack_518,local_520))));
            auVar319._4_4_ = fVar172;
            auVar319._0_4_ = fVar153;
            auVar319._8_4_ = fVar174;
            auVar319._12_4_ = fVar176;
            auVar319._16_4_ = fStack_810;
            auVar319._20_4_ = fStack_80c;
            auVar319._24_4_ = fStack_808;
            auVar319._28_4_ = fStack_804;
            if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0x7f,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0xbf,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar31[0x1f] < '\0') {
              auVar164 = vandps_avx(auVar30,auVar164);
              auVar228 = ZEXT3264(auVar164);
              auVar126._4_4_ = fVar231 * local_7c0._4_4_;
              auVar126._0_4_ = fVar290 * (float)local_7c0._0_4_;
              auVar126._8_4_ = fVar362 * local_7c0._8_4_;
              auVar126._12_4_ = fVar236 * local_7c0._12_4_;
              auVar126._16_4_ = fVar363 * local_7c0._16_4_;
              auVar126._20_4_ = fVar259 * local_7c0._20_4_;
              auVar126._24_4_ = fVar269 * local_7c0._24_4_;
              auVar126._28_4_ = auVar29._28_4_;
              auVar127._4_4_ = auVar168._4_4_ * fVar231;
              auVar127._0_4_ = auVar168._0_4_ * fVar290;
              auVar127._8_4_ = auVar168._8_4_ * fVar362;
              auVar127._12_4_ = auVar168._12_4_ * fVar236;
              auVar127._16_4_ = auVar168._16_4_ * fVar363;
              auVar127._20_4_ = auVar168._20_4_ * fVar259;
              auVar127._24_4_ = auVar168._24_4_ * fVar269;
              auVar127._28_4_ = auVar168._28_4_;
              auVar282._8_4_ = 0x3f800000;
              auVar282._0_8_ = 0x3f8000003f800000;
              auVar282._12_4_ = 0x3f800000;
              auVar282._16_4_ = 0x3f800000;
              auVar282._20_4_ = 0x3f800000;
              auVar282._24_4_ = 0x3f800000;
              auVar282._28_4_ = 0x3f800000;
              auVar164 = vsubps_avx(auVar282,auVar126);
              _local_500 = vblendvps_avx(auVar164,auVar126,auVar28);
              auVar164 = vsubps_avx(auVar282,auVar127);
              _local_320 = vblendvps_avx(auVar164,auVar127,auVar28);
              local_4c0 = auVar125;
            }
          }
          auVar371 = ZEXT3264(local_7e0);
          auVar164 = auVar228._0_32_;
          auVar350 = ZEXT3264(_local_800);
          auVar300 = ZEXT3264(local_600);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar164 >> 0x7f,0) == '\0') &&
                (auVar228 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar164 >> 0xbf,0) == '\0') &&
              (auVar228 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar228[0x1f]) {
LAB_00ae1dcc:
            fVar239 = (float)local_7a0._0_4_;
            fVar283 = (float)local_7a0._4_4_;
            fVar255 = fStack_798;
            fVar289 = fStack_794;
            fVar287 = fStack_790;
            fVar238 = fStack_78c;
            fVar257 = fStack_788;
          }
          else {
            auVar29 = vsubps_avx(auVar361,auVar319);
            fVar258 = auVar319._0_4_ + auVar29._0_4_ * (float)local_500._0_4_;
            fVar291 = auVar319._4_4_ + auVar29._4_4_ * (float)local_500._4_4_;
            fVar231 = auVar319._8_4_ + auVar29._8_4_ * fStack_4f8;
            fVar362 = auVar319._12_4_ + auVar29._12_4_ * fStack_4f4;
            fVar236 = auVar319._16_4_ + auVar29._16_4_ * fStack_4f0;
            fVar363 = auVar319._20_4_ + auVar29._20_4_ * fStack_4ec;
            fVar259 = auVar319._24_4_ + auVar29._24_4_ * fStack_4e8;
            fVar267 = auVar319._28_4_ + auVar29._28_4_;
            fVar290 = *(float *)((long)local_688->ray_space + k * 4 + -0x10);
            auVar128._4_4_ = (fVar291 + fVar291) * fVar290;
            auVar128._0_4_ = (fVar258 + fVar258) * fVar290;
            auVar128._8_4_ = (fVar231 + fVar231) * fVar290;
            auVar128._12_4_ = (fVar362 + fVar362) * fVar290;
            auVar128._16_4_ = (fVar236 + fVar236) * fVar290;
            auVar128._20_4_ = (fVar363 + fVar363) * fVar290;
            auVar128._24_4_ = (fVar259 + fVar259) * fVar290;
            auVar128._28_4_ = fVar267 + fVar267;
            auVar29 = vcmpps_avx(local_4c0,auVar128,6);
            auVar30 = auVar164 & auVar29;
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar30 >> 0x7f,0) == '\0') &&
                  (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar30 >> 0xbf,0) == '\0') &&
                (auVar30 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar30[0x1f]) goto LAB_00ae1e37;
            local_320._0_4_ = (float)local_320._0_4_ + (float)local_320._0_4_ + -1.0;
            local_320._4_4_ = (float)local_320._4_4_ + (float)local_320._4_4_ + -1.0;
            uStack_318._0_4_ = (float)uStack_318 + (float)uStack_318 + -1.0;
            uStack_318._4_4_ = uStack_318._4_4_ + uStack_318._4_4_ + -1.0;
            uStack_310._0_4_ = (float)uStack_310 + (float)uStack_310 + -1.0;
            uStack_310._4_4_ = uStack_310._4_4_ + uStack_310._4_4_ + -1.0;
            uStack_308._0_4_ = (float)uStack_308 + (float)uStack_308 + -1.0;
            uStack_308._4_4_ = uStack_308._4_4_ + uStack_308._4_4_ + -1.0;
            local_2a0 = _local_500;
            auVar141 = _local_320;
            auVar30 = _local_320;
            local_280 = (float)local_320._0_4_;
            fStack_27c = (float)local_320._4_4_;
            fStack_278 = (float)uStack_318;
            fStack_274 = uStack_318._4_4_;
            fStack_270 = (float)uStack_310;
            fStack_26c = uStack_310._4_4_;
            fStack_268 = (float)uStack_308;
            fStack_264 = uStack_308._4_4_;
            local_260 = local_4c0;
            local_23c = uVar150;
            local_230 = auVar294._0_8_;
            uStack_228 = uStack_838;
            local_220 = auVar311._0_8_;
            uStack_218 = uStack_848;
            local_210 = local_760;
            uStack_208 = uStack_758;
            local_200 = local_770;
            uStack_1f8 = uStack_768;
            pGVar22 = (context->scene->geometries).items[local_6a0].ptr;
            if ((pGVar22->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              local_560 = vandps_avx(auVar29,auVar164);
              auVar203._0_4_ = (float)(int)local_240;
              auVar203._4_12_ = auVar157._4_12_;
              auVar263 = vshufps_avx(auVar203,auVar203,0);
              local_1c0[0] = (auVar263._0_4_ + (float)local_500._0_4_ + 0.0) *
                             (float)local_160._0_4_;
              local_1c0[1] = (auVar263._4_4_ + (float)local_500._4_4_ + 1.0) *
                             (float)local_160._4_4_;
              local_1c0[2] = (auVar263._8_4_ + fStack_4f8 + 2.0) * fStack_158;
              local_1c0[3] = (auVar263._12_4_ + fStack_4f4 + 3.0) * fStack_154;
              fStack_1b0 = (auVar263._0_4_ + fStack_4f0 + 4.0) * fStack_150;
              fStack_1ac = (auVar263._4_4_ + fStack_4ec + 5.0) * fStack_14c;
              fStack_1a8 = (auVar263._8_4_ + fStack_4e8 + 6.0) * fStack_148;
              fStack_1a4 = auVar263._12_4_ + fStack_4e4 + 7.0;
              uStack_310 = auVar141._16_8_;
              uStack_308 = auVar30._24_8_;
              local_1a0 = local_320;
              uStack_198 = uStack_318;
              uStack_190 = uStack_310;
              uStack_188 = uStack_308;
              local_180 = local_4c0;
              auVar192._8_4_ = 0x7f800000;
              auVar192._0_8_ = 0x7f8000007f800000;
              auVar192._12_4_ = 0x7f800000;
              auVar192._16_4_ = 0x7f800000;
              auVar192._20_4_ = 0x7f800000;
              auVar192._24_4_ = 0x7f800000;
              auVar192._28_4_ = 0x7f800000;
              auVar164 = vblendvps_avx(auVar192,local_4c0,local_560);
              auVar29 = vshufps_avx(auVar164,auVar164,0xb1);
              auVar29 = vminps_avx(auVar164,auVar29);
              auVar31 = vshufpd_avx(auVar29,auVar29,5);
              auVar29 = vminps_avx(auVar29,auVar31);
              auVar31 = vperm2f128_avx(auVar29,auVar29,1);
              auVar29 = vminps_avx(auVar29,auVar31);
              auVar29 = vcmpps_avx(auVar164,auVar29,0);
              auVar31 = local_560 & auVar29;
              auVar164 = local_560;
              if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar31 >> 0x7f,0) != '\0') ||
                    (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0xbf,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar31[0x1f] < '\0') {
                auVar164 = vandps_avx(auVar29,local_560);
              }
              uVar143 = vmovmskps_avx(auVar164);
              uVar145 = 0;
              if (uVar143 != 0) {
                for (; (uVar143 >> uVar145 & 1) == 0; uVar145 = uVar145 + 1) {
                }
              }
              uVar147 = (ulong)uVar145;
              _local_320 = auVar30;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar22->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar239 = local_1c0[uVar147];
                uVar151 = *(undefined4 *)((long)&local_1a0 + uVar147 * 4);
                fVar251 = 1.0 - fVar239;
                fVar274 = fVar239 * fVar251 * 4.0;
                auVar263 = ZEXT416((uint)(fVar239 * fVar239 * 0.5));
                auVar263 = vshufps_avx(auVar263,auVar263,0);
                auVar204 = ZEXT416((uint)((fVar251 * fVar251 + fVar274) * 0.5));
                auVar204 = vshufps_avx(auVar204,auVar204,0);
                auVar206 = ZEXT416((uint)((-fVar239 * fVar239 - fVar274) * 0.5));
                auVar206 = vshufps_avx(auVar206,auVar206,0);
                auVar218 = ZEXT416((uint)(fVar251 * -fVar251 * 0.5));
                auVar218 = vshufps_avx(auVar218,auVar218,0);
                auVar205._0_4_ =
                     auVar218._0_4_ * fVar293 +
                     auVar206._0_4_ * fVar309 +
                     auVar263._0_4_ * (float)local_770._0_4_ +
                     auVar204._0_4_ * (float)local_760._0_4_;
                auVar205._4_4_ =
                     auVar218._4_4_ * fVar301 +
                     auVar206._4_4_ * fVar320 +
                     auVar263._4_4_ * (float)local_770._4_4_ +
                     auVar204._4_4_ * (float)local_760._4_4_;
                auVar205._8_4_ =
                     auVar218._8_4_ * auVar294._8_4_ +
                     auVar206._8_4_ * auVar311._8_4_ +
                     auVar263._8_4_ * (float)uStack_768 + auVar204._8_4_ * (float)uStack_758;
                auVar205._12_4_ =
                     auVar218._12_4_ * auVar294._12_4_ +
                     auVar206._12_4_ * auVar311._12_4_ +
                     auVar263._12_4_ * uStack_768._4_4_ + auVar204._12_4_ * uStack_758._4_4_;
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar147 * 4);
                *(float *)(ray + k * 4 + 0xc0) = auVar205._0_4_;
                uVar21 = vextractps_avx(auVar205,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar21;
                uVar21 = vextractps_avx(auVar205,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar21;
                *(float *)(ray + k * 4 + 0xf0) = fVar239;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar151;
                *(int *)(ray + k * 4 + 0x110) = SUB84(auVar152,0);
                *(int *)(ray + k * 4 + 0x120) = (int)local_6a0;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                stack0xfffffffffffff948 = auVar281._8_24_;
                local_7c0._0_4_ = uVar150;
                local_720 = auVar152;
                auVar263 = *local_690;
                local_820 = *(uint *)(ray + k * 4 + 0x80);
                uStack_81c = 0;
                uStack_818 = 0;
                uStack_814 = 0;
                _local_680 = auVar361;
                while( true ) {
                  local_380 = local_1c0[uVar147];
                  local_370 = *(undefined4 *)((long)&local_1a0 + uVar147 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_180 + uVar147 * 4);
                  fVar274 = 1.0 - local_380;
                  fVar239 = local_380 * fVar274 * 4.0;
                  auVar204 = ZEXT416((uint)(local_380 * local_380 * 0.5));
                  auVar204 = vshufps_avx(auVar204,auVar204,0);
                  auVar206 = ZEXT416((uint)((fVar274 * fVar274 + fVar239) * 0.5));
                  auVar206 = vshufps_avx(auVar206,auVar206,0);
                  auVar218 = ZEXT416((uint)((-local_380 * local_380 - fVar239) * 0.5));
                  auVar218 = vshufps_avx(auVar218,auVar218,0);
                  local_750.context = context->user;
                  auVar219 = ZEXT416((uint)(fVar274 * -fVar274 * 0.5));
                  auVar219 = vshufps_avx(auVar219,auVar219,0);
                  auVar207._0_4_ =
                       auVar219._0_4_ * fVar293 +
                       auVar218._0_4_ * fVar309 +
                       auVar204._0_4_ * (float)local_770._0_4_ +
                       auVar206._0_4_ * (float)local_760._0_4_;
                  auVar207._4_4_ =
                       auVar219._4_4_ * fVar301 +
                       auVar218._4_4_ * fVar320 +
                       auVar204._4_4_ * (float)local_770._4_4_ +
                       auVar206._4_4_ * (float)local_760._4_4_;
                  auVar207._8_4_ =
                       auVar219._8_4_ * auVar294._8_4_ +
                       auVar218._8_4_ * auVar311._8_4_ +
                       auVar204._8_4_ * (float)uStack_768 + auVar206._8_4_ * (float)uStack_758;
                  auVar207._12_4_ =
                       auVar219._12_4_ * auVar294._12_4_ +
                       auVar218._12_4_ * auVar311._12_4_ +
                       auVar204._12_4_ * uStack_768._4_4_ + auVar206._12_4_ * uStack_758._4_4_;
                  auVar204 = vshufps_avx(auVar207,auVar207,0);
                  local_3b0[0] = (RTCHitN)auVar204[0];
                  local_3b0[1] = (RTCHitN)auVar204[1];
                  local_3b0[2] = (RTCHitN)auVar204[2];
                  local_3b0[3] = (RTCHitN)auVar204[3];
                  local_3b0[4] = (RTCHitN)auVar204[4];
                  local_3b0[5] = (RTCHitN)auVar204[5];
                  local_3b0[6] = (RTCHitN)auVar204[6];
                  local_3b0[7] = (RTCHitN)auVar204[7];
                  local_3b0[8] = (RTCHitN)auVar204[8];
                  local_3b0[9] = (RTCHitN)auVar204[9];
                  local_3b0[10] = (RTCHitN)auVar204[10];
                  local_3b0[0xb] = (RTCHitN)auVar204[0xb];
                  local_3b0[0xc] = (RTCHitN)auVar204[0xc];
                  local_3b0[0xd] = (RTCHitN)auVar204[0xd];
                  local_3b0[0xe] = (RTCHitN)auVar204[0xe];
                  local_3b0[0xf] = (RTCHitN)auVar204[0xf];
                  auVar204 = vshufps_avx(auVar207,auVar207,0x55);
                  local_3a0 = auVar204;
                  local_390 = vshufps_avx(auVar207,auVar207,0xaa);
                  fStack_37c = local_380;
                  fStack_378 = local_380;
                  fStack_374 = local_380;
                  uStack_36c = local_370;
                  uStack_368 = local_370;
                  uStack_364 = local_370;
                  local_360 = local_610._0_8_;
                  uStack_358 = local_610._8_8_;
                  local_350 = local_2b0;
                  vcmpps_avx(ZEXT1632(local_2b0),ZEXT1632(local_2b0),0xf);
                  uStack_33c = (local_750.context)->instID[0];
                  local_340 = uStack_33c;
                  uStack_338 = uStack_33c;
                  uStack_334 = uStack_33c;
                  uStack_330 = (local_750.context)->instPrimID[0];
                  uStack_32c = uStack_330;
                  uStack_328 = uStack_330;
                  uStack_324 = uStack_330;
                  local_750.valid = (int *)local_830;
                  local_750.geometryUserPtr = pGVar22->userPtr;
                  local_750.hit = local_3b0;
                  local_750.N = 4;
                  local_830 = auVar263;
                  local_750.ray = (RTCRayN *)ray;
                  if (pGVar22->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar22->intersectionFilterN)(&local_750);
                  }
                  if (local_830 == (undefined1  [16])0x0) {
                    auVar204 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar204 = auVar204 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var25 = context->args->filter;
                    if ((p_Var25 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar22->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var25)(&local_750);
                    }
                    auVar206 = vpcmpeqd_avx(local_830,_DAT_01f45a50);
                    auVar218 = vpcmpeqd_avx(auVar204,auVar204);
                    auVar204 = auVar206 ^ auVar218;
                    if (local_830 != (undefined1  [16])0x0) {
                      auVar206 = auVar206 ^ auVar218;
                      auVar218 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])local_750.hit);
                      *(undefined1 (*) [16])(local_750.ray + 0xc0) = auVar218;
                      auVar218 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x10));
                      *(undefined1 (*) [16])(local_750.ray + 0xd0) = auVar218;
                      auVar218 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x20));
                      *(undefined1 (*) [16])(local_750.ray + 0xe0) = auVar218;
                      auVar218 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x30));
                      *(undefined1 (*) [16])(local_750.ray + 0xf0) = auVar218;
                      auVar218 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x40));
                      *(undefined1 (*) [16])(local_750.ray + 0x100) = auVar218;
                      auVar218 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x50));
                      *(undefined1 (*) [16])(local_750.ray + 0x110) = auVar218;
                      auVar218 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x60));
                      *(undefined1 (*) [16])(local_750.ray + 0x120) = auVar218;
                      auVar218 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x70));
                      *(undefined1 (*) [16])(local_750.ray + 0x130) = auVar218;
                      auVar206 = vmaskmovps_avx(auVar206,*(undefined1 (*) [16])
                                                          (local_750.hit + 0x80));
                      *(undefined1 (*) [16])(local_750.ray + 0x140) = auVar206;
                    }
                  }
                  auVar164 = local_4c0;
                  auVar183._8_8_ = 0x100000001;
                  auVar183._0_8_ = 0x100000001;
                  if ((auVar183 & auVar204) == (undefined1  [16])0x0) {
                    auVar156._4_4_ = uStack_81c;
                    auVar156._0_4_ = local_820;
                    auVar156._8_4_ = uStack_818;
                    auVar156._12_4_ = uStack_814;
                    *(uint *)(ray + k * 4 + 0x80) = local_820;
                  }
                  else {
                    auVar156 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                  }
                  *(undefined4 *)(local_560 + uVar147 * 4) = 0;
                  local_820 = auVar156._0_4_;
                  uStack_81c = auVar156._4_4_;
                  uStack_818 = auVar156._8_4_;
                  uStack_814 = auVar156._12_4_;
                  auVar204 = vshufps_avx(auVar156,auVar156,0);
                  auVar169._16_16_ = auVar204;
                  auVar169._0_16_ = auVar204;
                  auVar30 = vcmpps_avx(auVar164,auVar169,2);
                  auVar29 = vandps_avx(auVar30,local_560);
                  local_560 = local_560 & auVar30;
                  if ((((((((local_560 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_560 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_560 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_560 >> 0x7f,0) == '\0') &&
                        (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_560 >> 0xbf,0) == '\0') &&
                      (local_560 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_560[0x1f]) break;
                  auVar193._8_4_ = 0x7f800000;
                  auVar193._0_8_ = 0x7f8000007f800000;
                  auVar193._12_4_ = 0x7f800000;
                  auVar193._16_4_ = 0x7f800000;
                  auVar193._20_4_ = 0x7f800000;
                  auVar193._24_4_ = 0x7f800000;
                  auVar193._28_4_ = 0x7f800000;
                  auVar164 = vblendvps_avx(auVar193,auVar164,auVar29);
                  auVar30 = vshufps_avx(auVar164,auVar164,0xb1);
                  auVar30 = vminps_avx(auVar164,auVar30);
                  auVar31 = vshufpd_avx(auVar30,auVar30,5);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar31 = vperm2f128_avx(auVar30,auVar30,1);
                  auVar30 = vminps_avx(auVar30,auVar31);
                  auVar30 = vcmpps_avx(auVar164,auVar30,0);
                  auVar31 = auVar29 & auVar30;
                  auVar164 = auVar29;
                  if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar31 >> 0x7f,0) != '\0') ||
                        (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar31 >> 0xbf,0) != '\0') ||
                      (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar31[0x1f] < '\0') {
                    auVar164 = vandps_avx(auVar30,auVar29);
                  }
                  uVar143 = vmovmskps_avx(auVar164);
                  uVar145 = 0;
                  if (uVar143 != 0) {
                    for (; (uVar143 >> uVar145 & 1) == 0; uVar145 = uVar145 + 1) {
                    }
                  }
                  uVar147 = (ulong)uVar145;
                  local_560 = auVar29;
                }
                auVar371 = ZEXT3264(local_7e0);
                auVar350 = ZEXT3264(_local_800);
                auVar300 = ZEXT3264(local_600);
                auVar152 = local_720;
                uVar150 = local_7c0._0_4_;
              }
              goto LAB_00ae1dcc;
            }
          }
          fVar351 = (float)local_660._0_4_;
          fVar352 = (float)local_660._4_4_;
          fVar353 = fStack_658;
          fVar372 = fStack_654;
          fVar274 = fStack_650;
          fVar251 = fStack_64c;
          fVar253 = fStack_648;
          fVar285 = fStack_644;
        }
LAB_00ae1e37:
        lVar148 = lVar148 + 8;
      }
    }
    uVar151 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar165._4_4_ = uVar151;
    auVar165._0_4_ = uVar151;
    auVar165._8_4_ = uVar151;
    auVar165._12_4_ = uVar151;
    auVar165._16_4_ = uVar151;
    auVar165._20_4_ = uVar151;
    auVar165._24_4_ = uVar151;
    auVar165._28_4_ = uVar151;
    auVar164 = vcmpps_avx(local_80,auVar165,2);
    uVar145 = vmovmskps_avx(auVar164);
    uVar144 = (ulong)((uint)uVar144 & (uint)uVar144 + 0xff & uVar145);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }